

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itrans_avx2.c
# Opt level: O0

void dct2_butterfly_h32_avx2(s16 *src,int i_src,s16 *dst,int line,int shift,int bit_depth)

{
  undefined1 (*pauVar1) [16];
  undefined1 (*pauVar2) [16];
  undefined1 (*pauVar3) [16];
  undefined1 (*pauVar4) [16];
  undefined1 (*pauVar5) [16];
  undefined1 (*pauVar6) [16];
  undefined1 (*pauVar7) [16];
  undefined1 (*pauVar8) [16];
  undefined1 (*pauVar9) [16];
  undefined1 (*pauVar10) [16];
  undefined1 (*pauVar11) [16];
  undefined1 (*pauVar12) [16];
  undefined1 (*pauVar13) [16];
  undefined1 (*pauVar14) [16];
  undefined1 (*pauVar15) [16];
  undefined1 (*pauVar16) [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [32];
  undefined1 auVar201 [32];
  undefined1 auVar202 [32];
  undefined1 auVar203 [32];
  undefined1 auVar204 [32];
  undefined1 auVar205 [32];
  undefined1 auVar206 [32];
  undefined1 auVar207 [32];
  undefined1 auVar208 [32];
  undefined1 auVar209 [32];
  undefined1 auVar210 [32];
  undefined1 auVar211 [32];
  undefined1 auVar212 [32];
  undefined1 auVar213 [32];
  undefined1 auVar214 [32];
  undefined1 auVar215 [32];
  undefined1 auVar216 [32];
  undefined1 auVar217 [32];
  undefined1 auVar218 [32];
  undefined1 auVar219 [32];
  undefined1 auVar220 [32];
  undefined1 auVar221 [32];
  undefined1 auVar222 [32];
  undefined1 auVar223 [32];
  undefined1 auVar224 [32];
  undefined1 auVar225 [32];
  undefined1 auVar226 [32];
  undefined1 auVar227 [32];
  undefined1 auVar228 [32];
  undefined1 auVar229 [32];
  undefined1 auVar230 [32];
  undefined1 auVar231 [32];
  undefined1 auVar232 [32];
  undefined1 auVar233 [32];
  undefined1 auVar234 [32];
  undefined1 auVar235 [32];
  undefined1 auVar236 [32];
  undefined1 auVar237 [32];
  undefined1 auVar238 [32];
  undefined1 auVar239 [32];
  undefined1 auVar240 [32];
  undefined1 auVar241 [32];
  undefined1 auVar242 [32];
  undefined1 auVar243 [32];
  undefined1 auVar244 [32];
  undefined1 auVar245 [32];
  undefined1 auVar246 [32];
  undefined1 auVar247 [32];
  undefined1 auVar248 [32];
  undefined1 auVar249 [32];
  undefined1 auVar250 [32];
  undefined1 auVar251 [32];
  undefined1 auVar252 [32];
  undefined1 auVar253 [32];
  undefined1 auVar254 [32];
  undefined1 auVar255 [32];
  undefined1 auVar256 [32];
  undefined1 auVar257 [32];
  undefined1 auVar258 [32];
  undefined1 auVar259 [32];
  undefined1 auVar260 [32];
  undefined1 auVar261 [32];
  undefined1 auVar262 [32];
  undefined1 auVar263 [32];
  undefined1 auVar264 [32];
  undefined1 auVar265 [32];
  undefined1 auVar266 [32];
  undefined1 auVar267 [32];
  undefined1 auVar268 [32];
  undefined1 auVar269 [32];
  undefined1 auVar270 [32];
  undefined1 auVar271 [32];
  undefined1 auVar272 [32];
  undefined1 auVar273 [32];
  undefined1 auVar274 [32];
  undefined1 auVar275 [32];
  undefined1 auVar276 [32];
  undefined1 auVar277 [32];
  undefined1 auVar278 [32];
  undefined1 auVar279 [32];
  undefined1 auVar280 [32];
  undefined1 auVar281 [32];
  undefined1 auVar282 [32];
  undefined1 auVar283 [32];
  undefined1 auVar284 [32];
  undefined1 auVar285 [32];
  undefined1 auVar286 [32];
  undefined1 auVar287 [32];
  undefined1 auVar288 [32];
  undefined1 auVar289 [32];
  undefined1 auVar290 [32];
  undefined1 auVar291 [32];
  undefined1 auVar292 [32];
  undefined1 auVar293 [32];
  undefined1 auVar294 [32];
  undefined1 auVar295 [32];
  undefined1 auVar296 [32];
  undefined1 auVar297 [32];
  undefined1 auVar298 [32];
  undefined1 auVar299 [32];
  undefined1 auVar300 [32];
  undefined1 auVar301 [32];
  undefined1 auVar302 [32];
  undefined1 auVar303 [32];
  undefined1 auVar304 [32];
  undefined1 auVar305 [32];
  undefined1 auVar306 [32];
  undefined1 auVar307 [32];
  undefined1 auVar308 [32];
  undefined1 auVar309 [32];
  undefined1 auVar310 [32];
  undefined1 auVar311 [32];
  undefined1 auVar312 [32];
  undefined1 auVar313 [32];
  undefined1 auVar314 [32];
  undefined1 auVar315 [32];
  undefined1 auVar316 [32];
  undefined1 auVar317 [32];
  undefined1 auVar318 [32];
  undefined1 auVar319 [32];
  undefined1 auVar320 [32];
  undefined1 auVar321 [32];
  undefined1 auVar322 [32];
  undefined1 auVar323 [32];
  undefined1 auVar324 [32];
  undefined1 auVar325 [32];
  undefined1 auVar326 [32];
  undefined1 auVar327 [32];
  undefined1 auVar328 [32];
  undefined1 auVar329 [32];
  undefined1 auVar330 [32];
  undefined1 auVar331 [32];
  undefined1 auVar332 [32];
  undefined1 auVar333 [32];
  undefined1 auVar334 [32];
  undefined1 auVar335 [32];
  undefined1 auVar336 [32];
  undefined1 auVar337 [32];
  undefined1 auVar338 [32];
  undefined1 auVar339 [32];
  undefined1 auVar340 [32];
  undefined1 auVar341 [32];
  undefined1 auVar342 [32];
  undefined1 auVar343 [32];
  undefined1 auVar344 [32];
  undefined1 auVar345 [32];
  undefined1 auVar346 [32];
  undefined1 auVar347 [32];
  undefined1 auVar348 [32];
  undefined1 auVar349 [32];
  undefined1 auVar350 [32];
  undefined1 auVar351 [32];
  undefined1 auVar352 [32];
  undefined1 auVar353 [32];
  undefined1 auVar354 [32];
  undefined1 auVar355 [32];
  undefined1 auVar356 [32];
  undefined1 auVar357 [32];
  undefined1 auVar358 [32];
  undefined1 auVar359 [32];
  undefined1 auVar360 [32];
  undefined1 auVar361 [32];
  undefined1 auVar362 [32];
  undefined1 auVar363 [32];
  undefined1 auVar364 [32];
  undefined1 auVar365 [32];
  undefined1 auVar366 [32];
  undefined1 auVar367 [32];
  undefined1 auVar368 [32];
  undefined1 auVar369 [32];
  undefined1 auVar370 [32];
  undefined1 auVar371 [32];
  undefined1 auVar372 [32];
  undefined1 auVar373 [32];
  undefined1 auVar374 [32];
  undefined1 auVar375 [32];
  undefined1 auVar376 [32];
  undefined1 auVar377 [32];
  undefined1 auVar378 [32];
  undefined1 auVar379 [32];
  undefined1 auVar380 [32];
  undefined1 auVar381 [32];
  undefined1 auVar382 [32];
  undefined1 auVar383 [32];
  undefined1 auVar384 [32];
  undefined1 auVar385 [32];
  undefined1 auVar386 [32];
  undefined1 auVar387 [32];
  undefined1 auVar388 [32];
  undefined1 auVar389 [32];
  undefined1 auVar390 [32];
  undefined1 auVar391 [32];
  undefined1 auVar392 [32];
  undefined1 auVar393 [32];
  undefined1 auVar394 [32];
  undefined1 auVar395 [32];
  undefined1 auVar396 [32];
  undefined1 auVar397 [32];
  undefined1 auVar398 [32];
  undefined1 auVar399 [32];
  undefined1 auVar400 [32];
  undefined1 auVar401 [32];
  undefined1 auVar402 [32];
  undefined1 auVar403 [32];
  undefined1 auVar404 [32];
  undefined1 auVar405 [32];
  undefined1 auVar406 [32];
  undefined1 auVar407 [32];
  undefined1 auVar408 [32];
  undefined1 auVar409 [32];
  undefined1 auVar410 [32];
  undefined1 auVar411 [32];
  undefined1 auVar412 [32];
  undefined1 auVar413 [32];
  undefined1 auVar414 [32];
  undefined1 auVar415 [32];
  undefined1 auVar416 [32];
  undefined1 auVar417 [32];
  undefined1 auVar418 [32];
  undefined1 auVar419 [32];
  undefined1 auVar420 [32];
  undefined1 auVar421 [32];
  undefined1 auVar422 [32];
  undefined1 auVar423 [32];
  undefined1 auVar424 [32];
  undefined1 auVar425 [32];
  undefined1 auVar426 [32];
  undefined1 auVar427 [32];
  undefined1 auVar428 [32];
  undefined1 auVar429 [32];
  undefined1 auVar430 [32];
  undefined1 auVar431 [32];
  undefined1 auVar432 [32];
  undefined1 auVar433 [32];
  undefined1 auVar434 [32];
  undefined1 auVar435 [32];
  undefined1 auVar436 [32];
  undefined1 auVar437 [32];
  undefined1 auVar438 [32];
  undefined1 auVar439 [32];
  undefined1 auVar440 [32];
  undefined1 auVar441 [32];
  undefined1 auVar442 [32];
  undefined1 auVar443 [32];
  undefined1 auVar444 [32];
  undefined1 auVar445 [32];
  undefined1 auVar446 [32];
  undefined1 auVar447 [32];
  undefined1 auVar448 [32];
  undefined1 auVar449 [32];
  undefined1 auVar450 [32];
  undefined1 auVar451 [32];
  undefined1 auVar452 [32];
  undefined1 auVar453 [32];
  undefined1 auVar454 [32];
  undefined1 auVar455 [32];
  undefined1 auVar456 [32];
  undefined1 auVar457 [32];
  undefined1 auVar458 [32];
  undefined1 auVar459 [32];
  undefined1 auVar460 [32];
  undefined1 auVar461 [32];
  undefined1 auVar462 [32];
  undefined1 auVar463 [32];
  undefined1 auVar464 [32];
  undefined1 auVar465 [32];
  undefined1 auVar466 [32];
  undefined1 auVar467 [32];
  undefined1 auVar468 [32];
  undefined1 auVar469 [32];
  undefined1 auVar470 [32];
  undefined1 auVar471 [32];
  undefined1 auVar472 [32];
  undefined1 auVar473 [32];
  undefined1 auVar474 [32];
  undefined1 auVar475 [32];
  undefined1 auVar476 [32];
  undefined1 auVar477 [32];
  undefined1 auVar478 [32];
  undefined1 auVar479 [32];
  undefined1 auVar480 [32];
  undefined1 auVar481 [32];
  undefined1 auVar482 [32];
  undefined1 auVar483 [32];
  undefined1 auVar484 [32];
  undefined1 auVar485 [32];
  undefined1 auVar486 [32];
  undefined1 auVar487 [32];
  undefined1 auVar488 [32];
  undefined1 auVar489 [32];
  undefined1 auVar490 [32];
  undefined1 auVar491 [32];
  undefined1 auVar492 [32];
  undefined1 auVar493 [32];
  undefined1 auVar494 [32];
  undefined1 auVar495 [32];
  undefined1 auVar496 [32];
  undefined1 auVar497 [32];
  undefined1 auVar498 [32];
  undefined1 auVar499 [32];
  undefined1 auVar500 [32];
  undefined1 auVar501 [32];
  undefined1 auVar502 [32];
  undefined1 auVar503 [32];
  undefined1 auVar504 [32];
  undefined1 auVar505 [32];
  undefined1 auVar506 [32];
  undefined1 auVar507 [32];
  undefined1 auVar508 [32];
  undefined1 auVar509 [32];
  undefined1 auVar510 [32];
  undefined1 auVar511 [32];
  undefined1 auVar512 [32];
  undefined1 auVar513 [32];
  undefined1 auVar514 [32];
  undefined1 auVar515 [32];
  undefined1 auVar516 [32];
  undefined1 auVar517 [32];
  undefined1 auVar518 [32];
  undefined1 auVar519 [32];
  undefined1 auVar520 [32];
  undefined1 auVar521 [32];
  undefined1 auVar522 [32];
  undefined1 auVar523 [32];
  undefined1 auVar524 [32];
  undefined1 auVar525 [32];
  undefined1 auVar526 [32];
  undefined1 auVar527 [32];
  undefined1 auVar528 [32];
  undefined1 auVar529 [32];
  undefined1 auVar530 [32];
  undefined1 auVar531 [32];
  undefined1 auVar532 [32];
  undefined1 auVar533 [32];
  undefined1 auVar534 [32];
  undefined1 auVar535 [32];
  undefined1 auVar536 [32];
  undefined1 auVar537 [32];
  undefined1 auVar538 [32];
  undefined1 auVar539 [32];
  undefined1 auVar540 [32];
  undefined1 auVar541 [32];
  undefined1 auVar542 [32];
  undefined1 auVar543 [32];
  undefined1 auVar544 [32];
  undefined1 auVar545 [32];
  undefined1 auVar546 [32];
  undefined1 auVar547 [32];
  undefined1 auVar548 [32];
  undefined1 auVar549 [32];
  undefined1 auVar550 [32];
  undefined1 auVar551 [32];
  undefined1 auVar552 [32];
  undefined1 auVar553 [32];
  undefined1 auVar554 [32];
  undefined1 auVar555 [32];
  undefined1 auVar556 [32];
  undefined1 auVar557 [32];
  undefined1 auVar558 [32];
  undefined1 auVar559 [32];
  undefined1 auVar560 [32];
  undefined1 auVar561 [32];
  undefined1 auVar562 [32];
  undefined1 auVar563 [32];
  undefined1 auVar564 [32];
  undefined1 auVar565 [32];
  undefined1 auVar566 [32];
  undefined1 auVar567 [32];
  undefined1 auVar568 [32];
  undefined1 auVar569 [32];
  undefined1 auVar570 [32];
  undefined1 auVar571 [32];
  undefined1 auVar572 [32];
  undefined1 auVar573 [32];
  undefined1 auVar574 [32];
  undefined1 auVar575 [32];
  undefined1 auVar576 [32];
  undefined1 auVar577 [32];
  undefined1 auVar578 [32];
  undefined1 auVar579 [32];
  undefined1 auVar580 [32];
  undefined1 auVar581 [32];
  undefined1 auVar582 [32];
  undefined1 auVar583 [32];
  undefined1 auVar584 [32];
  undefined1 auVar585 [32];
  undefined1 auVar586 [32];
  undefined1 auVar587 [32];
  undefined1 auVar588 [32];
  undefined1 auVar589 [32];
  undefined1 auVar590 [32];
  undefined1 auVar591 [32];
  uint uVar592;
  ushort uVar593;
  int in_ECX;
  undefined8 *in_RDX;
  int in_ESI;
  long in_RDI;
  uint in_R8D;
  int in_R9D;
  undefined1 auVar594 [16];
  undefined1 auVar595 [16];
  undefined1 auVar596 [16];
  undefined1 auVar597 [16];
  __m256i min_val;
  __m256i max_val;
  __m256i T2_16;
  __m256i T2_17;
  __m256i T2_18;
  __m256i T2_19;
  __m256i T2_20;
  __m256i T2_21;
  __m256i T2_22;
  __m256i T2_23;
  __m256i T2_24;
  __m256i T2_25;
  __m256i T2_26;
  __m256i T2_27;
  __m256i T2_28;
  __m256i T2_29;
  __m256i T2_30;
  __m256i T2_31;
  __m256i T2_15;
  __m256i T2_14;
  __m256i T2_13;
  __m256i T2_12;
  __m256i T2_11;
  __m256i T2_10;
  __m256i T2_09;
  __m256i T2_08;
  __m256i T2_07;
  __m256i T2_06;
  __m256i T2_05;
  __m256i T2_04;
  __m256i T2_03;
  __m256i T2_02;
  __m256i T2_01;
  __m256i T2_00;
  __m256i T1F;
  __m256i T1E;
  __m256i T1D;
  __m256i T1C;
  __m256i T1B;
  __m256i T1A;
  __m256i T19;
  __m256i T18;
  __m256i T17;
  __m256i T16;
  __m256i T15;
  __m256i T14;
  __m256i T13;
  __m256i T12;
  __m256i T11;
  __m256i T10;
  __m256i E8;
  __m256i E9;
  __m256i EA;
  __m256i EB;
  __m256i EC;
  __m256i ED;
  __m256i EE;
  __m256i EF;
  __m256i E7;
  __m256i E6;
  __m256i E5;
  __m256i E4;
  __m256i E3;
  __m256i E2;
  __m256i E1;
  __m256i E0;
  __m256i EE4;
  __m256i EE5;
  __m256i EE6;
  __m256i EE7;
  __m256i EE3;
  __m256i EE2;
  __m256i EE1;
  __m256i EE0;
  __m256i EEE2;
  __m256i EEE3;
  __m256i EEE1;
  __m256i EEE0;
  __m256i EEEE1;
  __m256i EEEE0;
  __m256i EEEO1;
  __m256i EEEO0;
  __m256i EEO3;
  __m256i EEO2;
  __m256i EEO1;
  __m256i EEO0;
  __m256i T_00_15;
  __m256i T_00_14;
  __m256i T_00_13;
  __m256i T_00_12;
  __m256i T_00_11;
  __m256i T_00_10;
  __m256i T_00_09;
  __m256i T_00_08;
  __m256i T_00_07;
  __m256i T_00_06;
  __m256i T_00_05;
  __m256i T_00_04;
  __m256i T_00_03;
  __m256i T_00_02;
  __m256i T_00_01;
  __m256i T_00_00;
  int i;
  __m256i EO7;
  __m256i EO6;
  __m256i EO5;
  __m256i EO4;
  __m256i EO3;
  __m256i EO2;
  __m256i EO1;
  __m256i EO0;
  __m256i O15;
  __m256i O14;
  __m256i O13;
  __m256i O12;
  __m256i O11;
  __m256i O10;
  __m256i O09;
  __m256i O08;
  __m256i O07;
  __m256i O06;
  __m256i O05;
  __m256i O04;
  __m256i O03;
  __m256i O02;
  __m256i O01;
  __m256i O00;
  __m256i t7;
  __m256i t6;
  __m256i t5;
  __m256i t4;
  __m256i t3;
  __m256i t2;
  __m256i t1;
  __m256i t0;
  __m256i res15;
  __m256i res14;
  __m256i res13;
  __m256i res12;
  __m256i res11;
  __m256i res10;
  __m256i res09;
  __m256i res08;
  __m256i res07;
  __m256i res06;
  __m256i res05;
  __m256i res04;
  __m256i res03;
  __m256i res02;
  __m256i res01;
  __m256i res00;
  __m128i ss15;
  __m128i ss14;
  __m128i ss13;
  __m128i ss12;
  __m128i ss11;
  __m128i ss10;
  __m128i ss09;
  __m128i ss08;
  __m128i ss07;
  __m128i ss06;
  __m128i ss05;
  __m128i ss04;
  __m128i ss03;
  __m128i ss02;
  __m128i ss01;
  __m128i ss00;
  __m128i src31;
  __m128i src30;
  __m128i src29;
  __m128i src28;
  __m128i src27;
  __m128i src26;
  __m128i src25;
  __m128i src24;
  __m128i src23;
  __m128i src22;
  __m128i src21;
  __m128i src20;
  __m128i src19;
  __m128i src18;
  __m128i src17;
  __m128i src16;
  __m128i src15;
  __m128i src14;
  __m128i src13;
  __m128i src12;
  __m128i src11;
  __m128i src10;
  __m128i src09;
  __m128i src08;
  __m128i src07;
  __m128i src06;
  __m128i src05;
  __m128i src04;
  __m128i src03;
  __m128i src02;
  __m128i src01;
  __m128i src00;
  __m256i c32_off;
  __m256i c16_n32_p32;
  __m256i c16_p32_p32;
  __m256i c16_n42_p17;
  __m256i c16_p17_p42;
  __m256i c16_n44_p38;
  __m256i c16_n25_p09;
  __m256i c16_p38_p09;
  __m256i c16_n44_p25;
  __m256i c16_n25_n44;
  __m256i c16_n09_p38;
  __m256i c16_p09_p25;
  __m256i c16_p38_p44;
  __m256i c16_n40_p35;
  __m256i c16_n29_p21;
  __m256i c16_n13_p04;
  __m256i c16_p43_n29;
  __m256i c16_p04_p21;
  __m256i c16_n40_p45;
  __m256i c16_n35_p13;
  __m256i c16_n40_p04;
  __m256i c16_p35_n43;
  __m256i c16_p13_p29;
  __m256i c16_n45_p21;
  __m256i c16_p35_p21;
  __m256i c16_n43_n04;
  __m256i c16_p45_n13;
  __m256i c16_n40_p29;
  __m256i c16_n29_n40;
  __m256i c16_p13_p45;
  __m256i c16_p04_n43;
  __m256i c16_n21_p35;
  __m256i c16_p21_p45;
  __m256i c16_p29_n13;
  __m256i c16_n43_n35;
  __m256i c16_p04_p40;
  __m256i c16_n13_n35;
  __m256i c16_n45_n40;
  __m256i c16_n21_p04;
  __m256i c16_p29_p43;
  __m256i c16_p04_p13;
  __m256i c16_p21_p29;
  __m256i c16_p35_p40;
  __m256i c16_n45_p45;
  __m256i c16_n44_p43;
  __m256i c16_n41_p39;
  __m256i c16_n36_p34;
  __m256i c16_n30_p27;
  __m256i c16_n23_p19;
  __m256i c16_n15_p11;
  __m256i c16_n07_p02;
  __m256i c16_p45_n41;
  __m256i c16_p34_n23;
  __m256i c16_p11_p02;
  __m256i c16_n15_p27;
  __m256i c16_n36_p43;
  __m256i c16_n45_p44;
  __m256i c16_n39_p30;
  __m256i c16_n19_p07;
  __m256i c16_n44_p34;
  __m256i c16_n15_n07;
  __m256i c16_p27_n41;
  __m256i c16_p45_n39;
  __m256i c16_p23_n02;
  __m256i c16_n19_p36;
  __m256i c16_n45_p43;
  __m256i c16_n30_p11;
  __m256i c16_p43_n23;
  __m256i c16_n07_p34;
  __m256i c16_n45_p36;
  __m256i c16_n11_n19;
  __m256i c16_p41_n44;
  __m256i c16_p27_p02;
  __m256i c16_n30_p45;
  __m256i c16_n39_p15;
  __m256i c16_n41_p11;
  __m256i c16_p27_n45;
  __m256i c16_p30_p07;
  __m256i c16_n39_p43;
  __m256i c16_n15_n23;
  __m256i c16_p45_n34;
  __m256i c16_n02_p36;
  __m256i c16_n44_p19;
  __m256i c16_p39_p02;
  __m256i c16_n41_p36;
  __m256i c16_p07_n43;
  __m256i c16_p34_p11;
  __m256i c16_n44_p30;
  __m256i c16_p15_n45;
  __m256i c16_p27_p19;
  __m256i c16_n45_p23;
  __m256i c16_n36_n15;
  __m256i c16_p45_n11;
  __m256i c16_n39_p34;
  __m256i c16_p19_n45;
  __m256i c16_p07_p41;
  __m256i c16_n30_n23;
  __m256i c16_p44_n02;
  __m256i c16_n43_p27;
  __m256i c16_p34_p27;
  __m256i c16_n39_n19;
  __m256i c16_p43_p11;
  __m256i c16_n45_n02;
  __m256i c16_p45_n07;
  __m256i c16_n44_p15;
  __m256i c16_p41_n23;
  __m256i c16_n36_p30;
  __m256i c16_n30_n36;
  __m256i c16_p23_p41;
  __m256i c16_n15_n44;
  __m256i c16_p07_p45;
  __m256i c16_p02_n45;
  __m256i c16_n11_p43;
  __m256i c16_p19_n39;
  __m256i c16_n27_p34;
  __m256i c16_p27_p43;
  __m256i c16_n02_n44;
  __m256i c16_n23_p30;
  __m256i c16_p41_n07;
  __m256i c16_n45_n19;
  __m256i c16_p34_p39;
  __m256i c16_n11_n45;
  __m256i c16_n15_p36;
  __m256i c16_n23_n45;
  __m256i c16_n19_p27;
  __m256i c16_p45_p15;
  __m256i c16_n30_n44;
  __m256i c16_n11_p34;
  __m256i c16_p43_p07;
  __m256i c16_n36_n41;
  __m256i c16_n02_p39;
  __m256i c16_p19_p44;
  __m256i c16_p36_p02;
  __m256i c16_n34_n45;
  __m256i c16_n23_p15;
  __m256i c16_p43_p39;
  __m256i c16_p07_n30;
  __m256i c16_n45_n27;
  __m256i c16_p11_p41;
  __m256i c16_n15_n39;
  __m256i c16_n45_n30;
  __m256i c16_n02_p27;
  __m256i c16_p44_p41;
  __m256i c16_p19_n11;
  __m256i c16_n36_n45;
  __m256i c16_n34_n07;
  __m256i c16_p23_p43;
  __m256i c16_p11_p30;
  __m256i c16_p43_p45;
  __m256i c16_p36_p19;
  __m256i c16_n02_n23;
  __m256i c16_n39_n45;
  __m256i c16_n41_n27;
  __m256i c16_n07_p15;
  __m256i c16_p34_p44;
  __m256i c16_n07_n19;
  __m256i c16_n30_n39;
  __m256i c16_n44_n45;
  __m256i c16_n43_n36;
  __m256i c16_n27_n15;
  __m256i c16_n02_p11;
  __m256i c16_p23_p34;
  __m256i c16_p41_p45;
  __m256i c16_p02_p07;
  __m256i c16_p11_p15;
  __m256i c16_p19_p23;
  __m256i c16_p27_p30;
  __m256i c16_p34_p36;
  __m256i c16_p39_p41;
  __m256i c16_p43_p44;
  __m256i c16_p45_p45;
  int local_d7e4;
  undefined1 local_d3e0 [32];
  undefined1 local_d3c0 [32];
  undefined1 local_d3a0 [32];
  undefined1 local_d380 [32];
  undefined1 local_d360 [32];
  undefined1 local_d340 [32];
  undefined1 local_d320 [32];
  undefined1 local_d300 [32];
  undefined1 local_d2e0 [32];
  undefined1 local_d2c0 [32];
  undefined1 local_d2a0 [32];
  undefined1 local_d280 [32];
  undefined1 local_d260 [32];
  undefined1 local_d240 [32];
  undefined1 local_d220 [32];
  undefined1 local_d200 [32];
  undefined8 local_d1e0;
  undefined8 uStack_d1d8;
  undefined8 local_d1d0;
  undefined8 uStack_d1c8;
  undefined8 local_d1c0;
  undefined8 uStack_d1b8;
  undefined8 local_d1b0;
  undefined8 uStack_d1a8;
  undefined8 local_d1a0;
  undefined8 uStack_d198;
  undefined8 local_d190;
  undefined8 uStack_d188;
  undefined8 local_d180;
  undefined8 uStack_d178;
  undefined8 local_d170;
  undefined8 uStack_d168;
  byte local_b974;
  char local_b970;
  undefined8 *local_b968;
  undefined8 uStack_2b70;
  undefined8 uStack_2b68;
  undefined8 uStack_2b30;
  undefined8 uStack_2b28;
  undefined8 uStack_2af0;
  undefined8 uStack_2ae8;
  undefined8 uStack_2ab0;
  undefined8 uStack_2aa8;
  undefined8 uStack_2a70;
  undefined8 uStack_2a68;
  undefined8 uStack_2a30;
  undefined8 uStack_2a28;
  undefined8 uStack_29f0;
  undefined8 uStack_29e8;
  undefined8 uStack_29b0;
  undefined8 uStack_29a8;
  undefined8 uStack_2970;
  undefined8 uStack_2968;
  undefined8 uStack_2930;
  undefined8 uStack_2928;
  undefined8 uStack_28f0;
  undefined8 uStack_28e8;
  undefined8 uStack_28b0;
  undefined8 uStack_28a8;
  undefined8 uStack_2870;
  undefined8 uStack_2868;
  undefined8 uStack_2830;
  undefined8 uStack_2828;
  undefined8 uStack_27f0;
  undefined8 uStack_27e8;
  undefined8 uStack_27b0;
  undefined8 uStack_27a8;
  undefined8 uStack_2770;
  undefined8 uStack_2768;
  undefined8 uStack_2730;
  undefined8 uStack_2728;
  undefined8 uStack_26f0;
  undefined8 uStack_26e8;
  undefined8 uStack_26b0;
  undefined8 uStack_26a8;
  undefined8 uStack_2670;
  undefined8 uStack_2668;
  undefined8 uStack_2630;
  undefined8 uStack_2628;
  undefined8 uStack_25f0;
  undefined8 uStack_25e8;
  undefined8 uStack_25b0;
  undefined8 uStack_25a8;
  undefined8 uStack_2570;
  undefined8 uStack_2568;
  undefined8 uStack_2530;
  undefined8 uStack_2528;
  undefined8 uStack_24f0;
  undefined8 uStack_24e8;
  undefined8 uStack_24b0;
  undefined8 uStack_24a8;
  undefined8 uStack_2470;
  undefined8 uStack_2468;
  undefined8 uStack_2430;
  undefined8 uStack_2428;
  undefined8 uStack_23f0;
  undefined8 uStack_23e8;
  undefined8 uStack_23b0;
  undefined8 uStack_23a8;
  undefined8 uStack_2370;
  undefined8 uStack_2368;
  undefined8 uStack_2330;
  undefined8 uStack_2328;
  undefined8 uStack_22f0;
  undefined8 uStack_22e8;
  undefined8 uStack_22b0;
  undefined8 uStack_22a8;
  undefined8 uStack_2270;
  undefined8 uStack_2268;
  undefined8 uStack_2230;
  undefined8 uStack_2228;
  undefined8 uStack_21f0;
  undefined8 uStack_21e8;
  undefined8 uStack_21b0;
  undefined8 uStack_21a8;
  undefined8 uStack_2170;
  undefined8 uStack_2168;
  undefined8 uStack_2130;
  undefined8 uStack_2128;
  undefined8 uStack_20f0;
  undefined8 uStack_20e8;
  undefined8 uStack_20b0;
  undefined8 uStack_20a8;
  undefined8 uStack_2070;
  undefined8 uStack_2068;
  undefined8 uStack_2030;
  undefined8 uStack_2028;
  undefined8 uStack_1ff0;
  undefined8 uStack_1fe8;
  undefined8 uStack_1fb0;
  undefined8 uStack_1fa8;
  undefined8 uStack_1f70;
  undefined8 uStack_1f68;
  undefined8 uStack_1f30;
  undefined8 uStack_1f28;
  undefined8 uStack_1ef0;
  undefined8 uStack_1ee8;
  undefined8 uStack_1eb0;
  undefined8 uStack_1ea8;
  undefined8 uStack_1e70;
  undefined8 uStack_1e68;
  undefined8 uStack_1e30;
  undefined8 uStack_1e28;
  undefined8 uStack_1df0;
  undefined8 uStack_1de8;
  undefined8 uStack_1db0;
  undefined8 uStack_1da8;
  undefined8 uStack_1d70;
  undefined8 uStack_1d68;
  undefined8 uStack_1d30;
  undefined8 uStack_1d28;
  undefined8 uStack_1cf0;
  undefined8 uStack_1ce8;
  undefined8 uStack_1cb0;
  undefined8 uStack_1ca8;
  undefined8 uStack_1c70;
  undefined8 uStack_1c68;
  undefined8 uStack_1c30;
  undefined8 uStack_1c28;
  undefined8 uStack_1bf0;
  undefined8 uStack_1be8;
  undefined8 uStack_1bb0;
  undefined8 uStack_1ba8;
  undefined8 uStack_1b70;
  undefined8 uStack_1b68;
  undefined8 uStack_1b30;
  undefined8 uStack_1b28;
  undefined8 uStack_1af0;
  undefined8 uStack_1ae8;
  undefined8 uStack_1ab0;
  undefined8 uStack_1aa8;
  undefined8 uStack_1a70;
  undefined8 uStack_1a68;
  undefined8 uStack_1a30;
  undefined8 uStack_1a28;
  undefined8 uStack_19f0;
  undefined8 uStack_19e8;
  undefined8 uStack_19b0;
  undefined8 uStack_19a8;
  undefined8 uStack_1970;
  undefined8 uStack_1968;
  undefined8 uStack_1930;
  undefined8 uStack_1928;
  undefined8 uStack_18f0;
  undefined8 uStack_18e8;
  undefined8 uStack_18b0;
  undefined8 uStack_18a8;
  undefined8 uStack_1870;
  undefined8 uStack_1868;
  undefined8 uStack_1830;
  undefined8 uStack_1828;
  undefined8 uStack_17f0;
  undefined8 uStack_17e8;
  undefined8 uStack_17b0;
  undefined8 uStack_17a8;
  undefined8 uStack_1770;
  undefined8 uStack_1768;
  undefined8 uStack_1730;
  undefined8 uStack_1728;
  undefined8 uStack_16f0;
  undefined8 uStack_16e8;
  undefined8 uStack_16b0;
  undefined8 uStack_16a8;
  undefined8 uStack_1670;
  undefined8 uStack_1668;
  undefined8 uStack_1630;
  undefined8 uStack_1628;
  undefined8 uStack_15f0;
  undefined8 uStack_15e8;
  undefined8 uStack_15b0;
  undefined8 uStack_15a8;
  undefined8 uStack_1570;
  undefined8 uStack_1568;
  undefined8 uStack_1530;
  undefined8 uStack_1528;
  undefined8 uStack_14f0;
  undefined8 uStack_14e8;
  undefined8 uStack_14b0;
  undefined8 uStack_14a8;
  undefined8 uStack_1470;
  undefined8 uStack_1468;
  undefined8 uStack_1430;
  undefined8 uStack_1428;
  undefined8 uStack_13f0;
  undefined8 uStack_13e8;
  undefined8 uStack_13b0;
  undefined8 uStack_13a8;
  undefined8 uStack_1370;
  undefined8 uStack_1368;
  undefined8 uStack_1330;
  undefined8 uStack_1328;
  undefined8 uStack_12f0;
  undefined8 uStack_12e8;
  undefined8 uStack_12b0;
  undefined8 uStack_12a8;
  undefined8 uStack_1270;
  undefined8 uStack_1268;
  undefined8 uStack_1230;
  undefined8 uStack_1228;
  undefined8 uStack_11f0;
  undefined8 uStack_11e8;
  undefined8 uStack_11b0;
  undefined8 uStack_11a8;
  undefined8 uStack_1170;
  undefined8 uStack_1168;
  undefined8 uStack_1130;
  undefined8 uStack_1128;
  undefined8 uStack_10f0;
  undefined8 uStack_10e8;
  undefined8 uStack_10b0;
  undefined8 uStack_10a8;
  undefined8 uStack_1070;
  undefined8 uStack_1068;
  undefined8 uStack_1030;
  undefined8 uStack_1028;
  undefined8 uStack_ff0;
  undefined8 uStack_fe8;
  undefined8 uStack_fb0;
  undefined8 uStack_fa8;
  undefined8 uStack_f70;
  undefined8 uStack_f68;
  undefined8 uStack_f30;
  undefined8 uStack_f28;
  undefined8 uStack_ef0;
  undefined8 uStack_ee8;
  undefined8 uStack_eb0;
  undefined8 uStack_ea8;
  undefined8 uStack_e70;
  undefined8 uStack_e68;
  undefined8 uStack_e30;
  undefined8 uStack_e28;
  undefined8 uStack_df0;
  undefined8 uStack_de8;
  undefined8 uStack_db0;
  undefined8 uStack_da8;
  undefined8 uStack_d70;
  undefined8 uStack_d68;
  undefined8 uStack_d30;
  undefined8 uStack_d28;
  undefined8 uStack_cf0;
  undefined8 uStack_ce8;
  undefined8 uStack_cb0;
  undefined8 uStack_ca8;
  undefined8 uStack_c70;
  undefined8 uStack_c68;
  undefined8 uStack_c30;
  undefined8 uStack_c28;
  undefined8 uStack_bf0;
  undefined8 uStack_be8;
  undefined8 uStack_bb0;
  undefined8 uStack_ba8;
  undefined8 uStack_b70;
  undefined8 uStack_b68;
  undefined8 uStack_b30;
  undefined8 uStack_b28;
  undefined8 uStack_af0;
  undefined8 uStack_ae8;
  undefined8 uStack_ab0;
  undefined8 uStack_aa8;
  undefined8 uStack_a70;
  undefined8 uStack_a68;
  undefined8 uStack_a30;
  undefined8 uStack_a28;
  undefined8 uStack_9f0;
  undefined8 uStack_9e8;
  undefined8 uStack_9b0;
  undefined8 uStack_9a8;
  undefined8 uStack_970;
  undefined8 uStack_968;
  undefined8 uStack_930;
  undefined8 uStack_928;
  undefined8 uStack_8f0;
  undefined8 uStack_8e8;
  undefined8 uStack_8b0;
  undefined8 uStack_8a8;
  undefined8 uStack_870;
  undefined8 uStack_868;
  undefined8 uStack_830;
  undefined8 uStack_828;
  undefined8 uStack_7f0;
  undefined8 uStack_7e8;
  undefined8 uStack_7b0;
  undefined8 uStack_7a8;
  undefined8 uStack_770;
  undefined8 uStack_768;
  undefined8 uStack_730;
  undefined8 uStack_728;
  undefined8 uStack_6f0;
  undefined8 uStack_6e8;
  undefined8 uStack_6b0;
  undefined8 uStack_6a8;
  undefined8 uStack_670;
  undefined8 uStack_668;
  undefined8 uStack_630;
  undefined8 uStack_628;
  undefined8 uStack_5f0;
  undefined8 uStack_5e8;
  undefined8 uStack_5b0;
  undefined8 uStack_5a8;
  undefined8 uStack_570;
  undefined8 uStack_568;
  undefined8 uStack_530;
  undefined8 uStack_528;
  undefined8 uStack_4f0;
  undefined8 uStack_4e8;
  undefined8 uStack_4b0;
  undefined8 uStack_4a8;
  undefined8 uStack_470;
  undefined8 uStack_468;
  undefined8 uStack_430;
  undefined8 uStack_428;
  undefined8 uStack_3f0;
  undefined8 uStack_3e8;
  undefined8 uStack_3b0;
  undefined8 uStack_3a8;
  undefined8 uStack_370;
  undefined8 uStack_368;
  undefined8 uStack_330;
  undefined8 uStack_328;
  undefined8 uStack_2f0;
  undefined8 uStack_2e8;
  undefined8 uStack_2b0;
  undefined8 uStack_2a8;
  undefined8 uStack_270;
  undefined8 uStack_268;
  undefined8 uStack_230;
  undefined8 uStack_228;
  undefined8 uStack_1f0;
  undefined8 uStack_1e8;
  undefined8 uStack_1b0;
  undefined8 uStack_1a8;
  undefined8 uStack_170;
  undefined8 uStack_168;
  undefined8 uStack_130;
  undefined8 uStack_128;
  undefined8 uStack_f0;
  undefined8 uStack_e8;
  undefined8 uStack_b0;
  undefined8 uStack_a8;
  undefined8 uStack_70;
  undefined8 uStack_68;
  
  auVar17 = vpinsrd_avx(ZEXT416(0x2d002d),0x2d002d,1);
  auVar17 = vpinsrd_avx(auVar17,0x2d002d,2);
  auVar17 = vpinsrd_avx(auVar17,0x2d002d,3);
  auVar18 = vpinsrd_avx(ZEXT416(0x2d002d),0x2d002d,1);
  auVar18 = vpinsrd_avx(auVar18,0x2d002d,2);
  auVar18 = vpinsrd_avx(auVar18,0x2d002d,3);
  uStack_2b70 = auVar18._0_8_;
  uStack_2b68 = auVar18._8_8_;
  auVar18 = vpinsrd_avx(ZEXT416(0x2b002c),0x2b002c,1);
  auVar18 = vpinsrd_avx(auVar18,0x2b002c,2);
  auVar18 = vpinsrd_avx(auVar18,0x2b002c,3);
  auVar19 = vpinsrd_avx(ZEXT416(0x2b002c),0x2b002c,1);
  auVar19 = vpinsrd_avx(auVar19,0x2b002c,2);
  auVar19 = vpinsrd_avx(auVar19,0x2b002c,3);
  uStack_2b30 = auVar19._0_8_;
  uStack_2b28 = auVar19._8_8_;
  auVar19 = vpinsrd_avx(ZEXT416(0x270029),0x270029,1);
  auVar19 = vpinsrd_avx(auVar19,0x270029,2);
  auVar19 = vpinsrd_avx(auVar19,0x270029,3);
  auVar20 = vpinsrd_avx(ZEXT416(0x270029),0x270029,1);
  auVar20 = vpinsrd_avx(auVar20,0x270029,2);
  auVar20 = vpinsrd_avx(auVar20,0x270029,3);
  uStack_2af0 = auVar20._0_8_;
  uStack_2ae8 = auVar20._8_8_;
  auVar20 = vpinsrd_avx(ZEXT416(0x220024),0x220024,1);
  auVar20 = vpinsrd_avx(auVar20,0x220024,2);
  auVar20 = vpinsrd_avx(auVar20,0x220024,3);
  auVar21 = vpinsrd_avx(ZEXT416(0x220024),0x220024,1);
  auVar21 = vpinsrd_avx(auVar21,0x220024,2);
  auVar21 = vpinsrd_avx(auVar21,0x220024,3);
  uStack_2ab0 = auVar21._0_8_;
  uStack_2aa8 = auVar21._8_8_;
  auVar21 = vpinsrd_avx(ZEXT416(0x1b001e),0x1b001e,1);
  auVar21 = vpinsrd_avx(auVar21,0x1b001e,2);
  auVar21 = vpinsrd_avx(auVar21,0x1b001e,3);
  auVar22 = vpinsrd_avx(ZEXT416(0x1b001e),0x1b001e,1);
  auVar22 = vpinsrd_avx(auVar22,0x1b001e,2);
  auVar22 = vpinsrd_avx(auVar22,0x1b001e,3);
  uStack_2a70 = auVar22._0_8_;
  uStack_2a68 = auVar22._8_8_;
  auVar22 = vpinsrd_avx(ZEXT416(0x130017),0x130017,1);
  auVar22 = vpinsrd_avx(auVar22,0x130017,2);
  auVar22 = vpinsrd_avx(auVar22,0x130017,3);
  auVar23 = vpinsrd_avx(ZEXT416(0x130017),0x130017,1);
  auVar23 = vpinsrd_avx(auVar23,0x130017,2);
  auVar23 = vpinsrd_avx(auVar23,0x130017,3);
  uStack_2a30 = auVar23._0_8_;
  uStack_2a28 = auVar23._8_8_;
  auVar23 = vpinsrd_avx(ZEXT416(0xb000f),0xb000f,1);
  auVar23 = vpinsrd_avx(auVar23,0xb000f,2);
  auVar23 = vpinsrd_avx(auVar23,0xb000f,3);
  auVar24 = vpinsrd_avx(ZEXT416(0xb000f),0xb000f,1);
  auVar24 = vpinsrd_avx(auVar24,0xb000f,2);
  auVar24 = vpinsrd_avx(auVar24,0xb000f,3);
  uStack_29f0 = auVar24._0_8_;
  uStack_29e8 = auVar24._8_8_;
  auVar24 = vpinsrd_avx(ZEXT416(0x20007),0x20007,1);
  auVar24 = vpinsrd_avx(auVar24,0x20007,2);
  auVar24 = vpinsrd_avx(auVar24,0x20007,3);
  auVar25 = vpinsrd_avx(ZEXT416(0x20007),0x20007,1);
  auVar25 = vpinsrd_avx(auVar25,0x20007,2);
  auVar25 = vpinsrd_avx(auVar25,0x20007,3);
  uStack_29b0 = auVar25._0_8_;
  uStack_29a8 = auVar25._8_8_;
  auVar25 = vpinsrd_avx(ZEXT416(0x29002d),0x29002d,1);
  auVar25 = vpinsrd_avx(auVar25,0x29002d,2);
  auVar25 = vpinsrd_avx(auVar25,0x29002d,3);
  auVar26 = vpinsrd_avx(ZEXT416(0x29002d),0x29002d,1);
  auVar26 = vpinsrd_avx(auVar26,0x29002d,2);
  auVar26 = vpinsrd_avx(auVar26,0x29002d,3);
  uStack_2970 = auVar26._0_8_;
  uStack_2968 = auVar26._8_8_;
  auVar26 = vpinsrd_avx(ZEXT416(0x170022),0x170022,1);
  auVar26 = vpinsrd_avx(auVar26,0x170022,2);
  auVar26 = vpinsrd_avx(auVar26,0x170022,3);
  auVar27 = vpinsrd_avx(ZEXT416(0x170022),0x170022,1);
  auVar27 = vpinsrd_avx(auVar27,0x170022,2);
  auVar27 = vpinsrd_avx(auVar27,0x170022,3);
  uStack_2930 = auVar27._0_8_;
  uStack_2928 = auVar27._8_8_;
  auVar27 = vpinsrd_avx(ZEXT416(0xfffe000b),0xfffe000b,1);
  auVar27 = vpinsrd_avx(auVar27,0xfffe000b,2);
  auVar27 = vpinsrd_avx(auVar27,0xfffe000b,3);
  auVar28 = vpinsrd_avx(ZEXT416(0xfffe000b),0xfffe000b,1);
  auVar28 = vpinsrd_avx(auVar28,0xfffe000b,2);
  auVar28 = vpinsrd_avx(auVar28,0xfffe000b,3);
  uStack_28f0 = auVar28._0_8_;
  uStack_28e8 = auVar28._8_8_;
  auVar28 = vpinsrd_avx(ZEXT416(0xffe5fff1),0xffe5fff1,1);
  auVar28 = vpinsrd_avx(auVar28,0xffe5fff1,2);
  auVar28 = vpinsrd_avx(auVar28,0xffe5fff1,3);
  auVar29 = vpinsrd_avx(ZEXT416(0xffe5fff1),0xffe5fff1,1);
  auVar29 = vpinsrd_avx(auVar29,0xffe5fff1,2);
  auVar29 = vpinsrd_avx(auVar29,0xffe5fff1,3);
  uStack_28b0 = auVar29._0_8_;
  uStack_28a8 = auVar29._8_8_;
  auVar29 = vpinsrd_avx(ZEXT416(0xffd5ffdc),0xffd5ffdc,1);
  auVar29 = vpinsrd_avx(auVar29,0xffd5ffdc,2);
  auVar29 = vpinsrd_avx(auVar29,0xffd5ffdc,3);
  auVar30 = vpinsrd_avx(ZEXT416(0xffd5ffdc),0xffd5ffdc,1);
  auVar30 = vpinsrd_avx(auVar30,0xffd5ffdc,2);
  auVar30 = vpinsrd_avx(auVar30,0xffd5ffdc,3);
  uStack_2870 = auVar30._0_8_;
  uStack_2868 = auVar30._8_8_;
  auVar30 = vpinsrd_avx(ZEXT416(0xffd4ffd3),0xffd4ffd3,1);
  auVar30 = vpinsrd_avx(auVar30,0xffd4ffd3,2);
  auVar30 = vpinsrd_avx(auVar30,0xffd4ffd3,3);
  auVar31 = vpinsrd_avx(ZEXT416(0xffd4ffd3),0xffd4ffd3,1);
  auVar31 = vpinsrd_avx(auVar31,0xffd4ffd3,2);
  auVar31 = vpinsrd_avx(auVar31,0xffd4ffd3,3);
  uStack_2830 = auVar31._0_8_;
  uStack_2828 = auVar31._8_8_;
  auVar31 = vpinsrd_avx(ZEXT416(0xffe2ffd9),0xffe2ffd9,1);
  auVar31 = vpinsrd_avx(auVar31,0xffe2ffd9,2);
  auVar31 = vpinsrd_avx(auVar31,0xffe2ffd9,3);
  auVar32 = vpinsrd_avx(ZEXT416(0xffe2ffd9),0xffe2ffd9,1);
  auVar32 = vpinsrd_avx(auVar32,0xffe2ffd9,2);
  auVar32 = vpinsrd_avx(auVar32,0xffe2ffd9,3);
  uStack_27f0 = auVar32._0_8_;
  uStack_27e8 = auVar32._8_8_;
  auVar32 = vpinsrd_avx(ZEXT416(0xfff9ffed),0xfff9ffed,1);
  auVar32 = vpinsrd_avx(auVar32,0xfff9ffed,2);
  auVar32 = vpinsrd_avx(auVar32,0xfff9ffed,3);
  auVar33 = vpinsrd_avx(ZEXT416(0xfff9ffed),0xfff9ffed,1);
  auVar33 = vpinsrd_avx(auVar33,0xfff9ffed,2);
  auVar33 = vpinsrd_avx(auVar33,0xfff9ffed,3);
  uStack_27b0 = auVar33._0_8_;
  uStack_27a8 = auVar33._8_8_;
  auVar33 = vpinsrd_avx(ZEXT416(0x22002c),0x22002c,1);
  auVar33 = vpinsrd_avx(auVar33,0x22002c,2);
  auVar33 = vpinsrd_avx(auVar33,0x22002c,3);
  auVar34 = vpinsrd_avx(ZEXT416(0x22002c),0x22002c,1);
  auVar34 = vpinsrd_avx(auVar34,0x22002c,2);
  auVar34 = vpinsrd_avx(auVar34,0x22002c,3);
  uStack_2770 = auVar34._0_8_;
  uStack_2768 = auVar34._8_8_;
  auVar34 = vpinsrd_avx(ZEXT416(0xfff9000f),0xfff9000f,1);
  auVar34 = vpinsrd_avx(auVar34,0xfff9000f,2);
  auVar34 = vpinsrd_avx(auVar34,0xfff9000f,3);
  auVar35 = vpinsrd_avx(ZEXT416(0xfff9000f),0xfff9000f,1);
  auVar35 = vpinsrd_avx(auVar35,0xfff9000f,2);
  auVar35 = vpinsrd_avx(auVar35,0xfff9000f,3);
  uStack_2730 = auVar35._0_8_;
  uStack_2728 = auVar35._8_8_;
  auVar35 = vpinsrd_avx(ZEXT416(0xffd7ffe5),0xffd7ffe5,1);
  auVar35 = vpinsrd_avx(auVar35,0xffd7ffe5,2);
  auVar35 = vpinsrd_avx(auVar35,0xffd7ffe5,3);
  auVar36 = vpinsrd_avx(ZEXT416(0xffd7ffe5),0xffd7ffe5,1);
  auVar36 = vpinsrd_avx(auVar36,0xffd7ffe5,2);
  auVar36 = vpinsrd_avx(auVar36,0xffd7ffe5,3);
  uStack_26f0 = auVar36._0_8_;
  uStack_26e8 = auVar36._8_8_;
  auVar36 = vpinsrd_avx(ZEXT416(0xffd9ffd3),0xffd9ffd3,1);
  auVar36 = vpinsrd_avx(auVar36,0xffd9ffd3,2);
  auVar36 = vpinsrd_avx(auVar36,0xffd9ffd3,3);
  auVar37 = vpinsrd_avx(ZEXT416(0xffd9ffd3),0xffd9ffd3,1);
  auVar37 = vpinsrd_avx(auVar37,0xffd9ffd3,2);
  auVar37 = vpinsrd_avx(auVar37,0xffd9ffd3,3);
  uStack_26b0 = auVar37._0_8_;
  uStack_26a8 = auVar37._8_8_;
  auVar37 = vpinsrd_avx(ZEXT416(0xfffeffe9),0xfffeffe9,1);
  auVar37 = vpinsrd_avx(auVar37,0xfffeffe9,2);
  auVar37 = vpinsrd_avx(auVar37,0xfffeffe9,3);
  auVar38 = vpinsrd_avx(ZEXT416(0xfffeffe9),0xfffeffe9,1);
  auVar38 = vpinsrd_avx(auVar38,0xfffeffe9,2);
  auVar38 = vpinsrd_avx(auVar38,0xfffeffe9,3);
  uStack_2670 = auVar38._0_8_;
  uStack_2668 = auVar38._8_8_;
  auVar38 = vpinsrd_avx(ZEXT416(0x240013),0x240013,1);
  auVar38 = vpinsrd_avx(auVar38,0x240013,2);
  auVar38 = vpinsrd_avx(auVar38,0x240013,3);
  auVar39 = vpinsrd_avx(ZEXT416(0x240013),0x240013,1);
  auVar39 = vpinsrd_avx(auVar39,0x240013,2);
  auVar39 = vpinsrd_avx(auVar39,0x240013,3);
  uStack_2630 = auVar39._0_8_;
  uStack_2628 = auVar39._8_8_;
  auVar39 = vpinsrd_avx(ZEXT416(0x2b002d),0x2b002d,1);
  auVar39 = vpinsrd_avx(auVar39,0x2b002d,2);
  auVar39 = vpinsrd_avx(auVar39,0x2b002d,3);
  auVar40 = vpinsrd_avx(ZEXT416(0x2b002d),0x2b002d,1);
  auVar40 = vpinsrd_avx(auVar40,0x2b002d,2);
  auVar40 = vpinsrd_avx(auVar40,0x2b002d,3);
  uStack_25f0 = auVar40._0_8_;
  uStack_25e8 = auVar40._8_8_;
  auVar40 = vpinsrd_avx(ZEXT416(0xb001e),0xb001e,1);
  auVar40 = vpinsrd_avx(auVar40,0xb001e,2);
  auVar40 = vpinsrd_avx(auVar40,0xb001e,3);
  auVar41 = vpinsrd_avx(ZEXT416(0xb001e),0xb001e,1);
  auVar41 = vpinsrd_avx(auVar41,0xb001e,2);
  auVar41 = vpinsrd_avx(auVar41,0xb001e,3);
  uStack_25b0 = auVar41._0_8_;
  uStack_25a8 = auVar41._8_8_;
  auVar41 = vpinsrd_avx(ZEXT416(0x17002b),0x17002b,1);
  auVar41 = vpinsrd_avx(auVar41,0x17002b,2);
  auVar41 = vpinsrd_avx(auVar41,0x17002b,3);
  auVar42 = vpinsrd_avx(ZEXT416(0x17002b),0x17002b,1);
  auVar42 = vpinsrd_avx(auVar42,0x17002b,2);
  auVar42 = vpinsrd_avx(auVar42,0x17002b,3);
  uStack_2570 = auVar42._0_8_;
  uStack_2568 = auVar42._8_8_;
  auVar42 = vpinsrd_avx(ZEXT416(0xffdefff9),0xffdefff9,1);
  auVar42 = vpinsrd_avx(auVar42,0xffdefff9,2);
  auVar42 = vpinsrd_avx(auVar42,0xffdefff9,3);
  auVar43 = vpinsrd_avx(ZEXT416(0xffdefff9),0xffdefff9,1);
  auVar43 = vpinsrd_avx(auVar43,0xffdefff9,2);
  auVar43 = vpinsrd_avx(auVar43,0xffdefff9,3);
  uStack_2530 = auVar43._0_8_;
  uStack_2528 = auVar43._8_8_;
  auVar43 = vpinsrd_avx(ZEXT416(0xffdcffd3),0xffdcffd3,1);
  auVar43 = vpinsrd_avx(auVar43,0xffdcffd3,2);
  auVar43 = vpinsrd_avx(auVar43,0xffdcffd3,3);
  auVar44 = vpinsrd_avx(ZEXT416(0xffdcffd3),0xffdcffd3,1);
  auVar44 = vpinsrd_avx(auVar44,0xffdcffd3,2);
  auVar44 = vpinsrd_avx(auVar44,0xffdcffd3,3);
  uStack_24f0 = auVar44._0_8_;
  uStack_24e8 = auVar44._8_8_;
  auVar44 = vpinsrd_avx(ZEXT416(0x13fff5),0x13fff5,1);
  auVar44 = vpinsrd_avx(auVar44,0x13fff5,2);
  auVar44 = vpinsrd_avx(auVar44,0x13fff5,3);
  auVar45 = vpinsrd_avx(ZEXT416(0x13fff5),0x13fff5,1);
  auVar45 = vpinsrd_avx(auVar45,0x13fff5,2);
  auVar45 = vpinsrd_avx(auVar45,0x13fff5,3);
  uStack_24b0 = auVar45._0_8_;
  uStack_24a8 = auVar45._8_8_;
  auVar45 = vpinsrd_avx(ZEXT416(0x2c0029),0x2c0029,1);
  auVar45 = vpinsrd_avx(auVar45,0x2c0029,2);
  auVar45 = vpinsrd_avx(auVar45,0x2c0029,3);
  auVar46 = vpinsrd_avx(ZEXT416(0x2c0029),0x2c0029,1);
  auVar46 = vpinsrd_avx(auVar46,0x2c0029,2);
  auVar46 = vpinsrd_avx(auVar46,0x2c0029,3);
  uStack_2470 = auVar46._0_8_;
  uStack_2468 = auVar46._8_8_;
  auVar46 = vpinsrd_avx(ZEXT416(0xfffe001b),0xfffe001b,1);
  auVar46 = vpinsrd_avx(auVar46,0xfffe001b,2);
  auVar46 = vpinsrd_avx(auVar46,0xfffe001b,3);
  auVar47 = vpinsrd_avx(ZEXT416(0xfffe001b),0xfffe001b,1);
  auVar47 = vpinsrd_avx(auVar47,0xfffe001b,2);
  auVar47 = vpinsrd_avx(auVar47,0xfffe001b,3);
  uStack_2430 = auVar47._0_8_;
  uStack_2428 = auVar47._8_8_;
  auVar47 = vpinsrd_avx(ZEXT416(0xffd3ffe2),0xffd3ffe2,1);
  auVar47 = vpinsrd_avx(auVar47,0xffd3ffe2,2);
  auVar47 = vpinsrd_avx(auVar47,0xffd3ffe2,3);
  auVar48 = vpinsrd_avx(ZEXT416(0xffd3ffe2),0xffd3ffe2,1);
  auVar48 = vpinsrd_avx(auVar48,0xffd3ffe2,2);
  auVar48 = vpinsrd_avx(auVar48,0xffd3ffe2,3);
  uStack_23f0 = auVar48._0_8_;
  uStack_23e8 = auVar48._8_8_;
  auVar48 = vpinsrd_avx(ZEXT416(0xfff1ffd9),0xfff1ffd9,1);
  auVar48 = vpinsrd_avx(auVar48,0xfff1ffd9,2);
  auVar48 = vpinsrd_avx(auVar48,0xfff1ffd9,3);
  auVar49 = vpinsrd_avx(ZEXT416(0xfff1ffd9),0xfff1ffd9,1);
  auVar49 = vpinsrd_avx(auVar49,0xfff1ffd9,2);
  auVar49 = vpinsrd_avx(auVar49,0xfff1ffd9,3);
  uStack_23b0 = auVar49._0_8_;
  uStack_23a8 = auVar49._8_8_;
  auVar49 = vpinsrd_avx(ZEXT416(0xb0029),0xb0029,1);
  auVar49 = vpinsrd_avx(auVar49,0xb0029,2);
  auVar49 = vpinsrd_avx(auVar49,0xb0029,3);
  auVar50 = vpinsrd_avx(ZEXT416(0xb0029),0xb0029,1);
  auVar50 = vpinsrd_avx(auVar50,0xb0029,2);
  auVar50 = vpinsrd_avx(auVar50,0xb0029,3);
  uStack_2370 = auVar50._0_8_;
  uStack_2368 = auVar50._8_8_;
  auVar50 = vpinsrd_avx(ZEXT416(0xffd3ffe5),0xffd3ffe5,1);
  auVar50 = vpinsrd_avx(auVar50,0xffd3ffe5,2);
  auVar50 = vpinsrd_avx(auVar50,0xffd3ffe5,3);
  auVar51 = vpinsrd_avx(ZEXT416(0xffd3ffe5),0xffd3ffe5,1);
  auVar51 = vpinsrd_avx(auVar51,0xffd3ffe5,2);
  auVar51 = vpinsrd_avx(auVar51,0xffd3ffe5,3);
  uStack_2330 = auVar51._0_8_;
  uStack_2328 = auVar51._8_8_;
  auVar51 = vpinsrd_avx(ZEXT416(0x7ffe2),0x7ffe2,1);
  auVar51 = vpinsrd_avx(auVar51,0x7ffe2,2);
  auVar51 = vpinsrd_avx(auVar51,0x7ffe2,3);
  auVar52 = vpinsrd_avx(ZEXT416(0x7ffe2),0x7ffe2,1);
  auVar52 = vpinsrd_avx(auVar52,0x7ffe2,2);
  auVar52 = vpinsrd_avx(auVar52,0x7ffe2,3);
  uStack_22f0 = auVar52._0_8_;
  uStack_22e8 = auVar52._8_8_;
  auVar52 = vpinsrd_avx(ZEXT416(0x2b0027),0x2b0027,1);
  auVar52 = vpinsrd_avx(auVar52,0x2b0027,2);
  auVar52 = vpinsrd_avx(auVar52,0x2b0027,3);
  auVar53 = vpinsrd_avx(ZEXT416(0x2b0027),0x2b0027,1);
  auVar53 = vpinsrd_avx(auVar53,0x2b0027,2);
  auVar53 = vpinsrd_avx(auVar53,0x2b0027,3);
  uStack_22b0 = auVar53._0_8_;
  uStack_22a8 = auVar53._8_8_;
  auVar53 = vpinsrd_avx(ZEXT416(0xffe9000f),0xffe9000f,1);
  auVar53 = vpinsrd_avx(auVar53,0xffe9000f,2);
  auVar53 = vpinsrd_avx(auVar53,0xffe9000f,3);
  auVar54 = vpinsrd_avx(ZEXT416(0xffe9000f),0xffe9000f,1);
  auVar54 = vpinsrd_avx(auVar54,0xffe9000f,2);
  auVar54 = vpinsrd_avx(auVar54,0xffe9000f,3);
  uStack_2270 = auVar54._0_8_;
  uStack_2268 = auVar54._8_8_;
  auVar54 = vpinsrd_avx(ZEXT416(0xffdeffd3),0xffdeffd3,1);
  auVar54 = vpinsrd_avx(auVar54,0xffdeffd3,2);
  auVar54 = vpinsrd_avx(auVar54,0xffdeffd3,3);
  auVar55 = vpinsrd_avx(ZEXT416(0xffdeffd3),0xffdeffd3,1);
  auVar55 = vpinsrd_avx(auVar55,0xffdeffd3,2);
  auVar55 = vpinsrd_avx(auVar55,0xffdeffd3,3);
  uStack_2230 = auVar55._0_8_;
  uStack_2228 = auVar55._8_8_;
  auVar55 = vpinsrd_avx(ZEXT416(0x240002),0x240002,1);
  auVar55 = vpinsrd_avx(auVar55,0x240002,2);
  auVar55 = vpinsrd_avx(auVar55,0x240002,3);
  auVar56 = vpinsrd_avx(ZEXT416(0x240002),0x240002,1);
  auVar56 = vpinsrd_avx(auVar56,0x240002,2);
  auVar56 = vpinsrd_avx(auVar56,0x240002,3);
  uStack_21f0 = auVar56._0_8_;
  uStack_21e8 = auVar56._8_8_;
  auVar56 = vpinsrd_avx(ZEXT416(0x13002c),0x13002c,1);
  auVar56 = vpinsrd_avx(auVar56,0x13002c,2);
  auVar56 = vpinsrd_avx(auVar56,0x13002c,3);
  auVar57 = vpinsrd_avx(ZEXT416(0x13002c),0x13002c,1);
  auVar57 = vpinsrd_avx(auVar57,0x13002c,2);
  auVar57 = vpinsrd_avx(auVar57,0x13002c,3);
  uStack_21b0 = auVar57._0_8_;
  uStack_21a8 = auVar57._8_8_;
  auVar57 = vpinsrd_avx(ZEXT416(0xfffe0027),0xfffe0027,1);
  auVar57 = vpinsrd_avx(auVar57,0xfffe0027,2);
  auVar57 = vpinsrd_avx(auVar57,0xfffe0027,3);
  auVar58 = vpinsrd_avx(ZEXT416(0xfffe0027),0xfffe0027,1);
  auVar58 = vpinsrd_avx(auVar58,0xfffe0027,2);
  auVar58 = vpinsrd_avx(auVar58,0xfffe0027,3);
  uStack_2170 = auVar58._0_8_;
  uStack_2168 = auVar58._8_8_;
  auVar58 = vpinsrd_avx(ZEXT416(0xffdcffd7),0xffdcffd7,1);
  auVar58 = vpinsrd_avx(auVar58,0xffdcffd7,2);
  auVar58 = vpinsrd_avx(auVar58,0xffdcffd7,3);
  auVar59 = vpinsrd_avx(ZEXT416(0xffdcffd7),0xffdcffd7,1);
  auVar59 = vpinsrd_avx(auVar59,0xffdcffd7,2);
  auVar59 = vpinsrd_avx(auVar59,0xffdcffd7,3);
  uStack_2130 = auVar59._0_8_;
  uStack_2128 = auVar59._8_8_;
  auVar59 = vpinsrd_avx(ZEXT416(0x2b0007),0x2b0007,1);
  auVar59 = vpinsrd_avx(auVar59,0x2b0007,2);
  auVar59 = vpinsrd_avx(auVar59,0x2b0007,3);
  auVar60 = vpinsrd_avx(ZEXT416(0x2b0007),0x2b0007,1);
  auVar60 = vpinsrd_avx(auVar60,0x2b0007,2);
  auVar60 = vpinsrd_avx(auVar60,0x2b0007,3);
  uStack_20f0 = auVar60._0_8_;
  uStack_20e8 = auVar60._8_8_;
  auVar60 = vpinsrd_avx(ZEXT416(0xfff50022),0xfff50022,1);
  auVar60 = vpinsrd_avx(auVar60,0xfff50022,2);
  auVar60 = vpinsrd_avx(auVar60,0xfff50022,3);
  auVar61 = vpinsrd_avx(ZEXT416(0xfff50022),0xfff50022,1);
  auVar61 = vpinsrd_avx(auVar61,0xfff50022,2);
  auVar61 = vpinsrd_avx(auVar61,0xfff50022,3);
  uStack_20b0 = auVar61._0_8_;
  uStack_20a8 = auVar61._8_8_;
  auVar61 = vpinsrd_avx(ZEXT416(0xffe2ffd4),0xffe2ffd4,1);
  auVar61 = vpinsrd_avx(auVar61,0xffe2ffd4,2);
  auVar61 = vpinsrd_avx(auVar61,0xffe2ffd4,3);
  auVar62 = vpinsrd_avx(ZEXT416(0xffe2ffd4),0xffe2ffd4,1);
  auVar62 = vpinsrd_avx(auVar62,0xffe2ffd4,2);
  auVar62 = vpinsrd_avx(auVar62,0xffe2ffd4,3);
  uStack_2070 = auVar62._0_8_;
  uStack_2068 = auVar62._8_8_;
  auVar62 = vpinsrd_avx(ZEXT416(0x2d000f),0x2d000f,1);
  auVar62 = vpinsrd_avx(auVar62,0x2d000f,2);
  auVar62 = vpinsrd_avx(auVar62,0x2d000f,3);
  auVar63 = vpinsrd_avx(ZEXT416(0x2d000f),0x2d000f,1);
  auVar63 = vpinsrd_avx(auVar63,0x2d000f,2);
  auVar63 = vpinsrd_avx(auVar63,0x2d000f,3);
  uStack_2030 = auVar63._0_8_;
  uStack_2028 = auVar63._8_8_;
  auVar63 = vpinsrd_avx(ZEXT416(0xffed001b),0xffed001b,1);
  auVar63 = vpinsrd_avx(auVar63,0xffed001b,2);
  auVar63 = vpinsrd_avx(auVar63,0xffed001b,3);
  auVar64 = vpinsrd_avx(ZEXT416(0xffed001b),0xffed001b,1);
  auVar64 = vpinsrd_avx(auVar64,0xffed001b,2);
  auVar64 = vpinsrd_avx(auVar64,0xffed001b,3);
  uStack_1ff0 = auVar64._0_8_;
  uStack_1fe8 = auVar64._8_8_;
  auVar64 = vpinsrd_avx(ZEXT416(0xffe9ffd3),0xffe9ffd3,1);
  auVar64 = vpinsrd_avx(auVar64,0xffe9ffd3,2);
  auVar64 = vpinsrd_avx(auVar64,0xffe9ffd3,3);
  auVar65 = vpinsrd_avx(ZEXT416(0xffe9ffd3),0xffe9ffd3,1);
  auVar65 = vpinsrd_avx(auVar65,0xffe9ffd3,2);
  auVar65 = vpinsrd_avx(auVar65,0xffe9ffd3,3);
  uStack_1fb0 = auVar65._0_8_;
  uStack_1fa8 = auVar65._8_8_;
  auVar65 = vpinsrd_avx(ZEXT416(0xfff10024),0xfff10024,1);
  auVar65 = vpinsrd_avx(auVar65,0xfff10024,2);
  auVar65 = vpinsrd_avx(auVar65,0xfff10024,3);
  auVar66 = vpinsrd_avx(ZEXT416(0xfff10024),0xfff10024,1);
  auVar66 = vpinsrd_avx(auVar66,0xfff10024,2);
  auVar66 = vpinsrd_avx(auVar66,0xfff10024,3);
  uStack_1f70 = auVar66._0_8_;
  uStack_1f68 = auVar66._8_8_;
  auVar66 = vpinsrd_avx(ZEXT416(0xfff5ffd3),0xfff5ffd3,1);
  auVar66 = vpinsrd_avx(auVar66,0xfff5ffd3,2);
  auVar66 = vpinsrd_avx(auVar66,0xfff5ffd3,3);
  auVar67 = vpinsrd_avx(ZEXT416(0xfff5ffd3),0xfff5ffd3,1);
  auVar67 = vpinsrd_avx(auVar67,0xfff5ffd3,2);
  auVar67 = vpinsrd_avx(auVar67,0xfff5ffd3,3);
  uStack_1f30 = auVar67._0_8_;
  uStack_1f28 = auVar67._8_8_;
  auVar67 = vpinsrd_avx(ZEXT416(0x220027),0x220027,1);
  auVar67 = vpinsrd_avx(auVar67,0x220027,2);
  auVar67 = vpinsrd_avx(auVar67,0x220027,3);
  auVar68 = vpinsrd_avx(ZEXT416(0x220027),0x220027,1);
  auVar68 = vpinsrd_avx(auVar68,0x220027,2);
  auVar68 = vpinsrd_avx(auVar68,0x220027,3);
  uStack_1ef0 = auVar68._0_8_;
  uStack_1ee8 = auVar68._8_8_;
  auVar68 = vpinsrd_avx(ZEXT416(0xffd3ffed),0xffd3ffed,1);
  auVar68 = vpinsrd_avx(auVar68,0xffd3ffed,2);
  auVar68 = vpinsrd_avx(auVar68,0xffd3ffed,3);
  auVar69 = vpinsrd_avx(ZEXT416(0xffd3ffed),0xffd3ffed,1);
  auVar69 = vpinsrd_avx(auVar69,0xffd3ffed,2);
  auVar69 = vpinsrd_avx(auVar69,0xffd3ffed,3);
  uStack_1eb0 = auVar69._0_8_;
  uStack_1ea8 = auVar69._8_8_;
  auVar69 = vpinsrd_avx(ZEXT416(0x29fff9),0x29fff9,1);
  auVar69 = vpinsrd_avx(auVar69,0x29fff9,2);
  auVar69 = vpinsrd_avx(auVar69,0x29fff9,3);
  auVar70 = vpinsrd_avx(ZEXT416(0x29fff9),0x29fff9,1);
  auVar70 = vpinsrd_avx(auVar70,0x29fff9,2);
  auVar70 = vpinsrd_avx(auVar70,0x29fff9,3);
  uStack_1e70 = auVar70._0_8_;
  uStack_1e68 = auVar70._8_8_;
  auVar70 = vpinsrd_avx(ZEXT416(0xffe9001e),0xffe9001e,1);
  auVar70 = vpinsrd_avx(auVar70,0xffe9001e,2);
  auVar70 = vpinsrd_avx(auVar70,0xffe9001e,3);
  auVar71 = vpinsrd_avx(ZEXT416(0xffe9001e),0xffe9001e,1);
  auVar71 = vpinsrd_avx(auVar71,0xffe9001e,2);
  auVar71 = vpinsrd_avx(auVar71,0xffe9001e,3);
  uStack_1e30 = auVar71._0_8_;
  uStack_1e28 = auVar71._8_8_;
  auVar71 = vpinsrd_avx(ZEXT416(0xfffeffd4),0xfffeffd4,1);
  auVar71 = vpinsrd_avx(auVar71,0xfffeffd4,2);
  auVar71 = vpinsrd_avx(auVar71,0xfffeffd4,3);
  auVar72 = vpinsrd_avx(ZEXT416(0xfffeffd4),0xfffeffd4,1);
  auVar72 = vpinsrd_avx(auVar72,0xfffeffd4,2);
  auVar72 = vpinsrd_avx(auVar72,0xfffeffd4,3);
  uStack_1df0 = auVar72._0_8_;
  uStack_1de8 = auVar72._8_8_;
  auVar72 = vpinsrd_avx(ZEXT416(0x1b002b),0x1b002b,1);
  auVar72 = vpinsrd_avx(auVar72,0x1b002b,2);
  auVar72 = vpinsrd_avx(auVar72,0x1b002b,3);
  auVar73 = vpinsrd_avx(ZEXT416(0x1b002b),0x1b002b,1);
  auVar73 = vpinsrd_avx(auVar73,0x1b002b,2);
  auVar73 = vpinsrd_avx(auVar73,0x1b002b,3);
  uStack_1db0 = auVar73._0_8_;
  uStack_1da8 = auVar73._8_8_;
  auVar73 = vpinsrd_avx(ZEXT416(0xffe50022),0xffe50022,1);
  auVar73 = vpinsrd_avx(auVar73,0xffe50022,2);
  auVar73 = vpinsrd_avx(auVar73,0xffe50022,3);
  auVar74 = vpinsrd_avx(ZEXT416(0xffe50022),0xffe50022,1);
  auVar74 = vpinsrd_avx(auVar74,0xffe50022,2);
  auVar74 = vpinsrd_avx(auVar74,0xffe50022,3);
  uStack_1d70 = auVar74._0_8_;
  uStack_1d68 = auVar74._8_8_;
  auVar74 = vpinsrd_avx(ZEXT416(0x13ffd9),0x13ffd9,1);
  auVar74 = vpinsrd_avx(auVar74,0x13ffd9,2);
  auVar74 = vpinsrd_avx(auVar74,0x13ffd9,3);
  auVar75 = vpinsrd_avx(ZEXT416(0x13ffd9),0x13ffd9,1);
  auVar75 = vpinsrd_avx(auVar75,0x13ffd9,2);
  auVar75 = vpinsrd_avx(auVar75,0x13ffd9,3);
  uStack_1d30 = auVar75._0_8_;
  uStack_1d28 = auVar75._8_8_;
  auVar75 = vpinsrd_avx(ZEXT416(0xfff5002b),0xfff5002b,1);
  auVar75 = vpinsrd_avx(auVar75,0xfff5002b,2);
  auVar75 = vpinsrd_avx(auVar75,0xfff5002b,3);
  auVar76 = vpinsrd_avx(ZEXT416(0xfff5002b),0xfff5002b,1);
  auVar76 = vpinsrd_avx(auVar76,0xfff5002b,2);
  auVar76 = vpinsrd_avx(auVar76,0xfff5002b,3);
  uStack_1cf0 = auVar76._0_8_;
  uStack_1ce8 = auVar76._8_8_;
  auVar76 = vpinsrd_avx(ZEXT416(0x2ffd3),0x2ffd3,1);
  auVar76 = vpinsrd_avx(auVar76,0x2ffd3,2);
  auVar76 = vpinsrd_avx(auVar76,0x2ffd3,3);
  auVar77 = vpinsrd_avx(ZEXT416(0x2ffd3),0x2ffd3,1);
  auVar77 = vpinsrd_avx(auVar77,0x2ffd3,2);
  auVar77 = vpinsrd_avx(auVar77,0x2ffd3,3);
  uStack_1cb0 = auVar77._0_8_;
  uStack_1ca8 = auVar77._8_8_;
  auVar77 = vpinsrd_avx(ZEXT416(0x7002d),0x7002d,1);
  auVar77 = vpinsrd_avx(auVar77,0x7002d,2);
  auVar77 = vpinsrd_avx(auVar77,0x7002d,3);
  auVar78 = vpinsrd_avx(ZEXT416(0x7002d),0x7002d,1);
  auVar78 = vpinsrd_avx(auVar78,0x7002d,2);
  auVar78 = vpinsrd_avx(auVar78,0x7002d,3);
  uStack_1c70 = auVar78._0_8_;
  uStack_1c68 = auVar78._8_8_;
  auVar78 = vpinsrd_avx(ZEXT416(0xfff1ffd4),0xfff1ffd4,1);
  auVar78 = vpinsrd_avx(auVar78,0xfff1ffd4,2);
  auVar78 = vpinsrd_avx(auVar78,0xfff1ffd4,3);
  auVar79 = vpinsrd_avx(ZEXT416(0xfff1ffd4),0xfff1ffd4,1);
  auVar79 = vpinsrd_avx(auVar79,0xfff1ffd4,2);
  auVar79 = vpinsrd_avx(auVar79,0xfff1ffd4,3);
  uStack_1c30 = auVar79._0_8_;
  uStack_1c28 = auVar79._8_8_;
  auVar79 = vpinsrd_avx(ZEXT416(0x170029),0x170029,1);
  auVar79 = vpinsrd_avx(auVar79,0x170029,2);
  auVar79 = vpinsrd_avx(auVar79,0x170029,3);
  auVar80 = vpinsrd_avx(ZEXT416(0x170029),0x170029,1);
  auVar80 = vpinsrd_avx(auVar80,0x170029,2);
  auVar80 = vpinsrd_avx(auVar80,0x170029,3);
  uStack_1bf0 = auVar80._0_8_;
  uStack_1be8 = auVar80._8_8_;
  auVar80 = vpinsrd_avx(ZEXT416(0xffe2ffdc),0xffe2ffdc,1);
  auVar80 = vpinsrd_avx(auVar80,0xffe2ffdc,2);
  auVar80 = vpinsrd_avx(auVar80,0xffe2ffdc,3);
  auVar81 = vpinsrd_avx(ZEXT416(0xffe2ffdc),0xffe2ffdc,1);
  auVar81 = vpinsrd_avx(auVar81,0xffe2ffdc,2);
  auVar81 = vpinsrd_avx(auVar81,0xffe2ffdc,3);
  uStack_1bb0 = auVar81._0_8_;
  uStack_1ba8 = auVar81._8_8_;
  auVar81 = vpinsrd_avx(ZEXT416(0xffdc001e),0xffdc001e,1);
  auVar81 = vpinsrd_avx(auVar81,0xffdc001e,2);
  auVar81 = vpinsrd_avx(auVar81,0xffdc001e,3);
  auVar82 = vpinsrd_avx(ZEXT416(0xffdc001e),0xffdc001e,1);
  auVar82 = vpinsrd_avx(auVar82,0xffdc001e,2);
  auVar82 = vpinsrd_avx(auVar82,0xffdc001e,3);
  uStack_1b70 = auVar82._0_8_;
  uStack_1b68 = auVar82._8_8_;
  auVar82 = vpinsrd_avx(ZEXT416(0x29ffe9),0x29ffe9,1);
  auVar82 = vpinsrd_avx(auVar82,0x29ffe9,2);
  auVar82 = vpinsrd_avx(auVar82,0x29ffe9,3);
  auVar83 = vpinsrd_avx(ZEXT416(0x29ffe9),0x29ffe9,1);
  auVar83 = vpinsrd_avx(auVar83,0x29ffe9,2);
  auVar83 = vpinsrd_avx(auVar83,0x29ffe9,3);
  uStack_1b30 = auVar83._0_8_;
  uStack_1b28 = auVar83._8_8_;
  auVar83 = vpinsrd_avx(ZEXT416(0xffd4000f),0xffd4000f,1);
  auVar83 = vpinsrd_avx(auVar83,0xffd4000f,2);
  auVar83 = vpinsrd_avx(auVar83,0xffd4000f,3);
  auVar84 = vpinsrd_avx(ZEXT416(0xffd4000f),0xffd4000f,1);
  auVar84 = vpinsrd_avx(auVar84,0xffd4000f,2);
  auVar84 = vpinsrd_avx(auVar84,0xffd4000f,3);
  uStack_1af0 = auVar84._0_8_;
  uStack_1ae8 = auVar84._8_8_;
  auVar84 = vpinsrd_avx(ZEXT416(0x2dfff9),0x2dfff9,1);
  auVar84 = vpinsrd_avx(auVar84,0x2dfff9,2);
  auVar84 = vpinsrd_avx(auVar84,0x2dfff9,3);
  auVar85 = vpinsrd_avx(ZEXT416(0x2dfff9),0x2dfff9,1);
  auVar85 = vpinsrd_avx(auVar85,0x2dfff9,2);
  auVar85 = vpinsrd_avx(auVar85,0x2dfff9,3);
  uStack_1ab0 = auVar85._0_8_;
  uStack_1aa8 = auVar85._8_8_;
  auVar85 = vpinsrd_avx(ZEXT416(0xffd3fffe),0xffd3fffe,1);
  auVar85 = vpinsrd_avx(auVar85,0xffd3fffe,2);
  auVar85 = vpinsrd_avx(auVar85,0xffd3fffe,3);
  auVar86 = vpinsrd_avx(ZEXT416(0xffd3fffe),0xffd3fffe,1);
  auVar86 = vpinsrd_avx(auVar86,0xffd3fffe,2);
  auVar86 = vpinsrd_avx(auVar86,0xffd3fffe,3);
  uStack_1a70 = auVar86._0_8_;
  uStack_1a68 = auVar86._8_8_;
  auVar86 = vpinsrd_avx(ZEXT416(0x2b000b),0x2b000b,1);
  auVar86 = vpinsrd_avx(auVar86,0x2b000b,2);
  auVar86 = vpinsrd_avx(auVar86,0x2b000b,3);
  auVar87 = vpinsrd_avx(ZEXT416(0x2b000b),0x2b000b,1);
  auVar87 = vpinsrd_avx(auVar87,0x2b000b,2);
  auVar87 = vpinsrd_avx(auVar87,0x2b000b,3);
  uStack_1a30 = auVar87._0_8_;
  uStack_1a28 = auVar87._8_8_;
  auVar87 = vpinsrd_avx(ZEXT416(0xffd9ffed),0xffd9ffed,1);
  auVar87 = vpinsrd_avx(auVar87,0xffd9ffed,2);
  auVar87 = vpinsrd_avx(auVar87,0xffd9ffed,3);
  auVar88 = vpinsrd_avx(ZEXT416(0xffd9ffed),0xffd9ffed,1);
  auVar88 = vpinsrd_avx(auVar88,0xffd9ffed,2);
  auVar88 = vpinsrd_avx(auVar88,0xffd9ffed,3);
  uStack_19f0 = auVar88._0_8_;
  uStack_19e8 = auVar88._8_8_;
  auVar88 = vpinsrd_avx(ZEXT416(0x22001b),0x22001b,1);
  auVar88 = vpinsrd_avx(auVar88,0x22001b,2);
  auVar88 = vpinsrd_avx(auVar88,0x22001b,3);
  auVar89 = vpinsrd_avx(ZEXT416(0x22001b),0x22001b,1);
  auVar89 = vpinsrd_avx(auVar89,0x22001b,2);
  auVar89 = vpinsrd_avx(auVar89,0x22001b,3);
  uStack_19b0 = auVar89._0_8_;
  uStack_19a8 = auVar89._8_8_;
  auVar89 = vpinsrd_avx(ZEXT416(0xffd5001b),0xffd5001b,1);
  auVar89 = vpinsrd_avx(auVar89,0xffd5001b,2);
  auVar89 = vpinsrd_avx(auVar89,0xffd5001b,3);
  auVar90 = vpinsrd_avx(ZEXT416(0xffd5001b),0xffd5001b,1);
  auVar90 = vpinsrd_avx(auVar90,0xffd5001b,2);
  auVar90 = vpinsrd_avx(auVar90,0xffd5001b,3);
  uStack_1970 = auVar90._0_8_;
  uStack_1968 = auVar90._8_8_;
  auVar90 = vpinsrd_avx(ZEXT416(0x2cfffe),0x2cfffe,1);
  auVar90 = vpinsrd_avx(auVar90,0x2cfffe,2);
  auVar90 = vpinsrd_avx(auVar90,0x2cfffe,3);
  auVar91 = vpinsrd_avx(ZEXT416(0x2cfffe),0x2cfffe,1);
  auVar91 = vpinsrd_avx(auVar91,0x2cfffe,2);
  auVar91 = vpinsrd_avx(auVar91,0x2cfffe,3);
  uStack_1930 = auVar91._0_8_;
  uStack_1928 = auVar91._8_8_;
  auVar91 = vpinsrd_avx(ZEXT416(0xffe2ffe9),0xffe2ffe9,1);
  auVar91 = vpinsrd_avx(auVar91,0xffe2ffe9,2);
  auVar91 = vpinsrd_avx(auVar91,0xffe2ffe9,3);
  auVar92 = vpinsrd_avx(ZEXT416(0xffe2ffe9),0xffe2ffe9,1);
  auVar92 = vpinsrd_avx(auVar92,0xffe2ffe9,2);
  auVar92 = vpinsrd_avx(auVar92,0xffe2ffe9,3);
  uStack_18f0 = auVar92._0_8_;
  uStack_18e8 = auVar92._8_8_;
  auVar92 = vpinsrd_avx(ZEXT416(0x70029),0x70029,1);
  auVar92 = vpinsrd_avx(auVar92,0x70029,2);
  auVar92 = vpinsrd_avx(auVar92,0x70029,3);
  auVar93 = vpinsrd_avx(ZEXT416(0x70029),0x70029,1);
  auVar93 = vpinsrd_avx(auVar93,0x70029,2);
  auVar93 = vpinsrd_avx(auVar93,0x70029,3);
  uStack_18b0 = auVar93._0_8_;
  uStack_18a8 = auVar93._8_8_;
  auVar93 = vpinsrd_avx(ZEXT416(0x13ffd3),0x13ffd3,1);
  auVar93 = vpinsrd_avx(auVar93,0x13ffd3,2);
  auVar93 = vpinsrd_avx(auVar93,0x13ffd3,3);
  auVar94 = vpinsrd_avx(ZEXT416(0x13ffd3),0x13ffd3,1);
  auVar94 = vpinsrd_avx(auVar94,0x13ffd3,2);
  auVar94 = vpinsrd_avx(auVar94,0x13ffd3,3);
  uStack_1870 = auVar94._0_8_;
  uStack_1868 = auVar94._8_8_;
  auVar94 = vpinsrd_avx(ZEXT416(0xffd90022),0xffd90022,1);
  auVar94 = vpinsrd_avx(auVar94,0xffd90022,2);
  auVar94 = vpinsrd_avx(auVar94,0xffd90022,3);
  auVar95 = vpinsrd_avx(ZEXT416(0xffd90022),0xffd90022,1);
  auVar95 = vpinsrd_avx(auVar95,0xffd90022,2);
  auVar95 = vpinsrd_avx(auVar95,0xffd90022,3);
  uStack_1830 = auVar95._0_8_;
  uStack_1828 = auVar95._8_8_;
  auVar95 = vpinsrd_avx(ZEXT416(0x2dfff5),0x2dfff5,1);
  auVar95 = vpinsrd_avx(auVar95,0x2dfff5,2);
  auVar95 = vpinsrd_avx(auVar95,0x2dfff5,3);
  auVar96 = vpinsrd_avx(ZEXT416(0x2dfff5),0x2dfff5,1);
  auVar96 = vpinsrd_avx(auVar96,0x2dfff5,2);
  auVar96 = vpinsrd_avx(auVar96,0x2dfff5,3);
  uStack_17f0 = auVar96._0_8_;
  uStack_17e8 = auVar96._8_8_;
  auVar96 = vpinsrd_avx(ZEXT416(0xffdcfff1),0xffdcfff1,1);
  auVar96 = vpinsrd_avx(auVar96,0xffdcfff1,2);
  auVar96 = vpinsrd_avx(auVar96,0xffdcfff1,3);
  auVar97 = vpinsrd_avx(ZEXT416(0xffdcfff1),0xffdcfff1,1);
  auVar97 = vpinsrd_avx(auVar97,0xffdcfff1,2);
  auVar97 = vpinsrd_avx(auVar97,0xffdcfff1,3);
  uStack_17b0 = auVar97._0_8_;
  uStack_17a8 = auVar97._8_8_;
  auVar97 = vpinsrd_avx(ZEXT416(0xffd30017),0xffd30017,1);
  auVar97 = vpinsrd_avx(auVar97,0xffd30017,2);
  auVar97 = vpinsrd_avx(auVar97,0xffd30017,3);
  auVar98 = vpinsrd_avx(ZEXT416(0xffd30017),0xffd30017,1);
  auVar98 = vpinsrd_avx(auVar98,0xffd30017,2);
  auVar98 = vpinsrd_avx(auVar98,0xffd30017,3);
  uStack_1770 = auVar98._0_8_;
  uStack_1768 = auVar98._8_8_;
  auVar98 = vpinsrd_avx(ZEXT416(0x1b0013),0x1b0013,1);
  auVar98 = vpinsrd_avx(auVar98,0x1b0013,2);
  auVar98 = vpinsrd_avx(auVar98,0x1b0013,3);
  auVar99 = vpinsrd_avx(ZEXT416(0x1b0013),0x1b0013,1);
  auVar99 = vpinsrd_avx(auVar99,0x1b0013,2);
  auVar99 = vpinsrd_avx(auVar99,0x1b0013,3);
  uStack_1730 = auVar99._0_8_;
  uStack_1728 = auVar99._8_8_;
  auVar99 = vpinsrd_avx(ZEXT416(0xfffd3),0xfffd3,1);
  auVar99 = vpinsrd_avx(auVar99,0xfffd3,2);
  auVar99 = vpinsrd_avx(auVar99,0xfffd3,3);
  auVar100 = vpinsrd_avx(ZEXT416(0xfffd3),0xfffd3,1);
  auVar100 = vpinsrd_avx(auVar100,0xfffd3,2);
  auVar100 = vpinsrd_avx(auVar100,0xfffd3,3);
  uStack_16f0 = auVar100._0_8_;
  uStack_16e8 = auVar100._8_8_;
  auVar100 = vpinsrd_avx(ZEXT416(0xffd4001e),0xffd4001e,1);
  auVar100 = vpinsrd_avx(auVar100,0xffd4001e,2);
  auVar100 = vpinsrd_avx(auVar100,0xffd4001e,3);
  auVar101 = vpinsrd_avx(ZEXT416(0xffd4001e),0xffd4001e,1);
  auVar101 = vpinsrd_avx(auVar101,0xffd4001e,2);
  auVar101 = vpinsrd_avx(auVar101,0xffd4001e,3);
  uStack_16b0 = auVar101._0_8_;
  uStack_16a8 = auVar101._8_8_;
  auVar101 = vpinsrd_avx(ZEXT416(0x22000b),0x22000b,1);
  auVar101 = vpinsrd_avx(auVar101,0x22000b,2);
  auVar101 = vpinsrd_avx(auVar101,0x22000b,3);
  auVar102 = vpinsrd_avx(ZEXT416(0x22000b),0x22000b,1);
  auVar102 = vpinsrd_avx(auVar102,0x22000b,2);
  auVar102 = vpinsrd_avx(auVar102,0x22000b,3);
  uStack_1670 = auVar102._0_8_;
  uStack_1668 = auVar102._8_8_;
  auVar102 = vpinsrd_avx(ZEXT416(0x7ffd5),0x7ffd5,1);
  auVar102 = vpinsrd_avx(auVar102,0x7ffd5,2);
  auVar102 = vpinsrd_avx(auVar102,0x7ffd5,3);
  auVar103 = vpinsrd_avx(ZEXT416(0x7ffd5),0x7ffd5,1);
  auVar103 = vpinsrd_avx(auVar103,0x7ffd5,2);
  auVar103 = vpinsrd_avx(auVar103,0x7ffd5,3);
  uStack_1630 = auVar103._0_8_;
  uStack_1628 = auVar103._8_8_;
  auVar103 = vpinsrd_avx(ZEXT416(0xffd70024),0xffd70024,1);
  auVar103 = vpinsrd_avx(auVar103,0xffd70024,2);
  auVar103 = vpinsrd_avx(auVar103,0xffd70024,3);
  auVar104 = vpinsrd_avx(ZEXT416(0xffd70024),0xffd70024,1);
  auVar104 = vpinsrd_avx(auVar104,0xffd70024,2);
  auVar104 = vpinsrd_avx(auVar104,0xffd70024,3);
  uStack_15f0 = auVar104._0_8_;
  uStack_15e8 = auVar104._8_8_;
  auVar104 = vpinsrd_avx(ZEXT416(0x270002),0x270002,1);
  auVar104 = vpinsrd_avx(auVar104,0x270002,2);
  auVar104 = vpinsrd_avx(auVar104,0x270002,3);
  auVar105 = vpinsrd_avx(ZEXT416(0x270002),0x270002,1);
  auVar105 = vpinsrd_avx(auVar105,0x270002,2);
  auVar105 = vpinsrd_avx(auVar105,0x270002,3);
  uStack_15b0 = auVar105._0_8_;
  uStack_15a8 = auVar105._8_8_;
  auVar105 = vpinsrd_avx(ZEXT416(0xffd40013),0xffd40013,1);
  auVar105 = vpinsrd_avx(auVar105,0xffd40013,2);
  auVar105 = vpinsrd_avx(auVar105,0xffd40013,3);
  auVar106 = vpinsrd_avx(ZEXT416(0xffd40013),0xffd40013,1);
  auVar106 = vpinsrd_avx(auVar106,0xffd40013,2);
  auVar106 = vpinsrd_avx(auVar106,0xffd40013,3);
  uStack_1570 = auVar106._0_8_;
  uStack_1568 = auVar106._8_8_;
  auVar106 = vpinsrd_avx(ZEXT416(0xfffe0024),0xfffe0024,1);
  auVar106 = vpinsrd_avx(auVar106,0xfffe0024,2);
  auVar106 = vpinsrd_avx(auVar106,0xfffe0024,3);
  auVar107 = vpinsrd_avx(ZEXT416(0xfffe0024),0xfffe0024,1);
  auVar107 = vpinsrd_avx(auVar107,0xfffe0024,2);
  auVar107 = vpinsrd_avx(auVar107,0xfffe0024,3);
  uStack_1530 = auVar107._0_8_;
  uStack_1528 = auVar107._8_8_;
  auVar107 = vpinsrd_avx(ZEXT416(0x2dffde),0x2dffde,1);
  auVar107 = vpinsrd_avx(auVar107,0x2dffde,2);
  auVar107 = vpinsrd_avx(auVar107,0x2dffde,3);
  auVar108 = vpinsrd_avx(ZEXT416(0x2dffde),0x2dffde,1);
  auVar108 = vpinsrd_avx(auVar108,0x2dffde,2);
  auVar108 = vpinsrd_avx(auVar108,0x2dffde,3);
  uStack_14f0 = auVar108._0_8_;
  uStack_14e8 = auVar108._8_8_;
  auVar108 = vpinsrd_avx(ZEXT416(0xfff1ffe9),0xfff1ffe9,1);
  auVar108 = vpinsrd_avx(auVar108,0xfff1ffe9,2);
  auVar108 = vpinsrd_avx(auVar108,0xfff1ffe9,3);
  auVar109 = vpinsrd_avx(ZEXT416(0xfff1ffe9),0xfff1ffe9,1);
  auVar109 = vpinsrd_avx(auVar109,0xfff1ffe9,2);
  auVar109 = vpinsrd_avx(auVar109,0xfff1ffe9,3);
  uStack_14b0 = auVar109._0_8_;
  uStack_14a8 = auVar109._8_8_;
  auVar109 = vpinsrd_avx(ZEXT416(0xffd9002b),0xffd9002b,1);
  auVar109 = vpinsrd_avx(auVar109,0xffd9002b,2);
  auVar109 = vpinsrd_avx(auVar109,0xffd9002b,3);
  auVar110 = vpinsrd_avx(ZEXT416(0xffd9002b),0xffd9002b,1);
  auVar110 = vpinsrd_avx(auVar110,0xffd9002b,2);
  auVar110 = vpinsrd_avx(auVar110,0xffd9002b,3);
  uStack_1470 = auVar110._0_8_;
  uStack_1468 = auVar110._8_8_;
  auVar110 = vpinsrd_avx(ZEXT416(0x1e0007),0x1e0007,1);
  auVar110 = vpinsrd_avx(auVar110,0x1e0007,2);
  auVar110 = vpinsrd_avx(auVar110,0x1e0007,3);
  auVar111 = vpinsrd_avx(ZEXT416(0x1e0007),0x1e0007,1);
  auVar111 = vpinsrd_avx(auVar111,0x1e0007,2);
  auVar111 = vpinsrd_avx(auVar111,0x1e0007,3);
  uStack_1430 = auVar111._0_8_;
  uStack_1428 = auVar111._8_8_;
  auVar111 = vpinsrd_avx(ZEXT416(0x1bffd3),0x1bffd3,1);
  auVar111 = vpinsrd_avx(auVar111,0x1bffd3,2);
  auVar111 = vpinsrd_avx(auVar111,0x1bffd3,3);
  auVar112 = vpinsrd_avx(ZEXT416(0x1bffd3),0x1bffd3,1);
  auVar112 = vpinsrd_avx(auVar112,0x1bffd3,2);
  auVar112 = vpinsrd_avx(auVar112,0x1bffd3,3);
  uStack_13f0 = auVar112._0_8_;
  uStack_13e8 = auVar112._8_8_;
  auVar112 = vpinsrd_avx(ZEXT416(0xffd7000b),0xffd7000b,1);
  auVar112 = vpinsrd_avx(auVar112,0xffd7000b,2);
  auVar112 = vpinsrd_avx(auVar112,0xffd7000b,3);
  auVar113 = vpinsrd_avx(ZEXT416(0xffd7000b),0xffd7000b,1);
  auVar113 = vpinsrd_avx(auVar113,0xffd7000b,2);
  auVar113 = vpinsrd_avx(auVar113,0xffd7000b,3);
  uStack_13b0 = auVar113._0_8_;
  uStack_13a8 = auVar113._8_8_;
  auVar113 = vpinsrd_avx(ZEXT416(0xffd9000f),0xffd9000f,1);
  auVar113 = vpinsrd_avx(auVar113,0xffd9000f,2);
  auVar113 = vpinsrd_avx(auVar113,0xffd9000f,3);
  auVar114 = vpinsrd_avx(ZEXT416(0xffd9000f),0xffd9000f,1);
  auVar114 = vpinsrd_avx(auVar114,0xffd9000f,2);
  auVar114 = vpinsrd_avx(auVar114,0xffd9000f,3);
  uStack_1370 = auVar114._0_8_;
  uStack_1368 = auVar114._8_8_;
  auVar114 = vpinsrd_avx(ZEXT416(0xffe2002d),0xffe2002d,1);
  auVar114 = vpinsrd_avx(auVar114,0xffe2002d,2);
  auVar114 = vpinsrd_avx(auVar114,0xffe2002d,3);
  auVar115 = vpinsrd_avx(ZEXT416(0xffe2002d),0xffe2002d,1);
  auVar115 = vpinsrd_avx(auVar115,0xffe2002d,2);
  auVar115 = vpinsrd_avx(auVar115,0xffe2002d,3);
  uStack_1330 = auVar115._0_8_;
  uStack_1328 = auVar115._8_8_;
  auVar115 = vpinsrd_avx(ZEXT416(0x1b0002),0x1b0002,1);
  auVar115 = vpinsrd_avx(auVar115,0x1b0002,2);
  auVar115 = vpinsrd_avx(auVar115,0x1b0002,3);
  auVar116 = vpinsrd_avx(ZEXT416(0x1b0002),0x1b0002,1);
  auVar116 = vpinsrd_avx(auVar116,0x1b0002,2);
  auVar116 = vpinsrd_avx(auVar116,0x1b0002,3);
  uStack_12f0 = auVar116._0_8_;
  uStack_12e8 = auVar116._8_8_;
  auVar116 = vpinsrd_avx(ZEXT416(0x29ffd4),0x29ffd4,1);
  auVar116 = vpinsrd_avx(auVar116,0x29ffd4,2);
  auVar116 = vpinsrd_avx(auVar116,0x29ffd4,3);
  auVar117 = vpinsrd_avx(ZEXT416(0x29ffd4),0x29ffd4,1);
  auVar117 = vpinsrd_avx(auVar117,0x29ffd4,2);
  auVar117 = vpinsrd_avx(auVar117,0x29ffd4,3);
  uStack_12b0 = auVar117._0_8_;
  uStack_12a8 = auVar117._8_8_;
  auVar117 = vpinsrd_avx(ZEXT416(0xfff5ffed),0xfff5ffed,1);
  auVar117 = vpinsrd_avx(auVar117,0xfff5ffed,2);
  auVar117 = vpinsrd_avx(auVar117,0xfff5ffed,3);
  auVar118 = vpinsrd_avx(ZEXT416(0xfff5ffed),0xfff5ffed,1);
  auVar118 = vpinsrd_avx(auVar118,0xfff5ffed,2);
  auVar118 = vpinsrd_avx(auVar118,0xfff5ffed,3);
  uStack_1270 = auVar118._0_8_;
  uStack_1268 = auVar118._8_8_;
  auVar118 = vpinsrd_avx(ZEXT416(0xffd30024),0xffd30024,1);
  auVar118 = vpinsrd_avx(auVar118,0xffd30024,2);
  auVar118 = vpinsrd_avx(auVar118,0xffd30024,3);
  auVar119 = vpinsrd_avx(ZEXT416(0xffd30024),0xffd30024,1);
  auVar119 = vpinsrd_avx(auVar119,0xffd30024,2);
  auVar119 = vpinsrd_avx(auVar119,0xffd30024,3);
  uStack_1230 = auVar119._0_8_;
  uStack_1228 = auVar119._8_8_;
  auVar119 = vpinsrd_avx(ZEXT416(0xfff90022),0xfff90022,1);
  auVar119 = vpinsrd_avx(auVar119,0xfff90022,2);
  auVar119 = vpinsrd_avx(auVar119,0xfff90022,3);
  auVar120 = vpinsrd_avx(ZEXT416(0xfff90022),0xfff90022,1);
  auVar120 = vpinsrd_avx(auVar120,0xfff90022,2);
  auVar120 = vpinsrd_avx(auVar120,0xfff90022,3);
  uStack_11f0 = auVar120._0_8_;
  uStack_11e8 = auVar120._8_8_;
  auVar120 = vpinsrd_avx(ZEXT416(0x2bffe9),0x2bffe9,1);
  auVar120 = vpinsrd_avx(auVar120,0x2bffe9,2);
  auVar120 = vpinsrd_avx(auVar120,0x2bffe9,3);
  auVar121 = vpinsrd_avx(ZEXT416(0x2bffe9),0x2bffe9,1);
  auVar121 = vpinsrd_avx(auVar121,0x2bffe9,2);
  auVar121 = vpinsrd_avx(auVar121,0x2bffe9,3);
  uStack_11b0 = auVar121._0_8_;
  uStack_11a8 = auVar121._8_8_;
  auVar121 = vpinsrd_avx(ZEXT416(0xffe2000b),0xffe2000b,1);
  auVar121 = vpinsrd_avx(auVar121,0xffe2000b,2);
  auVar121 = vpinsrd_avx(auVar121,0xffe2000b,3);
  auVar122 = vpinsrd_avx(ZEXT416(0xffe2000b),0xffe2000b,1);
  auVar122 = vpinsrd_avx(auVar122,0xffe2000b,2);
  auVar122 = vpinsrd_avx(auVar122,0xffe2000b,3);
  uStack_1170 = auVar122._0_8_;
  uStack_1168 = auVar122._8_8_;
  auVar122 = vpinsrd_avx(ZEXT416(0xffd3002b),0xffd3002b,1);
  auVar122 = vpinsrd_avx(auVar122,0xffd3002b,2);
  auVar122 = vpinsrd_avx(auVar122,0xffd3002b,3);
  auVar123 = vpinsrd_avx(ZEXT416(0xffd3002b),0xffd3002b,1);
  auVar123 = vpinsrd_avx(auVar123,0xffd3002b,2);
  auVar123 = vpinsrd_avx(auVar123,0xffd3002b,3);
  uStack_1130 = auVar123._0_8_;
  uStack_1128 = auVar123._8_8_;
  auVar123 = vpinsrd_avx(ZEXT416(0xffed0024),0xffed0024,1);
  auVar123 = vpinsrd_avx(auVar123,0xffed0024,2);
  auVar123 = vpinsrd_avx(auVar123,0xffed0024,3);
  auVar124 = vpinsrd_avx(ZEXT416(0xffed0024),0xffed0024,1);
  auVar124 = vpinsrd_avx(auVar124,0xffed0024,2);
  auVar124 = vpinsrd_avx(auVar124,0xffed0024,3);
  uStack_10f0 = auVar124._0_8_;
  uStack_10e8 = auVar124._8_8_;
  auVar124 = vpinsrd_avx(ZEXT416(0x17fffe),0x17fffe,1);
  auVar124 = vpinsrd_avx(auVar124,0x17fffe,2);
  auVar124 = vpinsrd_avx(auVar124,0x17fffe,3);
  auVar125 = vpinsrd_avx(ZEXT416(0x17fffe),0x17fffe,1);
  auVar125 = vpinsrd_avx(auVar125,0x17fffe,2);
  auVar125 = vpinsrd_avx(auVar125,0x17fffe,3);
  uStack_10b0 = auVar125._0_8_;
  uStack_10a8 = auVar125._8_8_;
  auVar125 = vpinsrd_avx(ZEXT416(0x2dffd9),0x2dffd9,1);
  auVar125 = vpinsrd_avx(auVar125,0x2dffd9,2);
  auVar125 = vpinsrd_avx(auVar125,0x2dffd9,3);
  auVar126 = vpinsrd_avx(ZEXT416(0x2dffd9),0x2dffd9,1);
  auVar126 = vpinsrd_avx(auVar126,0x2dffd9,2);
  auVar126 = vpinsrd_avx(auVar126,0x2dffd9,3);
  uStack_1070 = auVar126._0_8_;
  uStack_1068 = auVar126._8_8_;
  auVar126 = vpinsrd_avx(ZEXT416(0x1bffd7),0x1bffd7,1);
  auVar126 = vpinsrd_avx(auVar126,0x1bffd7,2);
  auVar126 = vpinsrd_avx(auVar126,0x1bffd7,3);
  auVar127 = vpinsrd_avx(ZEXT416(0x1bffd7),0x1bffd7,1);
  auVar127 = vpinsrd_avx(auVar127,0x1bffd7,2);
  auVar127 = vpinsrd_avx(auVar127,0x1bffd7,3);
  uStack_1030 = auVar127._0_8_;
  uStack_1028 = auVar127._8_8_;
  auVar127 = vpinsrd_avx(ZEXT416(0xfff1fff9),0xfff1fff9,1);
  auVar127 = vpinsrd_avx(auVar127,0xfff1fff9,2);
  auVar127 = vpinsrd_avx(auVar127,0xfff1fff9,3);
  auVar128 = vpinsrd_avx(ZEXT416(0xfff1fff9),0xfff1fff9,1);
  auVar128 = vpinsrd_avx(auVar128,0xfff1fff9,2);
  auVar128 = vpinsrd_avx(auVar128,0xfff1fff9,3);
  uStack_ff0 = auVar128._0_8_;
  uStack_fe8 = auVar128._8_8_;
  auVar128 = vpinsrd_avx(ZEXT416(0xffd40022),0xffd40022,1);
  auVar128 = vpinsrd_avx(auVar128,0xffd40022,2);
  auVar128 = vpinsrd_avx(auVar128,0xffd40022,3);
  auVar129 = vpinsrd_avx(ZEXT416(0xffd40022),0xffd40022,1);
  auVar129 = vpinsrd_avx(auVar129,0xffd40022,2);
  auVar129 = vpinsrd_avx(auVar129,0xffd40022,3);
  uStack_fb0 = auVar129._0_8_;
  uStack_fa8 = auVar129._8_8_;
  auVar129 = vpinsrd_avx(ZEXT416(0xffed0007),0xffed0007,1);
  auVar129 = vpinsrd_avx(auVar129,0xffed0007,2);
  auVar129 = vpinsrd_avx(auVar129,0xffed0007,3);
  auVar130 = vpinsrd_avx(ZEXT416(0xffed0007),0xffed0007,1);
  auVar130 = vpinsrd_avx(auVar130,0xffed0007,2);
  auVar130 = vpinsrd_avx(auVar130,0xffed0007,3);
  uStack_f70 = auVar130._0_8_;
  uStack_f68 = auVar130._8_8_;
  auVar130 = vpinsrd_avx(ZEXT416(0xffd9001e),0xffd9001e,1);
  auVar130 = vpinsrd_avx(auVar130,0xffd9001e,2);
  auVar130 = vpinsrd_avx(auVar130,0xffd9001e,3);
  auVar131 = vpinsrd_avx(ZEXT416(0xffd9001e),0xffd9001e,1);
  auVar131 = vpinsrd_avx(auVar131,0xffd9001e,2);
  auVar131 = vpinsrd_avx(auVar131,0xffd9001e,3);
  uStack_f30 = auVar131._0_8_;
  uStack_f28 = auVar131._8_8_;
  auVar131 = vpinsrd_avx(ZEXT416(0xffd3002c),0xffd3002c,1);
  auVar131 = vpinsrd_avx(auVar131,0xffd3002c,2);
  auVar131 = vpinsrd_avx(auVar131,0xffd3002c,3);
  auVar132 = vpinsrd_avx(ZEXT416(0xffd3002c),0xffd3002c,1);
  auVar132 = vpinsrd_avx(auVar132,0xffd3002c,2);
  auVar132 = vpinsrd_avx(auVar132,0xffd3002c,3);
  uStack_ef0 = auVar132._0_8_;
  uStack_ee8 = auVar132._8_8_;
  auVar132 = vpinsrd_avx(ZEXT416(0xffdc002b),0xffdc002b,1);
  auVar132 = vpinsrd_avx(auVar132,0xffdc002b,2);
  auVar132 = vpinsrd_avx(auVar132,0xffdc002b,3);
  auVar133 = vpinsrd_avx(ZEXT416(0xffdc002b),0xffdc002b,1);
  auVar133 = vpinsrd_avx(auVar133,0xffdc002b,2);
  auVar133 = vpinsrd_avx(auVar133,0xffdc002b,3);
  uStack_eb0 = auVar133._0_8_;
  uStack_ea8 = auVar133._8_8_;
  auVar133 = vpinsrd_avx(ZEXT416(0xfff1001b),0xfff1001b,1);
  auVar133 = vpinsrd_avx(auVar133,0xfff1001b,2);
  auVar133 = vpinsrd_avx(auVar133,0xfff1001b,3);
  auVar134 = vpinsrd_avx(ZEXT416(0xfff1001b),0xfff1001b,1);
  auVar134 = vpinsrd_avx(auVar134,0xfff1001b,2);
  auVar134 = vpinsrd_avx(auVar134,0xfff1001b,3);
  uStack_e70 = auVar134._0_8_;
  uStack_e68 = auVar134._8_8_;
  auVar134 = vpinsrd_avx(ZEXT416(0xb0002),0xb0002,1);
  auVar134 = vpinsrd_avx(auVar134,0xb0002,2);
  auVar134 = vpinsrd_avx(auVar134,0xb0002,3);
  auVar135 = vpinsrd_avx(ZEXT416(0xb0002),0xb0002,1);
  auVar135 = vpinsrd_avx(auVar135,0xb0002,2);
  auVar135 = vpinsrd_avx(auVar135,0xb0002,3);
  uStack_e30 = auVar135._0_8_;
  uStack_e28 = auVar135._8_8_;
  auVar135 = vpinsrd_avx(ZEXT416(0x22ffe9),0x22ffe9,1);
  auVar135 = vpinsrd_avx(auVar135,0x22ffe9,2);
  auVar135 = vpinsrd_avx(auVar135,0x22ffe9,3);
  auVar136 = vpinsrd_avx(ZEXT416(0x22ffe9),0x22ffe9,1);
  auVar136 = vpinsrd_avx(auVar136,0x22ffe9,2);
  auVar136 = vpinsrd_avx(auVar136,0x22ffe9,3);
  uStack_df0 = auVar136._0_8_;
  uStack_de8 = auVar136._8_8_;
  auVar136 = vpinsrd_avx(ZEXT416(0x2dffd7),0x2dffd7,1);
  auVar136 = vpinsrd_avx(auVar136,0x2dffd7,2);
  auVar136 = vpinsrd_avx(auVar136,0x2dffd7,3);
  auVar137 = vpinsrd_avx(ZEXT416(0x2dffd7),0x2dffd7,1);
  auVar137 = vpinsrd_avx(auVar137,0x2dffd7,2);
  auVar137 = vpinsrd_avx(auVar137,0x2dffd7,3);
  uStack_db0 = auVar137._0_8_;
  uStack_da8 = auVar137._8_8_;
  auVar137 = vpinsrd_avx(ZEXT416(0xfff90002),0xfff90002,1);
  auVar137 = vpinsrd_avx(auVar137,0xfff90002,2);
  auVar137 = vpinsrd_avx(auVar137,0xfff90002,3);
  auVar138 = vpinsrd_avx(ZEXT416(0xfff90002),0xfff90002,1);
  auVar138 = vpinsrd_avx(auVar138,0xfff90002,2);
  auVar138 = vpinsrd_avx(auVar138,0xfff90002,3);
  uStack_d70 = auVar138._0_8_;
  uStack_d68 = auVar138._8_8_;
  auVar138 = vpinsrd_avx(ZEXT416(0xfff1000b),0xfff1000b,1);
  auVar138 = vpinsrd_avx(auVar138,0xfff1000b,2);
  auVar138 = vpinsrd_avx(auVar138,0xfff1000b,3);
  auVar139 = vpinsrd_avx(ZEXT416(0xfff1000b),0xfff1000b,1);
  auVar139 = vpinsrd_avx(auVar139,0xfff1000b,2);
  auVar139 = vpinsrd_avx(auVar139,0xfff1000b,3);
  uStack_d30 = auVar139._0_8_;
  uStack_d28 = auVar139._8_8_;
  auVar139 = vpinsrd_avx(ZEXT416(0xffe90013),0xffe90013,1);
  auVar139 = vpinsrd_avx(auVar139,0xffe90013,2);
  auVar139 = vpinsrd_avx(auVar139,0xffe90013,3);
  auVar140 = vpinsrd_avx(ZEXT416(0xffe90013),0xffe90013,1);
  auVar140 = vpinsrd_avx(auVar140,0xffe90013,2);
  auVar140 = vpinsrd_avx(auVar140,0xffe90013,3);
  uStack_cf0 = auVar140._0_8_;
  uStack_ce8 = auVar140._8_8_;
  auVar140 = vpinsrd_avx(ZEXT416(0xffe2001b),0xffe2001b,1);
  auVar140 = vpinsrd_avx(auVar140,0xffe2001b,2);
  auVar140 = vpinsrd_avx(auVar140,0xffe2001b,3);
  auVar141 = vpinsrd_avx(ZEXT416(0xffe2001b),0xffe2001b,1);
  auVar141 = vpinsrd_avx(auVar141,0xffe2001b,2);
  auVar141 = vpinsrd_avx(auVar141,0xffe2001b,3);
  uStack_cb0 = auVar141._0_8_;
  uStack_ca8 = auVar141._8_8_;
  auVar141 = vpinsrd_avx(ZEXT416(0xffdc0022),0xffdc0022,1);
  auVar141 = vpinsrd_avx(auVar141,0xffdc0022,2);
  auVar141 = vpinsrd_avx(auVar141,0xffdc0022,3);
  auVar142 = vpinsrd_avx(ZEXT416(0xffdc0022),0xffdc0022,1);
  auVar142 = vpinsrd_avx(auVar142,0xffdc0022,2);
  auVar142 = vpinsrd_avx(auVar142,0xffdc0022,3);
  uStack_c70 = auVar142._0_8_;
  uStack_c68 = auVar142._8_8_;
  auVar142 = vpinsrd_avx(ZEXT416(0xffd70027),0xffd70027,1);
  auVar142 = vpinsrd_avx(auVar142,0xffd70027,2);
  auVar142 = vpinsrd_avx(auVar142,0xffd70027,3);
  auVar143 = vpinsrd_avx(ZEXT416(0xffd70027),0xffd70027,1);
  auVar143 = vpinsrd_avx(auVar143,0xffd70027,2);
  auVar143 = vpinsrd_avx(auVar143,0xffd70027,3);
  uStack_c30 = auVar143._0_8_;
  uStack_c28 = auVar143._8_8_;
  auVar143 = vpinsrd_avx(ZEXT416(0xffd4002b),0xffd4002b,1);
  auVar143 = vpinsrd_avx(auVar143,0xffd4002b,2);
  auVar143 = vpinsrd_avx(auVar143,0xffd4002b,3);
  auVar144 = vpinsrd_avx(ZEXT416(0xffd4002b),0xffd4002b,1);
  auVar144 = vpinsrd_avx(auVar144,0xffd4002b,2);
  auVar144 = vpinsrd_avx(auVar144,0xffd4002b,3);
  uStack_bf0 = auVar144._0_8_;
  uStack_be8 = auVar144._8_8_;
  auVar144 = vpinsrd_avx(ZEXT416(0xffd3002d),0xffd3002d,1);
  auVar144 = vpinsrd_avx(auVar144,0xffd3002d,2);
  auVar144 = vpinsrd_avx(auVar144,0xffd3002d,3);
  auVar145 = vpinsrd_avx(ZEXT416(0xffd3002d),0xffd3002d,1);
  auVar145 = vpinsrd_avx(auVar145,0xffd3002d,2);
  auVar145 = vpinsrd_avx(auVar145,0xffd3002d,3);
  uStack_bb0 = auVar145._0_8_;
  uStack_ba8 = auVar145._8_8_;
  auVar145 = vpinsrd_avx(ZEXT416(0x230028),0x230028,1);
  auVar145 = vpinsrd_avx(auVar145,0x230028,2);
  auVar145 = vpinsrd_avx(auVar145,0x230028,3);
  auVar146 = vpinsrd_avx(ZEXT416(0x230028),0x230028,1);
  auVar146 = vpinsrd_avx(auVar146,0x230028,2);
  auVar146 = vpinsrd_avx(auVar146,0x230028,3);
  uStack_b70 = auVar146._0_8_;
  uStack_b68 = auVar146._8_8_;
  auVar146 = vpinsrd_avx(ZEXT416(0x15001d),0x15001d,1);
  auVar146 = vpinsrd_avx(auVar146,0x15001d,2);
  auVar146 = vpinsrd_avx(auVar146,0x15001d,3);
  auVar147 = vpinsrd_avx(ZEXT416(0x15001d),0x15001d,1);
  auVar147 = vpinsrd_avx(auVar147,0x15001d,2);
  auVar147 = vpinsrd_avx(auVar147,0x15001d,3);
  uStack_b30 = auVar147._0_8_;
  uStack_b28 = auVar147._8_8_;
  auVar147 = vpinsrd_avx(ZEXT416(0x4000d),0x4000d,1);
  auVar147 = vpinsrd_avx(auVar147,0x4000d,2);
  auVar147 = vpinsrd_avx(auVar147,0x4000d,3);
  auVar148 = vpinsrd_avx(ZEXT416(0x4000d),0x4000d,1);
  auVar148 = vpinsrd_avx(auVar148,0x4000d,2);
  auVar148 = vpinsrd_avx(auVar148,0x4000d,3);
  uStack_af0 = auVar148._0_8_;
  uStack_ae8 = auVar148._8_8_;
  auVar148 = vpinsrd_avx(ZEXT416(0x1d002b),0x1d002b,1);
  auVar148 = vpinsrd_avx(auVar148,0x1d002b,2);
  auVar148 = vpinsrd_avx(auVar148,0x1d002b,3);
  auVar149 = vpinsrd_avx(ZEXT416(0x1d002b),0x1d002b,1);
  auVar149 = vpinsrd_avx(auVar149,0x1d002b,2);
  auVar149 = vpinsrd_avx(auVar149,0x1d002b,3);
  uStack_ab0 = auVar149._0_8_;
  uStack_aa8 = auVar149._8_8_;
  auVar149 = vpinsrd_avx(ZEXT416(0xffeb0004),0xffeb0004,1);
  auVar149 = vpinsrd_avx(auVar149,0xffeb0004,2);
  auVar149 = vpinsrd_avx(auVar149,0xffeb0004,3);
  auVar150 = vpinsrd_avx(ZEXT416(0xffeb0004),0xffeb0004,1);
  auVar150 = vpinsrd_avx(auVar150,0xffeb0004,2);
  auVar150 = vpinsrd_avx(auVar150,0xffeb0004,3);
  uStack_a70 = auVar150._0_8_;
  uStack_a68 = auVar150._8_8_;
  auVar150 = vpinsrd_avx(ZEXT416(0xffd3ffd8),0xffd3ffd8,1);
  auVar150 = vpinsrd_avx(auVar150,0xffd3ffd8,2);
  auVar150 = vpinsrd_avx(auVar150,0xffd3ffd8,3);
  auVar151 = vpinsrd_avx(ZEXT416(0xffd3ffd8),0xffd3ffd8,1);
  auVar151 = vpinsrd_avx(auVar151,0xffd3ffd8,2);
  auVar151 = vpinsrd_avx(auVar151,0xffd3ffd8,3);
  uStack_a30 = auVar151._0_8_;
  uStack_a28 = auVar151._8_8_;
  auVar151 = vpinsrd_avx(ZEXT416(0xfff3ffdd),0xfff3ffdd,1);
  auVar151 = vpinsrd_avx(auVar151,0xfff3ffdd,2);
  auVar151 = vpinsrd_avx(auVar151,0xfff3ffdd,3);
  auVar152 = vpinsrd_avx(ZEXT416(0xfff3ffdd),0xfff3ffdd,1);
  auVar152 = vpinsrd_avx(auVar152,0xfff3ffdd,2);
  auVar152 = vpinsrd_avx(auVar152,0xfff3ffdd,3);
  uStack_9f0 = auVar152._0_8_;
  uStack_9e8 = auVar152._8_8_;
  auVar152 = vpinsrd_avx(ZEXT416(0x40028),0x40028,1);
  auVar152 = vpinsrd_avx(auVar152,0x40028,2);
  auVar152 = vpinsrd_avx(auVar152,0x40028,3);
  auVar153 = vpinsrd_avx(ZEXT416(0x40028),0x40028,1);
  auVar153 = vpinsrd_avx(auVar153,0x40028,2);
  auVar153 = vpinsrd_avx(auVar153,0x40028,3);
  uStack_9b0 = auVar153._0_8_;
  uStack_9a8 = auVar153._8_8_;
  auVar153 = vpinsrd_avx(ZEXT416(0xffd5ffdd),0xffd5ffdd,1);
  auVar153 = vpinsrd_avx(auVar153,0xffd5ffdd,2);
  auVar153 = vpinsrd_avx(auVar153,0xffd5ffdd,3);
  auVar154 = vpinsrd_avx(ZEXT416(0xffd5ffdd),0xffd5ffdd,1);
  auVar154 = vpinsrd_avx(auVar154,0xffd5ffdd,2);
  auVar154 = vpinsrd_avx(auVar154,0xffd5ffdd,3);
  uStack_970 = auVar154._0_8_;
  uStack_968 = auVar154._8_8_;
  auVar154 = vpinsrd_avx(ZEXT416(0x1dfff3),0x1dfff3,1);
  auVar154 = vpinsrd_avx(auVar154,0x1dfff3,2);
  auVar154 = vpinsrd_avx(auVar154,0x1dfff3,3);
  auVar155 = vpinsrd_avx(ZEXT416(0x1dfff3),0x1dfff3,1);
  auVar155 = vpinsrd_avx(auVar155,0x1dfff3,2);
  auVar155 = vpinsrd_avx(auVar155,0x1dfff3,3);
  uStack_930 = auVar155._0_8_;
  uStack_928 = auVar155._8_8_;
  auVar155 = vpinsrd_avx(ZEXT416(0x15002d),0x15002d,1);
  auVar155 = vpinsrd_avx(auVar155,0x15002d,2);
  auVar155 = vpinsrd_avx(auVar155,0x15002d,3);
  auVar156 = vpinsrd_avx(ZEXT416(0x15002d),0x15002d,1);
  auVar156 = vpinsrd_avx(auVar156,0x15002d,2);
  auVar156 = vpinsrd_avx(auVar156,0x15002d,3);
  uStack_8f0 = auVar156._0_8_;
  uStack_8e8 = auVar156._8_8_;
  auVar156 = vpinsrd_avx(ZEXT416(0xffeb0023),0xffeb0023,1);
  auVar156 = vpinsrd_avx(auVar156,0xffeb0023,2);
  auVar156 = vpinsrd_avx(auVar156,0xffeb0023,3);
  auVar157 = vpinsrd_avx(ZEXT416(0xffeb0023),0xffeb0023,1);
  auVar157 = vpinsrd_avx(auVar157,0xffeb0023,2);
  auVar157 = vpinsrd_avx(auVar157,0xffeb0023,3);
  uStack_8b0 = auVar157._0_8_;
  uStack_8a8 = auVar157._8_8_;
  auVar157 = vpinsrd_avx(ZEXT416(0x4ffd5),0x4ffd5,1);
  auVar157 = vpinsrd_avx(auVar157,0x4ffd5,2);
  auVar157 = vpinsrd_avx(auVar157,0x4ffd5,3);
  auVar158 = vpinsrd_avx(ZEXT416(0x4ffd5),0x4ffd5,1);
  auVar158 = vpinsrd_avx(auVar158,0x4ffd5,2);
  auVar158 = vpinsrd_avx(auVar158,0x4ffd5,3);
  uStack_870 = auVar158._0_8_;
  uStack_868 = auVar158._8_8_;
  auVar158 = vpinsrd_avx(ZEXT416(0xd002d),0xd002d,1);
  auVar158 = vpinsrd_avx(auVar158,0xd002d,2);
  auVar158 = vpinsrd_avx(auVar158,0xd002d,3);
  auVar159 = vpinsrd_avx(ZEXT416(0xd002d),0xd002d,1);
  auVar159 = vpinsrd_avx(auVar159,0xd002d,2);
  auVar159 = vpinsrd_avx(auVar159,0xd002d,3);
  uStack_830 = auVar159._0_8_;
  uStack_828 = auVar159._8_8_;
  auVar159 = vpinsrd_avx(ZEXT416(0xffe3ffd8),0xffe3ffd8,1);
  auVar159 = vpinsrd_avx(auVar159,0xffe3ffd8,2);
  auVar159 = vpinsrd_avx(auVar159,0xffe3ffd8,3);
  auVar160 = vpinsrd_avx(ZEXT416(0xffe3ffd8),0xffe3ffd8,1);
  auVar160 = vpinsrd_avx(auVar160,0xffe3ffd8,2);
  auVar160 = vpinsrd_avx(auVar160,0xffe3ffd8,3);
  uStack_7f0 = auVar160._0_8_;
  uStack_7e8 = auVar160._8_8_;
  auVar160 = vpinsrd_avx(ZEXT416(0xffd8001d),0xffd8001d,1);
  auVar160 = vpinsrd_avx(auVar160,0xffd8001d,2);
  auVar160 = vpinsrd_avx(auVar160,0xffd8001d,3);
  auVar161 = vpinsrd_avx(ZEXT416(0xffd8001d),0xffd8001d,1);
  auVar161 = vpinsrd_avx(auVar161,0xffd8001d,2);
  auVar161 = vpinsrd_avx(auVar161,0xffd8001d,3);
  uStack_7b0 = auVar161._0_8_;
  uStack_7a8 = auVar161._8_8_;
  auVar161 = vpinsrd_avx(ZEXT416(0x2dfff3),0x2dfff3,1);
  auVar161 = vpinsrd_avx(auVar161,0x2dfff3,2);
  auVar161 = vpinsrd_avx(auVar161,0x2dfff3,3);
  auVar162 = vpinsrd_avx(ZEXT416(0x2dfff3),0x2dfff3,1);
  auVar162 = vpinsrd_avx(auVar162,0x2dfff3,2);
  auVar162 = vpinsrd_avx(auVar162,0x2dfff3,3);
  uStack_770 = auVar162._0_8_;
  uStack_768 = auVar162._8_8_;
  auVar162 = vpinsrd_avx(ZEXT416(0xffd5fffc),0xffd5fffc,1);
  auVar162 = vpinsrd_avx(auVar162,0xffd5fffc,2);
  auVar162 = vpinsrd_avx(auVar162,0xffd5fffc,3);
  auVar163 = vpinsrd_avx(ZEXT416(0xffd5fffc),0xffd5fffc,1);
  auVar163 = vpinsrd_avx(auVar163,0xffd5fffc,2);
  auVar163 = vpinsrd_avx(auVar163,0xffd5fffc,3);
  uStack_730 = auVar163._0_8_;
  uStack_728 = auVar163._8_8_;
  auVar163 = vpinsrd_avx(ZEXT416(0x230015),0x230015,1);
  auVar163 = vpinsrd_avx(auVar163,0x230015,2);
  auVar163 = vpinsrd_avx(auVar163,0x230015,3);
  auVar164 = vpinsrd_avx(ZEXT416(0x230015),0x230015,1);
  auVar164 = vpinsrd_avx(auVar164,0x230015,2);
  auVar164 = vpinsrd_avx(auVar164,0x230015,3);
  uStack_6f0 = auVar164._0_8_;
  uStack_6e8 = auVar164._8_8_;
  auVar164 = vpinsrd_avx(ZEXT416(0xffd30015),0xffd30015,1);
  auVar164 = vpinsrd_avx(auVar164,0xffd30015,2);
  auVar164 = vpinsrd_avx(auVar164,0xffd30015,3);
  auVar165 = vpinsrd_avx(ZEXT416(0xffd30015),0xffd30015,1);
  auVar165 = vpinsrd_avx(auVar165,0xffd30015,2);
  auVar165 = vpinsrd_avx(auVar165,0xffd30015,3);
  uStack_6b0 = auVar165._0_8_;
  uStack_6a8 = auVar165._8_8_;
  auVar165 = vpinsrd_avx(ZEXT416(0xd001d),0xd001d,1);
  auVar165 = vpinsrd_avx(auVar165,0xd001d,2);
  auVar165 = vpinsrd_avx(auVar165,0xd001d,3);
  auVar166 = vpinsrd_avx(ZEXT416(0xd001d),0xd001d,1);
  auVar166 = vpinsrd_avx(auVar166,0xd001d,2);
  auVar166 = vpinsrd_avx(auVar166,0xd001d,3);
  uStack_670 = auVar166._0_8_;
  uStack_668 = auVar166._8_8_;
  auVar166 = vpinsrd_avx(ZEXT416(0x23ffd5),0x23ffd5,1);
  auVar166 = vpinsrd_avx(auVar166,0x23ffd5,2);
  auVar166 = vpinsrd_avx(auVar166,0x23ffd5,3);
  auVar167 = vpinsrd_avx(ZEXT416(0x23ffd5),0x23ffd5,1);
  auVar167 = vpinsrd_avx(auVar167,0x23ffd5,2);
  auVar167 = vpinsrd_avx(auVar167,0x23ffd5,3);
  uStack_630 = auVar167._0_8_;
  uStack_628 = auVar167._8_8_;
  auVar167 = vpinsrd_avx(ZEXT416(0xffd80004),0xffd80004,1);
  auVar167 = vpinsrd_avx(auVar167,0xffd80004,2);
  auVar167 = vpinsrd_avx(auVar167,0xffd80004,3);
  auVar168 = vpinsrd_avx(ZEXT416(0xffd80004),0xffd80004,1);
  auVar168 = vpinsrd_avx(auVar168,0xffd80004,2);
  auVar168 = vpinsrd_avx(auVar168,0xffd80004,3);
  uStack_5f0 = auVar168._0_8_;
  uStack_5e8 = auVar168._8_8_;
  auVar168 = vpinsrd_avx(ZEXT416(0xffdd000d),0xffdd000d,1);
  auVar168 = vpinsrd_avx(auVar168,0xffdd000d,2);
  auVar168 = vpinsrd_avx(auVar168,0xffdd000d,3);
  auVar169 = vpinsrd_avx(ZEXT416(0xffdd000d),0xffdd000d,1);
  auVar169 = vpinsrd_avx(auVar169,0xffdd000d,2);
  auVar169 = vpinsrd_avx(auVar169,0xffdd000d,3);
  uStack_5b0 = auVar169._0_8_;
  uStack_5a8 = auVar169._8_8_;
  auVar169 = vpinsrd_avx(ZEXT416(0xffd8002d),0xffd8002d,1);
  auVar169 = vpinsrd_avx(auVar169,0xffd8002d,2);
  auVar169 = vpinsrd_avx(auVar169,0xffd8002d,3);
  auVar170 = vpinsrd_avx(ZEXT416(0xffd8002d),0xffd8002d,1);
  auVar170 = vpinsrd_avx(auVar170,0xffd8002d,2);
  auVar170 = vpinsrd_avx(auVar170,0xffd8002d,3);
  uStack_570 = auVar170._0_8_;
  uStack_568 = auVar170._8_8_;
  auVar170 = vpinsrd_avx(ZEXT416(0x40015),0x40015,1);
  auVar170 = vpinsrd_avx(auVar170,0x40015,2);
  auVar170 = vpinsrd_avx(auVar170,0x40015,3);
  auVar171 = vpinsrd_avx(ZEXT416(0x40015),0x40015,1);
  auVar171 = vpinsrd_avx(auVar171,0x40015,2);
  auVar171 = vpinsrd_avx(auVar171,0x40015,3);
  uStack_530 = auVar171._0_8_;
  uStack_528 = auVar171._8_8_;
  auVar171 = vpinsrd_avx(ZEXT416(0x2bffe3),0x2bffe3,1);
  auVar171 = vpinsrd_avx(auVar171,0x2bffe3,2);
  auVar171 = vpinsrd_avx(auVar171,0x2bffe3,3);
  auVar172 = vpinsrd_avx(ZEXT416(0x2bffe3),0x2bffe3,1);
  auVar172 = vpinsrd_avx(auVar172,0x2bffe3,2);
  auVar172 = vpinsrd_avx(auVar172,0x2bffe3,3);
  uStack_4f0 = auVar172._0_8_;
  uStack_4e8 = auVar172._8_8_;
  auVar172 = vpinsrd_avx(ZEXT416(0xfff30004),0xfff30004,1);
  auVar172 = vpinsrd_avx(auVar172,0xfff30004,2);
  auVar172 = vpinsrd_avx(auVar172,0xfff30004,3);
  auVar173 = vpinsrd_avx(ZEXT416(0xfff30004),0xfff30004,1);
  auVar173 = vpinsrd_avx(auVar173,0xfff30004,2);
  auVar173 = vpinsrd_avx(auVar173,0xfff30004,3);
  uStack_4b0 = auVar173._0_8_;
  uStack_4a8 = auVar173._8_8_;
  auVar173 = vpinsrd_avx(ZEXT416(0xffe30015),0xffe30015,1);
  auVar173 = vpinsrd_avx(auVar173,0xffe30015,2);
  auVar173 = vpinsrd_avx(auVar173,0xffe30015,3);
  auVar174 = vpinsrd_avx(ZEXT416(0xffe30015),0xffe30015,1);
  auVar174 = vpinsrd_avx(auVar174,0xffe30015,2);
  auVar174 = vpinsrd_avx(auVar174,0xffe30015,3);
  uStack_470 = auVar174._0_8_;
  uStack_468 = auVar174._8_8_;
  auVar174 = vpinsrd_avx(ZEXT416(0xffd80023),0xffd80023,1);
  auVar174 = vpinsrd_avx(auVar174,0xffd80023,2);
  auVar174 = vpinsrd_avx(auVar174,0xffd80023,3);
  auVar175 = vpinsrd_avx(ZEXT416(0xffd80023),0xffd80023,1);
  auVar175 = vpinsrd_avx(auVar175,0xffd80023,2);
  auVar175 = vpinsrd_avx(auVar175,0xffd80023,3);
  uStack_430 = auVar175._0_8_;
  uStack_428 = auVar175._8_8_;
  auVar175 = vpinsrd_avx(ZEXT416(0x26002c),0x26002c,1);
  auVar175 = vpinsrd_avx(auVar175,0x26002c,2);
  auVar175 = vpinsrd_avx(auVar175,0x26002c,3);
  auVar176 = vpinsrd_avx(ZEXT416(0x26002c),0x26002c,1);
  auVar176 = vpinsrd_avx(auVar176,0x26002c,2);
  auVar176 = vpinsrd_avx(auVar176,0x26002c,3);
  uStack_3f0 = auVar176._0_8_;
  uStack_3e8 = auVar176._8_8_;
  auVar176 = vpinsrd_avx(ZEXT416(0x90019),0x90019,1);
  auVar176 = vpinsrd_avx(auVar176,0x90019,2);
  auVar176 = vpinsrd_avx(auVar176,0x90019,3);
  auVar177 = vpinsrd_avx(ZEXT416(0x90019),0x90019,1);
  auVar177 = vpinsrd_avx(auVar177,0x90019,2);
  auVar177 = vpinsrd_avx(auVar177,0x90019,3);
  uStack_3b0 = auVar177._0_8_;
  uStack_3a8 = auVar177._8_8_;
  auVar177 = vpinsrd_avx(ZEXT416(0xfff70026),0xfff70026,1);
  auVar177 = vpinsrd_avx(auVar177,0xfff70026,2);
  auVar177 = vpinsrd_avx(auVar177,0xfff70026,3);
  auVar178 = vpinsrd_avx(ZEXT416(0xfff70026),0xfff70026,1);
  auVar178 = vpinsrd_avx(auVar178,0xfff70026,2);
  auVar178 = vpinsrd_avx(auVar178,0xfff70026,3);
  uStack_370 = auVar178._0_8_;
  uStack_368 = auVar178._8_8_;
  auVar178 = vpinsrd_avx(ZEXT416(0xffe7ffd4),0xffe7ffd4,1);
  auVar178 = vpinsrd_avx(auVar178,0xffe7ffd4,2);
  auVar178 = vpinsrd_avx(auVar178,0xffe7ffd4,3);
  auVar179 = vpinsrd_avx(ZEXT416(0xffe7ffd4),0xffe7ffd4,1);
  auVar179 = vpinsrd_avx(auVar179,0xffe7ffd4,2);
  auVar179 = vpinsrd_avx(auVar179,0xffe7ffd4,3);
  uStack_330 = auVar179._0_8_;
  uStack_328 = auVar179._8_8_;
  auVar179 = vpinsrd_avx(ZEXT416(0xffd40019),0xffd40019,1);
  auVar179 = vpinsrd_avx(auVar179,0xffd40019,2);
  auVar179 = vpinsrd_avx(auVar179,0xffd40019,3);
  auVar180 = vpinsrd_avx(ZEXT416(0xffd40019),0xffd40019,1);
  auVar180 = vpinsrd_avx(auVar180,0xffd40019,2);
  auVar180 = vpinsrd_avx(auVar180,0xffd40019,3);
  uStack_2f0 = auVar180._0_8_;
  uStack_2e8 = auVar180._8_8_;
  auVar180 = vpinsrd_avx(ZEXT416(0x260009),0x260009,1);
  auVar180 = vpinsrd_avx(auVar180,0x260009,2);
  auVar180 = vpinsrd_avx(auVar180,0x260009,3);
  auVar181 = vpinsrd_avx(ZEXT416(0x260009),0x260009,1);
  auVar181 = vpinsrd_avx(auVar181,0x260009,2);
  auVar181 = vpinsrd_avx(auVar181,0x260009,3);
  uStack_2b0 = auVar181._0_8_;
  uStack_2a8 = auVar181._8_8_;
  auVar181 = vpinsrd_avx(ZEXT416(0xffe70009),0xffe70009,1);
  auVar181 = vpinsrd_avx(auVar181,0xffe70009,2);
  auVar181 = vpinsrd_avx(auVar181,0xffe70009,3);
  auVar182 = vpinsrd_avx(ZEXT416(0xffe70009),0xffe70009,1);
  auVar182 = vpinsrd_avx(auVar182,0xffe70009,2);
  auVar182 = vpinsrd_avx(auVar182,0xffe70009,3);
  uStack_270 = auVar182._0_8_;
  uStack_268 = auVar182._8_8_;
  auVar182 = vpinsrd_avx(ZEXT416(0xffd40026),0xffd40026,1);
  auVar182 = vpinsrd_avx(auVar182,0xffd40026,2);
  auVar182 = vpinsrd_avx(auVar182,0xffd40026,3);
  auVar183 = vpinsrd_avx(ZEXT416(0xffd40026),0xffd40026,1);
  auVar183 = vpinsrd_avx(auVar183,0xffd40026,2);
  auVar183 = vpinsrd_avx(auVar183,0xffd40026,3);
  uStack_230 = auVar183._0_8_;
  uStack_228 = auVar183._8_8_;
  auVar183 = vpinsrd_avx(ZEXT416(0x11002a),0x11002a,1);
  auVar183 = vpinsrd_avx(auVar183,0x11002a,2);
  auVar183 = vpinsrd_avx(auVar183,0x11002a,3);
  auVar184 = vpinsrd_avx(ZEXT416(0x11002a),0x11002a,1);
  auVar184 = vpinsrd_avx(auVar184,0x11002a,2);
  auVar184 = vpinsrd_avx(auVar184,0x11002a,3);
  uStack_1f0 = auVar184._0_8_;
  uStack_1e8 = auVar184._8_8_;
  auVar184 = vpinsrd_avx(ZEXT416(0xffd60011),0xffd60011,1);
  auVar184 = vpinsrd_avx(auVar184,0xffd60011,2);
  auVar184 = vpinsrd_avx(auVar184,0xffd60011,3);
  auVar185 = vpinsrd_avx(ZEXT416(0xffd60011),0xffd60011,1);
  auVar185 = vpinsrd_avx(auVar185,0xffd60011,2);
  auVar185 = vpinsrd_avx(auVar185,0xffd60011,3);
  uStack_1b0 = auVar185._0_8_;
  uStack_1a8 = auVar185._8_8_;
  auVar185 = vpinsrd_avx(ZEXT416(0x200020),0x200020,1);
  auVar185 = vpinsrd_avx(auVar185,0x200020,2);
  auVar185 = vpinsrd_avx(auVar185,0x200020,3);
  auVar186 = vpinsrd_avx(ZEXT416(0x200020),0x200020,1);
  auVar186 = vpinsrd_avx(auVar186,0x200020,2);
  auVar186 = vpinsrd_avx(auVar186,0x200020,3);
  uStack_170 = auVar186._0_8_;
  uStack_168 = auVar186._8_8_;
  auVar186 = vpinsrd_avx(ZEXT416(0xffe00020),0xffe00020,1);
  auVar186 = vpinsrd_avx(auVar186,0xffe00020,2);
  auVar186 = vpinsrd_avx(auVar186,0xffe00020,3);
  auVar596 = vpinsrd_avx(ZEXT416(0xffe00020),0xffe00020,1);
  auVar596 = vpinsrd_avx(auVar596,0xffe00020,2);
  auVar596 = vpinsrd_avx(auVar596,0xffe00020,3);
  uStack_130 = auVar596._0_8_;
  uStack_128 = auVar596._8_8_;
  local_b970 = (char)in_R8D;
  uVar592 = 1 << (local_b970 - 1U & 0x1f);
  auVar596 = vpinsrd_avx(ZEXT416(uVar592),uVar592,1);
  auVar596 = vpinsrd_avx(auVar596,uVar592,2);
  auVar596 = vpinsrd_avx(auVar596,uVar592,3);
  auVar594 = vpinsrd_avx(ZEXT416(uVar592),uVar592,1);
  auVar594 = vpinsrd_avx(auVar594,uVar592,2);
  auVar594 = vpinsrd_avx(auVar594,uVar592,3);
  auVar594 = ZEXT116(0) * auVar596 + ZEXT116(1) * auVar594;
  auVar596 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar596;
  uStack_f0 = auVar596._0_8_;
  uStack_e8 = auVar596._8_8_;
  local_b968 = in_RDX;
  for (local_d7e4 = 0; local_d7e4 < in_ECX; local_d7e4 = local_d7e4 + 8) {
    pauVar1 = (undefined1 (*) [16])(in_RDI + (long)(in_ESI + local_d7e4) * 2);
    pauVar2 = (undefined1 (*) [16])(in_RDI + (long)(in_ESI * 3 + local_d7e4) * 2);
    pauVar3 = (undefined1 (*) [16])(in_RDI + (long)(in_ESI * 5 + local_d7e4) * 2);
    pauVar4 = (undefined1 (*) [16])(in_RDI + (long)(in_ESI * 7 + local_d7e4) * 2);
    pauVar5 = (undefined1 (*) [16])(in_RDI + (long)(in_ESI * 9 + local_d7e4) * 2);
    pauVar6 = (undefined1 (*) [16])(in_RDI + (long)(in_ESI * 0xb + local_d7e4) * 2);
    pauVar7 = (undefined1 (*) [16])(in_RDI + (long)(in_ESI * 0xd + local_d7e4) * 2);
    pauVar8 = (undefined1 (*) [16])(in_RDI + (long)(in_ESI * 0xf + local_d7e4) * 2);
    pauVar9 = (undefined1 (*) [16])(in_RDI + (long)(in_ESI * 0x11 + local_d7e4) * 2);
    pauVar10 = (undefined1 (*) [16])(in_RDI + (long)(in_ESI * 0x13 + local_d7e4) * 2);
    pauVar11 = (undefined1 (*) [16])(in_RDI + (long)(in_ESI * 0x15 + local_d7e4) * 2);
    pauVar12 = (undefined1 (*) [16])(in_RDI + (long)(in_ESI * 0x17 + local_d7e4) * 2);
    pauVar13 = (undefined1 (*) [16])(in_RDI + (long)(in_ESI * 0x19 + local_d7e4) * 2);
    pauVar14 = (undefined1 (*) [16])(in_RDI + (long)(in_ESI * 0x1b + local_d7e4) * 2);
    pauVar15 = (undefined1 (*) [16])(in_RDI + (long)(in_ESI * 0x1d + local_d7e4) * 2);
    pauVar16 = (undefined1 (*) [16])(in_RDI + (long)(in_ESI * 0x1f + local_d7e4) * 2);
    auVar192 = vpunpcklwd_avx(*pauVar1,*pauVar2);
    auVar193 = vpunpcklwd_avx(*pauVar3,*pauVar4);
    auVar194 = vpunpcklwd_avx(*pauVar5,*pauVar6);
    auVar195 = vpunpcklwd_avx(*pauVar7,*pauVar8);
    auVar196 = vpunpcklwd_avx(*pauVar9,*pauVar10);
    auVar197 = vpunpcklwd_avx(*pauVar11,*pauVar12);
    auVar198 = vpunpcklwd_avx(*pauVar13,*pauVar14);
    auVar199 = vpunpcklwd_avx(*pauVar15,*pauVar16);
    auVar596 = vpunpckhwd_avx(*pauVar1,*pauVar2);
    auVar597 = vpunpckhwd_avx(*pauVar3,*pauVar4);
    auVar595 = vpunpckhwd_avx(*pauVar5,*pauVar6);
    auVar187 = vpunpckhwd_avx(*pauVar7,*pauVar8);
    auVar188 = vpunpckhwd_avx(*pauVar9,*pauVar10);
    auVar189 = vpunpckhwd_avx(*pauVar11,*pauVar12);
    auVar190 = vpunpckhwd_avx(*pauVar13,*pauVar14);
    auVar191 = vpunpckhwd_avx(*pauVar15,*pauVar16);
    local_d170 = auVar596._0_8_;
    uStack_d168 = auVar596._8_8_;
    local_d180 = auVar597._0_8_;
    uStack_d178 = auVar597._8_8_;
    local_d190 = auVar595._0_8_;
    uStack_d188 = auVar595._8_8_;
    local_d1a0 = auVar187._0_8_;
    uStack_d198 = auVar187._8_8_;
    local_d1b0 = auVar188._0_8_;
    uStack_d1a8 = auVar188._8_8_;
    local_d1c0 = auVar189._0_8_;
    uStack_d1b8 = auVar189._8_8_;
    local_d1d0 = auVar190._0_8_;
    uStack_d1c8 = auVar190._8_8_;
    local_d1e0 = auVar191._0_8_;
    uStack_d1d8 = auVar191._8_8_;
    auVar543._16_8_ = local_d170;
    auVar543._0_16_ = auVar192;
    auVar543._24_8_ = uStack_d168;
    auVar208._16_8_ = uStack_2b70;
    auVar208._0_16_ = auVar17;
    auVar208._24_8_ = uStack_2b68;
    auVar208 = vpmaddwd_avx2(auVar543,auVar208);
    auVar542._16_8_ = local_d180;
    auVar542._0_16_ = auVar193;
    auVar542._24_8_ = uStack_d178;
    auVar541._16_8_ = uStack_2b30;
    auVar541._0_16_ = auVar18;
    auVar541._24_8_ = uStack_2b28;
    auVar209 = vpmaddwd_avx2(auVar542,auVar541);
    auVar540._16_8_ = local_d190;
    auVar540._0_16_ = auVar194;
    auVar540._24_8_ = uStack_d188;
    auVar539._16_8_ = uStack_2af0;
    auVar539._0_16_ = auVar19;
    auVar539._24_8_ = uStack_2ae8;
    auVar210 = vpmaddwd_avx2(auVar540,auVar539);
    auVar538._16_8_ = local_d1a0;
    auVar538._0_16_ = auVar195;
    auVar538._24_8_ = uStack_d198;
    auVar537._16_8_ = uStack_2ab0;
    auVar537._0_16_ = auVar20;
    auVar537._24_8_ = uStack_2aa8;
    auVar211 = vpmaddwd_avx2(auVar538,auVar537);
    auVar536._16_8_ = local_d1b0;
    auVar536._0_16_ = auVar196;
    auVar536._24_8_ = uStack_d1a8;
    auVar535._16_8_ = uStack_2a70;
    auVar535._0_16_ = auVar21;
    auVar535._24_8_ = uStack_2a68;
    auVar212 = vpmaddwd_avx2(auVar536,auVar535);
    auVar534._16_8_ = local_d1c0;
    auVar534._0_16_ = auVar197;
    auVar534._24_8_ = uStack_d1b8;
    auVar533._16_8_ = uStack_2a30;
    auVar533._0_16_ = auVar22;
    auVar533._24_8_ = uStack_2a28;
    auVar213 = vpmaddwd_avx2(auVar534,auVar533);
    auVar532._16_8_ = local_d1d0;
    auVar532._0_16_ = auVar198;
    auVar532._24_8_ = uStack_d1c8;
    auVar531._16_8_ = uStack_29f0;
    auVar531._0_16_ = auVar23;
    auVar531._24_8_ = uStack_29e8;
    auVar214 = vpmaddwd_avx2(auVar532,auVar531);
    auVar530._16_8_ = local_d1e0;
    auVar530._0_16_ = auVar199;
    auVar530._24_8_ = uStack_d1d8;
    auVar529._16_8_ = uStack_29b0;
    auVar529._0_16_ = auVar24;
    auVar529._24_8_ = uStack_29a8;
    auVar215 = vpmaddwd_avx2(auVar530,auVar529);
    auVar208 = vpaddd_avx2(auVar208,auVar209);
    auVar209 = vpaddd_avx2(auVar210,auVar211);
    auVar210 = vpaddd_avx2(auVar212,auVar213);
    auVar211 = vpaddd_avx2(auVar214,auVar215);
    auVar208 = vpaddd_avx2(auVar208,auVar209);
    auVar209 = vpaddd_avx2(auVar210,auVar211);
    auVar208 = vpaddd_avx2(auVar208,auVar209);
    auVar528._16_8_ = local_d170;
    auVar528._0_16_ = auVar192;
    auVar528._24_8_ = uStack_d168;
    auVar209._16_8_ = uStack_2970;
    auVar209._0_16_ = auVar25;
    auVar209._24_8_ = uStack_2968;
    auVar209 = vpmaddwd_avx2(auVar528,auVar209);
    auVar527._16_8_ = local_d180;
    auVar527._0_16_ = auVar193;
    auVar527._24_8_ = uStack_d178;
    auVar526._16_8_ = uStack_2930;
    auVar526._0_16_ = auVar26;
    auVar526._24_8_ = uStack_2928;
    auVar210 = vpmaddwd_avx2(auVar527,auVar526);
    auVar525._16_8_ = local_d190;
    auVar525._0_16_ = auVar194;
    auVar525._24_8_ = uStack_d188;
    auVar524._16_8_ = uStack_28f0;
    auVar524._0_16_ = auVar27;
    auVar524._24_8_ = uStack_28e8;
    auVar211 = vpmaddwd_avx2(auVar525,auVar524);
    auVar523._16_8_ = local_d1a0;
    auVar523._0_16_ = auVar195;
    auVar523._24_8_ = uStack_d198;
    auVar522._16_8_ = uStack_28b0;
    auVar522._0_16_ = auVar28;
    auVar522._24_8_ = uStack_28a8;
    auVar212 = vpmaddwd_avx2(auVar523,auVar522);
    auVar521._16_8_ = local_d1b0;
    auVar521._0_16_ = auVar196;
    auVar521._24_8_ = uStack_d1a8;
    auVar520._16_8_ = uStack_2870;
    auVar520._0_16_ = auVar29;
    auVar520._24_8_ = uStack_2868;
    auVar213 = vpmaddwd_avx2(auVar521,auVar520);
    auVar519._16_8_ = local_d1c0;
    auVar519._0_16_ = auVar197;
    auVar519._24_8_ = uStack_d1b8;
    auVar518._16_8_ = uStack_2830;
    auVar518._0_16_ = auVar30;
    auVar518._24_8_ = uStack_2828;
    auVar214 = vpmaddwd_avx2(auVar519,auVar518);
    auVar517._16_8_ = local_d1d0;
    auVar517._0_16_ = auVar198;
    auVar517._24_8_ = uStack_d1c8;
    auVar516._16_8_ = uStack_27f0;
    auVar516._0_16_ = auVar31;
    auVar516._24_8_ = uStack_27e8;
    auVar215 = vpmaddwd_avx2(auVar517,auVar516);
    auVar515._16_8_ = local_d1e0;
    auVar515._0_16_ = auVar199;
    auVar515._24_8_ = uStack_d1d8;
    auVar514._16_8_ = uStack_27b0;
    auVar514._0_16_ = auVar32;
    auVar514._24_8_ = uStack_27a8;
    auVar216 = vpmaddwd_avx2(auVar515,auVar514);
    auVar209 = vpaddd_avx2(auVar209,auVar210);
    auVar210 = vpaddd_avx2(auVar211,auVar212);
    auVar211 = vpaddd_avx2(auVar213,auVar214);
    auVar212 = vpaddd_avx2(auVar215,auVar216);
    auVar209 = vpaddd_avx2(auVar209,auVar210);
    auVar210 = vpaddd_avx2(auVar211,auVar212);
    auVar209 = vpaddd_avx2(auVar209,auVar210);
    auVar513._16_8_ = local_d170;
    auVar513._0_16_ = auVar192;
    auVar513._24_8_ = uStack_d168;
    auVar210._16_8_ = uStack_2770;
    auVar210._0_16_ = auVar33;
    auVar210._24_8_ = uStack_2768;
    auVar210 = vpmaddwd_avx2(auVar513,auVar210);
    auVar512._16_8_ = local_d180;
    auVar512._0_16_ = auVar193;
    auVar512._24_8_ = uStack_d178;
    auVar511._16_8_ = uStack_2730;
    auVar511._0_16_ = auVar34;
    auVar511._24_8_ = uStack_2728;
    auVar211 = vpmaddwd_avx2(auVar512,auVar511);
    auVar510._16_8_ = local_d190;
    auVar510._0_16_ = auVar194;
    auVar510._24_8_ = uStack_d188;
    auVar509._16_8_ = uStack_26f0;
    auVar509._0_16_ = auVar35;
    auVar509._24_8_ = uStack_26e8;
    auVar212 = vpmaddwd_avx2(auVar510,auVar509);
    auVar508._16_8_ = local_d1a0;
    auVar508._0_16_ = auVar195;
    auVar508._24_8_ = uStack_d198;
    auVar507._16_8_ = uStack_26b0;
    auVar507._0_16_ = auVar36;
    auVar507._24_8_ = uStack_26a8;
    auVar213 = vpmaddwd_avx2(auVar508,auVar507);
    auVar506._16_8_ = local_d1b0;
    auVar506._0_16_ = auVar196;
    auVar506._24_8_ = uStack_d1a8;
    auVar505._16_8_ = uStack_2670;
    auVar505._0_16_ = auVar37;
    auVar505._24_8_ = uStack_2668;
    auVar214 = vpmaddwd_avx2(auVar506,auVar505);
    auVar504._16_8_ = local_d1c0;
    auVar504._0_16_ = auVar197;
    auVar504._24_8_ = uStack_d1b8;
    auVar503._16_8_ = uStack_2630;
    auVar503._0_16_ = auVar38;
    auVar503._24_8_ = uStack_2628;
    auVar215 = vpmaddwd_avx2(auVar504,auVar503);
    auVar502._16_8_ = local_d1d0;
    auVar502._0_16_ = auVar198;
    auVar502._24_8_ = uStack_d1c8;
    auVar501._16_8_ = uStack_25f0;
    auVar501._0_16_ = auVar39;
    auVar501._24_8_ = uStack_25e8;
    auVar216 = vpmaddwd_avx2(auVar502,auVar501);
    auVar500._16_8_ = local_d1e0;
    auVar500._0_16_ = auVar199;
    auVar500._24_8_ = uStack_d1d8;
    auVar499._16_8_ = uStack_25b0;
    auVar499._0_16_ = auVar40;
    auVar499._24_8_ = uStack_25a8;
    auVar217 = vpmaddwd_avx2(auVar500,auVar499);
    auVar210 = vpaddd_avx2(auVar210,auVar211);
    auVar211 = vpaddd_avx2(auVar212,auVar213);
    auVar212 = vpaddd_avx2(auVar214,auVar215);
    auVar213 = vpaddd_avx2(auVar216,auVar217);
    auVar210 = vpaddd_avx2(auVar210,auVar211);
    auVar211 = vpaddd_avx2(auVar212,auVar213);
    auVar210 = vpaddd_avx2(auVar210,auVar211);
    auVar498._16_8_ = local_d170;
    auVar498._0_16_ = auVar192;
    auVar498._24_8_ = uStack_d168;
    auVar211._16_8_ = uStack_2570;
    auVar211._0_16_ = auVar41;
    auVar211._24_8_ = uStack_2568;
    auVar211 = vpmaddwd_avx2(auVar498,auVar211);
    auVar497._16_8_ = local_d180;
    auVar497._0_16_ = auVar193;
    auVar497._24_8_ = uStack_d178;
    auVar496._16_8_ = uStack_2530;
    auVar496._0_16_ = auVar42;
    auVar496._24_8_ = uStack_2528;
    auVar212 = vpmaddwd_avx2(auVar497,auVar496);
    auVar495._16_8_ = local_d190;
    auVar495._0_16_ = auVar194;
    auVar495._24_8_ = uStack_d188;
    auVar494._16_8_ = uStack_24f0;
    auVar494._0_16_ = auVar43;
    auVar494._24_8_ = uStack_24e8;
    auVar213 = vpmaddwd_avx2(auVar495,auVar494);
    auVar493._16_8_ = local_d1a0;
    auVar493._0_16_ = auVar195;
    auVar493._24_8_ = uStack_d198;
    auVar492._16_8_ = uStack_24b0;
    auVar492._0_16_ = auVar44;
    auVar492._24_8_ = uStack_24a8;
    auVar214 = vpmaddwd_avx2(auVar493,auVar492);
    auVar491._16_8_ = local_d1b0;
    auVar491._0_16_ = auVar196;
    auVar491._24_8_ = uStack_d1a8;
    auVar490._16_8_ = uStack_2470;
    auVar490._0_16_ = auVar45;
    auVar490._24_8_ = uStack_2468;
    auVar215 = vpmaddwd_avx2(auVar491,auVar490);
    auVar489._16_8_ = local_d1c0;
    auVar489._0_16_ = auVar197;
    auVar489._24_8_ = uStack_d1b8;
    auVar488._16_8_ = uStack_2430;
    auVar488._0_16_ = auVar46;
    auVar488._24_8_ = uStack_2428;
    auVar216 = vpmaddwd_avx2(auVar489,auVar488);
    auVar487._16_8_ = local_d1d0;
    auVar487._0_16_ = auVar198;
    auVar487._24_8_ = uStack_d1c8;
    auVar486._16_8_ = uStack_23f0;
    auVar486._0_16_ = auVar47;
    auVar486._24_8_ = uStack_23e8;
    auVar217 = vpmaddwd_avx2(auVar487,auVar486);
    auVar485._16_8_ = local_d1e0;
    auVar485._0_16_ = auVar199;
    auVar485._24_8_ = uStack_d1d8;
    auVar484._16_8_ = uStack_23b0;
    auVar484._0_16_ = auVar48;
    auVar484._24_8_ = uStack_23a8;
    auVar218 = vpmaddwd_avx2(auVar485,auVar484);
    auVar211 = vpaddd_avx2(auVar211,auVar212);
    auVar212 = vpaddd_avx2(auVar213,auVar214);
    auVar213 = vpaddd_avx2(auVar215,auVar216);
    auVar214 = vpaddd_avx2(auVar217,auVar218);
    auVar211 = vpaddd_avx2(auVar211,auVar212);
    auVar212 = vpaddd_avx2(auVar213,auVar214);
    auVar211 = vpaddd_avx2(auVar211,auVar212);
    auVar483._16_8_ = local_d170;
    auVar483._0_16_ = auVar192;
    auVar483._24_8_ = uStack_d168;
    auVar212._16_8_ = uStack_2370;
    auVar212._0_16_ = auVar49;
    auVar212._24_8_ = uStack_2368;
    auVar212 = vpmaddwd_avx2(auVar483,auVar212);
    auVar482._16_8_ = local_d180;
    auVar482._0_16_ = auVar193;
    auVar482._24_8_ = uStack_d178;
    auVar481._16_8_ = uStack_2330;
    auVar481._0_16_ = auVar50;
    auVar481._24_8_ = uStack_2328;
    auVar213 = vpmaddwd_avx2(auVar482,auVar481);
    auVar480._16_8_ = local_d190;
    auVar480._0_16_ = auVar194;
    auVar480._24_8_ = uStack_d188;
    auVar479._16_8_ = uStack_22f0;
    auVar479._0_16_ = auVar51;
    auVar479._24_8_ = uStack_22e8;
    auVar214 = vpmaddwd_avx2(auVar480,auVar479);
    auVar478._16_8_ = local_d1a0;
    auVar478._0_16_ = auVar195;
    auVar478._24_8_ = uStack_d198;
    auVar477._16_8_ = uStack_22b0;
    auVar477._0_16_ = auVar52;
    auVar477._24_8_ = uStack_22a8;
    auVar215 = vpmaddwd_avx2(auVar478,auVar477);
    auVar476._16_8_ = local_d1b0;
    auVar476._0_16_ = auVar196;
    auVar476._24_8_ = uStack_d1a8;
    auVar475._16_8_ = uStack_2270;
    auVar475._0_16_ = auVar53;
    auVar475._24_8_ = uStack_2268;
    auVar216 = vpmaddwd_avx2(auVar476,auVar475);
    auVar474._16_8_ = local_d1c0;
    auVar474._0_16_ = auVar197;
    auVar474._24_8_ = uStack_d1b8;
    auVar473._16_8_ = uStack_2230;
    auVar473._0_16_ = auVar54;
    auVar473._24_8_ = uStack_2228;
    auVar217 = vpmaddwd_avx2(auVar474,auVar473);
    auVar472._16_8_ = local_d1d0;
    auVar472._0_16_ = auVar198;
    auVar472._24_8_ = uStack_d1c8;
    auVar471._16_8_ = uStack_21f0;
    auVar471._0_16_ = auVar55;
    auVar471._24_8_ = uStack_21e8;
    auVar218 = vpmaddwd_avx2(auVar472,auVar471);
    auVar470._16_8_ = local_d1e0;
    auVar470._0_16_ = auVar199;
    auVar470._24_8_ = uStack_d1d8;
    auVar469._16_8_ = uStack_21b0;
    auVar469._0_16_ = auVar56;
    auVar469._24_8_ = uStack_21a8;
    auVar219 = vpmaddwd_avx2(auVar470,auVar469);
    auVar212 = vpaddd_avx2(auVar212,auVar213);
    auVar213 = vpaddd_avx2(auVar214,auVar215);
    auVar214 = vpaddd_avx2(auVar216,auVar217);
    auVar215 = vpaddd_avx2(auVar218,auVar219);
    auVar212 = vpaddd_avx2(auVar212,auVar213);
    auVar213 = vpaddd_avx2(auVar214,auVar215);
    auVar212 = vpaddd_avx2(auVar212,auVar213);
    auVar468._16_8_ = local_d170;
    auVar468._0_16_ = auVar192;
    auVar468._24_8_ = uStack_d168;
    auVar213._16_8_ = uStack_2170;
    auVar213._0_16_ = auVar57;
    auVar213._24_8_ = uStack_2168;
    auVar213 = vpmaddwd_avx2(auVar468,auVar213);
    auVar467._16_8_ = local_d180;
    auVar467._0_16_ = auVar193;
    auVar467._24_8_ = uStack_d178;
    auVar466._16_8_ = uStack_2130;
    auVar466._0_16_ = auVar58;
    auVar466._24_8_ = uStack_2128;
    auVar214 = vpmaddwd_avx2(auVar467,auVar466);
    auVar465._16_8_ = local_d190;
    auVar465._0_16_ = auVar194;
    auVar465._24_8_ = uStack_d188;
    auVar464._16_8_ = uStack_20f0;
    auVar464._0_16_ = auVar59;
    auVar464._24_8_ = uStack_20e8;
    auVar215 = vpmaddwd_avx2(auVar465,auVar464);
    auVar463._16_8_ = local_d1a0;
    auVar463._0_16_ = auVar195;
    auVar463._24_8_ = uStack_d198;
    auVar462._16_8_ = uStack_20b0;
    auVar462._0_16_ = auVar60;
    auVar462._24_8_ = uStack_20a8;
    auVar216 = vpmaddwd_avx2(auVar463,auVar462);
    auVar461._16_8_ = local_d1b0;
    auVar461._0_16_ = auVar196;
    auVar461._24_8_ = uStack_d1a8;
    auVar460._16_8_ = uStack_2070;
    auVar460._0_16_ = auVar61;
    auVar460._24_8_ = uStack_2068;
    auVar217 = vpmaddwd_avx2(auVar461,auVar460);
    auVar459._16_8_ = local_d1c0;
    auVar459._0_16_ = auVar197;
    auVar459._24_8_ = uStack_d1b8;
    auVar458._16_8_ = uStack_2030;
    auVar458._0_16_ = auVar62;
    auVar458._24_8_ = uStack_2028;
    auVar218 = vpmaddwd_avx2(auVar459,auVar458);
    auVar457._16_8_ = local_d1d0;
    auVar457._0_16_ = auVar198;
    auVar457._24_8_ = uStack_d1c8;
    auVar456._16_8_ = uStack_1ff0;
    auVar456._0_16_ = auVar63;
    auVar456._24_8_ = uStack_1fe8;
    auVar219 = vpmaddwd_avx2(auVar457,auVar456);
    auVar455._16_8_ = local_d1e0;
    auVar455._0_16_ = auVar199;
    auVar455._24_8_ = uStack_d1d8;
    auVar454._16_8_ = uStack_1fb0;
    auVar454._0_16_ = auVar64;
    auVar454._24_8_ = uStack_1fa8;
    auVar220 = vpmaddwd_avx2(auVar455,auVar454);
    auVar213 = vpaddd_avx2(auVar213,auVar214);
    auVar214 = vpaddd_avx2(auVar215,auVar216);
    auVar215 = vpaddd_avx2(auVar217,auVar218);
    auVar216 = vpaddd_avx2(auVar219,auVar220);
    auVar213 = vpaddd_avx2(auVar213,auVar214);
    auVar214 = vpaddd_avx2(auVar215,auVar216);
    auVar213 = vpaddd_avx2(auVar213,auVar214);
    auVar453._16_8_ = local_d170;
    auVar453._0_16_ = auVar192;
    auVar453._24_8_ = uStack_d168;
    auVar214._16_8_ = uStack_1f70;
    auVar214._0_16_ = auVar65;
    auVar214._24_8_ = uStack_1f68;
    auVar214 = vpmaddwd_avx2(auVar453,auVar214);
    auVar452._16_8_ = local_d180;
    auVar452._0_16_ = auVar193;
    auVar452._24_8_ = uStack_d178;
    auVar451._16_8_ = uStack_1f30;
    auVar451._0_16_ = auVar66;
    auVar451._24_8_ = uStack_1f28;
    auVar215 = vpmaddwd_avx2(auVar452,auVar451);
    auVar450._16_8_ = local_d190;
    auVar450._0_16_ = auVar194;
    auVar450._24_8_ = uStack_d188;
    auVar449._16_8_ = uStack_1ef0;
    auVar449._0_16_ = auVar67;
    auVar449._24_8_ = uStack_1ee8;
    auVar216 = vpmaddwd_avx2(auVar450,auVar449);
    auVar448._16_8_ = local_d1a0;
    auVar448._0_16_ = auVar195;
    auVar448._24_8_ = uStack_d198;
    auVar447._16_8_ = uStack_1eb0;
    auVar447._0_16_ = auVar68;
    auVar447._24_8_ = uStack_1ea8;
    auVar217 = vpmaddwd_avx2(auVar448,auVar447);
    auVar446._16_8_ = local_d1b0;
    auVar446._0_16_ = auVar196;
    auVar446._24_8_ = uStack_d1a8;
    auVar445._16_8_ = uStack_1e70;
    auVar445._0_16_ = auVar69;
    auVar445._24_8_ = uStack_1e68;
    auVar218 = vpmaddwd_avx2(auVar446,auVar445);
    auVar444._16_8_ = local_d1c0;
    auVar444._0_16_ = auVar197;
    auVar444._24_8_ = uStack_d1b8;
    auVar443._16_8_ = uStack_1e30;
    auVar443._0_16_ = auVar70;
    auVar443._24_8_ = uStack_1e28;
    auVar219 = vpmaddwd_avx2(auVar444,auVar443);
    auVar442._16_8_ = local_d1d0;
    auVar442._0_16_ = auVar198;
    auVar442._24_8_ = uStack_d1c8;
    auVar441._16_8_ = uStack_1df0;
    auVar441._0_16_ = auVar71;
    auVar441._24_8_ = uStack_1de8;
    auVar220 = vpmaddwd_avx2(auVar442,auVar441);
    auVar440._16_8_ = local_d1e0;
    auVar440._0_16_ = auVar199;
    auVar440._24_8_ = uStack_d1d8;
    auVar439._16_8_ = uStack_1db0;
    auVar439._0_16_ = auVar72;
    auVar439._24_8_ = uStack_1da8;
    auVar221 = vpmaddwd_avx2(auVar440,auVar439);
    auVar214 = vpaddd_avx2(auVar214,auVar215);
    auVar215 = vpaddd_avx2(auVar216,auVar217);
    auVar216 = vpaddd_avx2(auVar218,auVar219);
    auVar217 = vpaddd_avx2(auVar220,auVar221);
    auVar214 = vpaddd_avx2(auVar214,auVar215);
    auVar215 = vpaddd_avx2(auVar216,auVar217);
    auVar214 = vpaddd_avx2(auVar214,auVar215);
    auVar438._16_8_ = local_d170;
    auVar438._0_16_ = auVar192;
    auVar438._24_8_ = uStack_d168;
    auVar215._16_8_ = uStack_1d70;
    auVar215._0_16_ = auVar73;
    auVar215._24_8_ = uStack_1d68;
    auVar215 = vpmaddwd_avx2(auVar438,auVar215);
    auVar437._16_8_ = local_d180;
    auVar437._0_16_ = auVar193;
    auVar437._24_8_ = uStack_d178;
    auVar436._16_8_ = uStack_1d30;
    auVar436._0_16_ = auVar74;
    auVar436._24_8_ = uStack_1d28;
    auVar216 = vpmaddwd_avx2(auVar437,auVar436);
    auVar435._16_8_ = local_d190;
    auVar435._0_16_ = auVar194;
    auVar435._24_8_ = uStack_d188;
    auVar434._16_8_ = uStack_1cf0;
    auVar434._0_16_ = auVar75;
    auVar434._24_8_ = uStack_1ce8;
    auVar217 = vpmaddwd_avx2(auVar435,auVar434);
    auVar433._16_8_ = local_d1a0;
    auVar433._0_16_ = auVar195;
    auVar433._24_8_ = uStack_d198;
    auVar432._16_8_ = uStack_1cb0;
    auVar432._0_16_ = auVar76;
    auVar432._24_8_ = uStack_1ca8;
    auVar218 = vpmaddwd_avx2(auVar433,auVar432);
    auVar431._16_8_ = local_d1b0;
    auVar431._0_16_ = auVar196;
    auVar431._24_8_ = uStack_d1a8;
    auVar430._16_8_ = uStack_1c70;
    auVar430._0_16_ = auVar77;
    auVar430._24_8_ = uStack_1c68;
    auVar219 = vpmaddwd_avx2(auVar431,auVar430);
    auVar429._16_8_ = local_d1c0;
    auVar429._0_16_ = auVar197;
    auVar429._24_8_ = uStack_d1b8;
    auVar428._16_8_ = uStack_1c30;
    auVar428._0_16_ = auVar78;
    auVar428._24_8_ = uStack_1c28;
    auVar220 = vpmaddwd_avx2(auVar429,auVar428);
    auVar427._16_8_ = local_d1d0;
    auVar427._0_16_ = auVar198;
    auVar427._24_8_ = uStack_d1c8;
    auVar426._16_8_ = uStack_1bf0;
    auVar426._0_16_ = auVar79;
    auVar426._24_8_ = uStack_1be8;
    auVar221 = vpmaddwd_avx2(auVar427,auVar426);
    auVar425._16_8_ = local_d1e0;
    auVar425._0_16_ = auVar199;
    auVar425._24_8_ = uStack_d1d8;
    auVar424._16_8_ = uStack_1bb0;
    auVar424._0_16_ = auVar80;
    auVar424._24_8_ = uStack_1ba8;
    auVar222 = vpmaddwd_avx2(auVar425,auVar424);
    auVar215 = vpaddd_avx2(auVar215,auVar216);
    auVar216 = vpaddd_avx2(auVar217,auVar218);
    auVar217 = vpaddd_avx2(auVar219,auVar220);
    auVar218 = vpaddd_avx2(auVar221,auVar222);
    auVar215 = vpaddd_avx2(auVar215,auVar216);
    auVar216 = vpaddd_avx2(auVar217,auVar218);
    auVar215 = vpaddd_avx2(auVar215,auVar216);
    auVar423._16_8_ = local_d170;
    auVar423._0_16_ = auVar192;
    auVar423._24_8_ = uStack_d168;
    auVar216._16_8_ = uStack_1b70;
    auVar216._0_16_ = auVar81;
    auVar216._24_8_ = uStack_1b68;
    auVar216 = vpmaddwd_avx2(auVar423,auVar216);
    auVar422._16_8_ = local_d180;
    auVar422._0_16_ = auVar193;
    auVar422._24_8_ = uStack_d178;
    auVar421._16_8_ = uStack_1b30;
    auVar421._0_16_ = auVar82;
    auVar421._24_8_ = uStack_1b28;
    auVar217 = vpmaddwd_avx2(auVar422,auVar421);
    auVar420._16_8_ = local_d190;
    auVar420._0_16_ = auVar194;
    auVar420._24_8_ = uStack_d188;
    auVar419._16_8_ = uStack_1af0;
    auVar419._0_16_ = auVar83;
    auVar419._24_8_ = uStack_1ae8;
    auVar218 = vpmaddwd_avx2(auVar420,auVar419);
    auVar418._16_8_ = local_d1a0;
    auVar418._0_16_ = auVar195;
    auVar418._24_8_ = uStack_d198;
    auVar417._16_8_ = uStack_1ab0;
    auVar417._0_16_ = auVar84;
    auVar417._24_8_ = uStack_1aa8;
    auVar219 = vpmaddwd_avx2(auVar418,auVar417);
    auVar416._16_8_ = local_d1b0;
    auVar416._0_16_ = auVar196;
    auVar416._24_8_ = uStack_d1a8;
    auVar415._16_8_ = uStack_1a70;
    auVar415._0_16_ = auVar85;
    auVar415._24_8_ = uStack_1a68;
    auVar220 = vpmaddwd_avx2(auVar416,auVar415);
    auVar414._16_8_ = local_d1c0;
    auVar414._0_16_ = auVar197;
    auVar414._24_8_ = uStack_d1b8;
    auVar413._16_8_ = uStack_1a30;
    auVar413._0_16_ = auVar86;
    auVar413._24_8_ = uStack_1a28;
    auVar221 = vpmaddwd_avx2(auVar414,auVar413);
    auVar412._16_8_ = local_d1d0;
    auVar412._0_16_ = auVar198;
    auVar412._24_8_ = uStack_d1c8;
    auVar411._16_8_ = uStack_19f0;
    auVar411._0_16_ = auVar87;
    auVar411._24_8_ = uStack_19e8;
    auVar222 = vpmaddwd_avx2(auVar412,auVar411);
    auVar410._16_8_ = local_d1e0;
    auVar410._0_16_ = auVar199;
    auVar410._24_8_ = uStack_d1d8;
    auVar409._16_8_ = uStack_19b0;
    auVar409._0_16_ = auVar88;
    auVar409._24_8_ = uStack_19a8;
    auVar223 = vpmaddwd_avx2(auVar410,auVar409);
    auVar216 = vpaddd_avx2(auVar216,auVar217);
    auVar217 = vpaddd_avx2(auVar218,auVar219);
    auVar218 = vpaddd_avx2(auVar220,auVar221);
    auVar219 = vpaddd_avx2(auVar222,auVar223);
    auVar216 = vpaddd_avx2(auVar216,auVar217);
    auVar217 = vpaddd_avx2(auVar218,auVar219);
    auVar216 = vpaddd_avx2(auVar216,auVar217);
    auVar408._16_8_ = local_d170;
    auVar408._0_16_ = auVar192;
    auVar408._24_8_ = uStack_d168;
    auVar217._16_8_ = uStack_1970;
    auVar217._0_16_ = auVar89;
    auVar217._24_8_ = uStack_1968;
    auVar217 = vpmaddwd_avx2(auVar408,auVar217);
    auVar407._16_8_ = local_d180;
    auVar407._0_16_ = auVar193;
    auVar407._24_8_ = uStack_d178;
    auVar406._16_8_ = uStack_1930;
    auVar406._0_16_ = auVar90;
    auVar406._24_8_ = uStack_1928;
    auVar218 = vpmaddwd_avx2(auVar407,auVar406);
    auVar405._16_8_ = local_d190;
    auVar405._0_16_ = auVar194;
    auVar405._24_8_ = uStack_d188;
    auVar404._16_8_ = uStack_18f0;
    auVar404._0_16_ = auVar91;
    auVar404._24_8_ = uStack_18e8;
    auVar219 = vpmaddwd_avx2(auVar405,auVar404);
    auVar403._16_8_ = local_d1a0;
    auVar403._0_16_ = auVar195;
    auVar403._24_8_ = uStack_d198;
    auVar402._16_8_ = uStack_18b0;
    auVar402._0_16_ = auVar92;
    auVar402._24_8_ = uStack_18a8;
    auVar220 = vpmaddwd_avx2(auVar403,auVar402);
    auVar401._16_8_ = local_d1b0;
    auVar401._0_16_ = auVar196;
    auVar401._24_8_ = uStack_d1a8;
    auVar400._16_8_ = uStack_1870;
    auVar400._0_16_ = auVar93;
    auVar400._24_8_ = uStack_1868;
    auVar221 = vpmaddwd_avx2(auVar401,auVar400);
    auVar399._16_8_ = local_d1c0;
    auVar399._0_16_ = auVar197;
    auVar399._24_8_ = uStack_d1b8;
    auVar398._16_8_ = uStack_1830;
    auVar398._0_16_ = auVar94;
    auVar398._24_8_ = uStack_1828;
    auVar222 = vpmaddwd_avx2(auVar399,auVar398);
    auVar397._16_8_ = local_d1d0;
    auVar397._0_16_ = auVar198;
    auVar397._24_8_ = uStack_d1c8;
    auVar396._16_8_ = uStack_17f0;
    auVar396._0_16_ = auVar95;
    auVar396._24_8_ = uStack_17e8;
    auVar223 = vpmaddwd_avx2(auVar397,auVar396);
    auVar395._16_8_ = local_d1e0;
    auVar395._0_16_ = auVar199;
    auVar395._24_8_ = uStack_d1d8;
    auVar394._16_8_ = uStack_17b0;
    auVar394._0_16_ = auVar96;
    auVar394._24_8_ = uStack_17a8;
    auVar224 = vpmaddwd_avx2(auVar395,auVar394);
    auVar217 = vpaddd_avx2(auVar217,auVar218);
    auVar218 = vpaddd_avx2(auVar219,auVar220);
    auVar219 = vpaddd_avx2(auVar221,auVar222);
    auVar220 = vpaddd_avx2(auVar223,auVar224);
    auVar217 = vpaddd_avx2(auVar217,auVar218);
    auVar218 = vpaddd_avx2(auVar219,auVar220);
    auVar217 = vpaddd_avx2(auVar217,auVar218);
    auVar393._16_8_ = local_d170;
    auVar393._0_16_ = auVar192;
    auVar393._24_8_ = uStack_d168;
    auVar218._16_8_ = uStack_1770;
    auVar218._0_16_ = auVar97;
    auVar218._24_8_ = uStack_1768;
    auVar218 = vpmaddwd_avx2(auVar393,auVar218);
    auVar392._16_8_ = local_d180;
    auVar392._0_16_ = auVar193;
    auVar392._24_8_ = uStack_d178;
    auVar391._16_8_ = uStack_1730;
    auVar391._0_16_ = auVar98;
    auVar391._24_8_ = uStack_1728;
    auVar219 = vpmaddwd_avx2(auVar392,auVar391);
    auVar390._16_8_ = local_d190;
    auVar390._0_16_ = auVar194;
    auVar390._24_8_ = uStack_d188;
    auVar389._16_8_ = uStack_16f0;
    auVar389._0_16_ = auVar99;
    auVar389._24_8_ = uStack_16e8;
    auVar220 = vpmaddwd_avx2(auVar390,auVar389);
    auVar388._16_8_ = local_d1a0;
    auVar388._0_16_ = auVar195;
    auVar388._24_8_ = uStack_d198;
    auVar387._16_8_ = uStack_16b0;
    auVar387._0_16_ = auVar100;
    auVar387._24_8_ = uStack_16a8;
    auVar221 = vpmaddwd_avx2(auVar388,auVar387);
    auVar386._16_8_ = local_d1b0;
    auVar386._0_16_ = auVar196;
    auVar386._24_8_ = uStack_d1a8;
    auVar385._16_8_ = uStack_1670;
    auVar385._0_16_ = auVar101;
    auVar385._24_8_ = uStack_1668;
    auVar222 = vpmaddwd_avx2(auVar386,auVar385);
    auVar384._16_8_ = local_d1c0;
    auVar384._0_16_ = auVar197;
    auVar384._24_8_ = uStack_d1b8;
    auVar383._16_8_ = uStack_1630;
    auVar383._0_16_ = auVar102;
    auVar383._24_8_ = uStack_1628;
    auVar223 = vpmaddwd_avx2(auVar384,auVar383);
    auVar382._16_8_ = local_d1d0;
    auVar382._0_16_ = auVar198;
    auVar382._24_8_ = uStack_d1c8;
    auVar381._16_8_ = uStack_15f0;
    auVar381._0_16_ = auVar103;
    auVar381._24_8_ = uStack_15e8;
    auVar224 = vpmaddwd_avx2(auVar382,auVar381);
    auVar380._16_8_ = local_d1e0;
    auVar380._0_16_ = auVar199;
    auVar380._24_8_ = uStack_d1d8;
    auVar379._16_8_ = uStack_15b0;
    auVar379._0_16_ = auVar104;
    auVar379._24_8_ = uStack_15a8;
    auVar225 = vpmaddwd_avx2(auVar380,auVar379);
    auVar218 = vpaddd_avx2(auVar218,auVar219);
    auVar219 = vpaddd_avx2(auVar220,auVar221);
    auVar220 = vpaddd_avx2(auVar222,auVar223);
    auVar221 = vpaddd_avx2(auVar224,auVar225);
    auVar218 = vpaddd_avx2(auVar218,auVar219);
    auVar219 = vpaddd_avx2(auVar220,auVar221);
    auVar218 = vpaddd_avx2(auVar218,auVar219);
    auVar378._16_8_ = local_d170;
    auVar378._0_16_ = auVar192;
    auVar378._24_8_ = uStack_d168;
    auVar219._16_8_ = uStack_1570;
    auVar219._0_16_ = auVar105;
    auVar219._24_8_ = uStack_1568;
    auVar219 = vpmaddwd_avx2(auVar378,auVar219);
    auVar377._16_8_ = local_d180;
    auVar377._0_16_ = auVar193;
    auVar377._24_8_ = uStack_d178;
    auVar376._16_8_ = uStack_1530;
    auVar376._0_16_ = auVar106;
    auVar376._24_8_ = uStack_1528;
    auVar220 = vpmaddwd_avx2(auVar377,auVar376);
    auVar375._16_8_ = local_d190;
    auVar375._0_16_ = auVar194;
    auVar375._24_8_ = uStack_d188;
    auVar374._16_8_ = uStack_14f0;
    auVar374._0_16_ = auVar107;
    auVar374._24_8_ = uStack_14e8;
    auVar221 = vpmaddwd_avx2(auVar375,auVar374);
    auVar373._16_8_ = local_d1a0;
    auVar373._0_16_ = auVar195;
    auVar373._24_8_ = uStack_d198;
    auVar372._16_8_ = uStack_14b0;
    auVar372._0_16_ = auVar108;
    auVar372._24_8_ = uStack_14a8;
    auVar222 = vpmaddwd_avx2(auVar373,auVar372);
    auVar371._16_8_ = local_d1b0;
    auVar371._0_16_ = auVar196;
    auVar371._24_8_ = uStack_d1a8;
    auVar370._16_8_ = uStack_1470;
    auVar370._0_16_ = auVar109;
    auVar370._24_8_ = uStack_1468;
    auVar223 = vpmaddwd_avx2(auVar371,auVar370);
    auVar369._16_8_ = local_d1c0;
    auVar369._0_16_ = auVar197;
    auVar369._24_8_ = uStack_d1b8;
    auVar368._16_8_ = uStack_1430;
    auVar368._0_16_ = auVar110;
    auVar368._24_8_ = uStack_1428;
    auVar224 = vpmaddwd_avx2(auVar369,auVar368);
    auVar367._16_8_ = local_d1d0;
    auVar367._0_16_ = auVar198;
    auVar367._24_8_ = uStack_d1c8;
    auVar366._16_8_ = uStack_13f0;
    auVar366._0_16_ = auVar111;
    auVar366._24_8_ = uStack_13e8;
    auVar225 = vpmaddwd_avx2(auVar367,auVar366);
    auVar365._16_8_ = local_d1e0;
    auVar365._0_16_ = auVar199;
    auVar365._24_8_ = uStack_d1d8;
    auVar364._16_8_ = uStack_13b0;
    auVar364._0_16_ = auVar112;
    auVar364._24_8_ = uStack_13a8;
    auVar226 = vpmaddwd_avx2(auVar365,auVar364);
    auVar219 = vpaddd_avx2(auVar219,auVar220);
    auVar220 = vpaddd_avx2(auVar221,auVar222);
    auVar221 = vpaddd_avx2(auVar223,auVar224);
    auVar222 = vpaddd_avx2(auVar225,auVar226);
    auVar219 = vpaddd_avx2(auVar219,auVar220);
    auVar220 = vpaddd_avx2(auVar221,auVar222);
    auVar219 = vpaddd_avx2(auVar219,auVar220);
    auVar363._16_8_ = local_d170;
    auVar363._0_16_ = auVar192;
    auVar363._24_8_ = uStack_d168;
    auVar220._16_8_ = uStack_1370;
    auVar220._0_16_ = auVar113;
    auVar220._24_8_ = uStack_1368;
    auVar220 = vpmaddwd_avx2(auVar363,auVar220);
    auVar362._16_8_ = local_d180;
    auVar362._0_16_ = auVar193;
    auVar362._24_8_ = uStack_d178;
    auVar361._16_8_ = uStack_1330;
    auVar361._0_16_ = auVar114;
    auVar361._24_8_ = uStack_1328;
    auVar221 = vpmaddwd_avx2(auVar362,auVar361);
    auVar360._16_8_ = local_d190;
    auVar360._0_16_ = auVar194;
    auVar360._24_8_ = uStack_d188;
    auVar359._16_8_ = uStack_12f0;
    auVar359._0_16_ = auVar115;
    auVar359._24_8_ = uStack_12e8;
    auVar222 = vpmaddwd_avx2(auVar360,auVar359);
    auVar358._16_8_ = local_d1a0;
    auVar358._0_16_ = auVar195;
    auVar358._24_8_ = uStack_d198;
    auVar357._16_8_ = uStack_12b0;
    auVar357._0_16_ = auVar116;
    auVar357._24_8_ = uStack_12a8;
    auVar223 = vpmaddwd_avx2(auVar358,auVar357);
    auVar356._16_8_ = local_d1b0;
    auVar356._0_16_ = auVar196;
    auVar356._24_8_ = uStack_d1a8;
    auVar355._16_8_ = uStack_1270;
    auVar355._0_16_ = auVar117;
    auVar355._24_8_ = uStack_1268;
    auVar224 = vpmaddwd_avx2(auVar356,auVar355);
    auVar354._16_8_ = local_d1c0;
    auVar354._0_16_ = auVar197;
    auVar354._24_8_ = uStack_d1b8;
    auVar353._16_8_ = uStack_1230;
    auVar353._0_16_ = auVar118;
    auVar353._24_8_ = uStack_1228;
    auVar225 = vpmaddwd_avx2(auVar354,auVar353);
    auVar352._16_8_ = local_d1d0;
    auVar352._0_16_ = auVar198;
    auVar352._24_8_ = uStack_d1c8;
    auVar351._16_8_ = uStack_11f0;
    auVar351._0_16_ = auVar119;
    auVar351._24_8_ = uStack_11e8;
    auVar226 = vpmaddwd_avx2(auVar352,auVar351);
    auVar350._16_8_ = local_d1e0;
    auVar350._0_16_ = auVar199;
    auVar350._24_8_ = uStack_d1d8;
    auVar349._16_8_ = uStack_11b0;
    auVar349._0_16_ = auVar120;
    auVar349._24_8_ = uStack_11a8;
    auVar227 = vpmaddwd_avx2(auVar350,auVar349);
    auVar220 = vpaddd_avx2(auVar220,auVar221);
    auVar221 = vpaddd_avx2(auVar222,auVar223);
    auVar222 = vpaddd_avx2(auVar224,auVar225);
    auVar223 = vpaddd_avx2(auVar226,auVar227);
    auVar220 = vpaddd_avx2(auVar220,auVar221);
    auVar221 = vpaddd_avx2(auVar222,auVar223);
    auVar220 = vpaddd_avx2(auVar220,auVar221);
    auVar348._16_8_ = local_d170;
    auVar348._0_16_ = auVar192;
    auVar348._24_8_ = uStack_d168;
    auVar221._16_8_ = uStack_1170;
    auVar221._0_16_ = auVar121;
    auVar221._24_8_ = uStack_1168;
    auVar221 = vpmaddwd_avx2(auVar348,auVar221);
    auVar347._16_8_ = local_d180;
    auVar347._0_16_ = auVar193;
    auVar347._24_8_ = uStack_d178;
    auVar346._16_8_ = uStack_1130;
    auVar346._0_16_ = auVar122;
    auVar346._24_8_ = uStack_1128;
    auVar222 = vpmaddwd_avx2(auVar347,auVar346);
    auVar345._16_8_ = local_d190;
    auVar345._0_16_ = auVar194;
    auVar345._24_8_ = uStack_d188;
    auVar344._16_8_ = uStack_10f0;
    auVar344._0_16_ = auVar123;
    auVar344._24_8_ = uStack_10e8;
    auVar223 = vpmaddwd_avx2(auVar345,auVar344);
    auVar343._16_8_ = local_d1a0;
    auVar343._0_16_ = auVar195;
    auVar343._24_8_ = uStack_d198;
    auVar342._16_8_ = uStack_10b0;
    auVar342._0_16_ = auVar124;
    auVar342._24_8_ = uStack_10a8;
    auVar224 = vpmaddwd_avx2(auVar343,auVar342);
    auVar341._16_8_ = local_d1b0;
    auVar341._0_16_ = auVar196;
    auVar341._24_8_ = uStack_d1a8;
    auVar340._16_8_ = uStack_1070;
    auVar340._0_16_ = auVar125;
    auVar340._24_8_ = uStack_1068;
    auVar225 = vpmaddwd_avx2(auVar341,auVar340);
    auVar339._16_8_ = local_d1c0;
    auVar339._0_16_ = auVar197;
    auVar339._24_8_ = uStack_d1b8;
    auVar338._16_8_ = uStack_1030;
    auVar338._0_16_ = auVar126;
    auVar338._24_8_ = uStack_1028;
    auVar226 = vpmaddwd_avx2(auVar339,auVar338);
    auVar337._16_8_ = local_d1d0;
    auVar337._0_16_ = auVar198;
    auVar337._24_8_ = uStack_d1c8;
    auVar336._16_8_ = uStack_ff0;
    auVar336._0_16_ = auVar127;
    auVar336._24_8_ = uStack_fe8;
    auVar227 = vpmaddwd_avx2(auVar337,auVar336);
    auVar335._16_8_ = local_d1e0;
    auVar335._0_16_ = auVar199;
    auVar335._24_8_ = uStack_d1d8;
    auVar334._16_8_ = uStack_fb0;
    auVar334._0_16_ = auVar128;
    auVar334._24_8_ = uStack_fa8;
    auVar228 = vpmaddwd_avx2(auVar335,auVar334);
    auVar221 = vpaddd_avx2(auVar221,auVar222);
    auVar222 = vpaddd_avx2(auVar223,auVar224);
    auVar223 = vpaddd_avx2(auVar225,auVar226);
    auVar224 = vpaddd_avx2(auVar227,auVar228);
    auVar221 = vpaddd_avx2(auVar221,auVar222);
    auVar222 = vpaddd_avx2(auVar223,auVar224);
    auVar221 = vpaddd_avx2(auVar221,auVar222);
    auVar333._16_8_ = local_d170;
    auVar333._0_16_ = auVar192;
    auVar333._24_8_ = uStack_d168;
    auVar222._16_8_ = uStack_f70;
    auVar222._0_16_ = auVar129;
    auVar222._24_8_ = uStack_f68;
    auVar222 = vpmaddwd_avx2(auVar333,auVar222);
    auVar332._16_8_ = local_d180;
    auVar332._0_16_ = auVar193;
    auVar332._24_8_ = uStack_d178;
    auVar331._16_8_ = uStack_f30;
    auVar331._0_16_ = auVar130;
    auVar331._24_8_ = uStack_f28;
    auVar223 = vpmaddwd_avx2(auVar332,auVar331);
    auVar330._16_8_ = local_d190;
    auVar330._0_16_ = auVar194;
    auVar330._24_8_ = uStack_d188;
    auVar329._16_8_ = uStack_ef0;
    auVar329._0_16_ = auVar131;
    auVar329._24_8_ = uStack_ee8;
    auVar224 = vpmaddwd_avx2(auVar330,auVar329);
    auVar328._16_8_ = local_d1a0;
    auVar328._0_16_ = auVar195;
    auVar328._24_8_ = uStack_d198;
    auVar327._16_8_ = uStack_eb0;
    auVar327._0_16_ = auVar132;
    auVar327._24_8_ = uStack_ea8;
    auVar225 = vpmaddwd_avx2(auVar328,auVar327);
    auVar326._16_8_ = local_d1b0;
    auVar326._0_16_ = auVar196;
    auVar326._24_8_ = uStack_d1a8;
    auVar325._16_8_ = uStack_e70;
    auVar325._0_16_ = auVar133;
    auVar325._24_8_ = uStack_e68;
    auVar226 = vpmaddwd_avx2(auVar326,auVar325);
    auVar324._16_8_ = local_d1c0;
    auVar324._0_16_ = auVar197;
    auVar324._24_8_ = uStack_d1b8;
    auVar323._16_8_ = uStack_e30;
    auVar323._0_16_ = auVar134;
    auVar323._24_8_ = uStack_e28;
    auVar227 = vpmaddwd_avx2(auVar324,auVar323);
    auVar322._16_8_ = local_d1d0;
    auVar322._0_16_ = auVar198;
    auVar322._24_8_ = uStack_d1c8;
    auVar321._16_8_ = uStack_df0;
    auVar321._0_16_ = auVar135;
    auVar321._24_8_ = uStack_de8;
    auVar228 = vpmaddwd_avx2(auVar322,auVar321);
    auVar320._16_8_ = local_d1e0;
    auVar320._0_16_ = auVar199;
    auVar320._24_8_ = uStack_d1d8;
    auVar319._16_8_ = uStack_db0;
    auVar319._0_16_ = auVar136;
    auVar319._24_8_ = uStack_da8;
    auVar229 = vpmaddwd_avx2(auVar320,auVar319);
    auVar222 = vpaddd_avx2(auVar222,auVar223);
    auVar223 = vpaddd_avx2(auVar224,auVar225);
    auVar224 = vpaddd_avx2(auVar226,auVar227);
    auVar225 = vpaddd_avx2(auVar228,auVar229);
    auVar222 = vpaddd_avx2(auVar222,auVar223);
    auVar223 = vpaddd_avx2(auVar224,auVar225);
    auVar222 = vpaddd_avx2(auVar222,auVar223);
    auVar318._16_8_ = local_d170;
    auVar318._0_16_ = auVar192;
    auVar318._24_8_ = uStack_d168;
    auVar223._16_8_ = uStack_d70;
    auVar223._0_16_ = auVar137;
    auVar223._24_8_ = uStack_d68;
    auVar223 = vpmaddwd_avx2(auVar318,auVar223);
    auVar317._16_8_ = local_d180;
    auVar317._0_16_ = auVar193;
    auVar317._24_8_ = uStack_d178;
    auVar316._16_8_ = uStack_d30;
    auVar316._0_16_ = auVar138;
    auVar316._24_8_ = uStack_d28;
    auVar224 = vpmaddwd_avx2(auVar317,auVar316);
    auVar315._16_8_ = local_d190;
    auVar315._0_16_ = auVar194;
    auVar315._24_8_ = uStack_d188;
    auVar314._16_8_ = uStack_cf0;
    auVar314._0_16_ = auVar139;
    auVar314._24_8_ = uStack_ce8;
    auVar225 = vpmaddwd_avx2(auVar315,auVar314);
    auVar313._16_8_ = local_d1a0;
    auVar313._0_16_ = auVar195;
    auVar313._24_8_ = uStack_d198;
    auVar312._16_8_ = uStack_cb0;
    auVar312._0_16_ = auVar140;
    auVar312._24_8_ = uStack_ca8;
    auVar226 = vpmaddwd_avx2(auVar313,auVar312);
    auVar311._16_8_ = local_d1b0;
    auVar311._0_16_ = auVar196;
    auVar311._24_8_ = uStack_d1a8;
    auVar310._16_8_ = uStack_c70;
    auVar310._0_16_ = auVar141;
    auVar310._24_8_ = uStack_c68;
    auVar227 = vpmaddwd_avx2(auVar311,auVar310);
    auVar309._16_8_ = local_d1c0;
    auVar309._0_16_ = auVar197;
    auVar309._24_8_ = uStack_d1b8;
    auVar308._16_8_ = uStack_c30;
    auVar308._0_16_ = auVar142;
    auVar308._24_8_ = uStack_c28;
    auVar228 = vpmaddwd_avx2(auVar309,auVar308);
    auVar307._16_8_ = local_d1d0;
    auVar307._0_16_ = auVar198;
    auVar307._24_8_ = uStack_d1c8;
    auVar306._16_8_ = uStack_bf0;
    auVar306._0_16_ = auVar143;
    auVar306._24_8_ = uStack_be8;
    auVar229 = vpmaddwd_avx2(auVar307,auVar306);
    auVar305._16_8_ = local_d1e0;
    auVar305._0_16_ = auVar199;
    auVar305._24_8_ = uStack_d1d8;
    auVar304._16_8_ = uStack_bb0;
    auVar304._0_16_ = auVar144;
    auVar304._24_8_ = uStack_ba8;
    auVar230 = vpmaddwd_avx2(auVar305,auVar304);
    auVar223 = vpaddd_avx2(auVar223,auVar224);
    auVar224 = vpaddd_avx2(auVar225,auVar226);
    auVar225 = vpaddd_avx2(auVar227,auVar228);
    auVar226 = vpaddd_avx2(auVar229,auVar230);
    auVar223 = vpaddd_avx2(auVar223,auVar224);
    auVar224 = vpaddd_avx2(auVar225,auVar226);
    auVar223 = vpaddd_avx2(auVar223,auVar224);
    pauVar1 = (undefined1 (*) [16])(in_RDI + (long)local_d7e4 * 2);
    pauVar2 = (undefined1 (*) [16])(in_RDI + (long)(local_d7e4 + in_ESI * 2) * 2);
    pauVar3 = (undefined1 (*) [16])(in_RDI + (long)(local_d7e4 + in_ESI * 4) * 2);
    pauVar4 = (undefined1 (*) [16])(in_RDI + (long)(local_d7e4 + in_ESI * 6) * 2);
    pauVar5 = (undefined1 (*) [16])(in_RDI + (long)(local_d7e4 + in_ESI * 8) * 2);
    pauVar6 = (undefined1 (*) [16])(in_RDI + (long)(local_d7e4 + in_ESI * 10) * 2);
    pauVar7 = (undefined1 (*) [16])(in_RDI + (long)(local_d7e4 + in_ESI * 0xc) * 2);
    pauVar8 = (undefined1 (*) [16])(in_RDI + (long)(in_ESI * 0xe + local_d7e4) * 2);
    pauVar9 = (undefined1 (*) [16])(in_RDI + (long)(in_ESI * 0x10 + local_d7e4) * 2);
    pauVar10 = (undefined1 (*) [16])(in_RDI + (long)(local_d7e4 + in_ESI * 0x12) * 2);
    pauVar11 = (undefined1 (*) [16])(in_RDI + (long)(local_d7e4 + in_ESI * 0x14) * 2);
    pauVar12 = (undefined1 (*) [16])(in_RDI + (long)(in_ESI * 0x16 + local_d7e4) * 2);
    pauVar13 = (undefined1 (*) [16])(in_RDI + (long)(local_d7e4 + in_ESI * 0x18) * 2);
    pauVar14 = (undefined1 (*) [16])(in_RDI + (long)(in_ESI * 0x1a + local_d7e4) * 2);
    pauVar15 = (undefined1 (*) [16])(in_RDI + (long)(in_ESI * 0x1c + local_d7e4) * 2);
    pauVar16 = (undefined1 (*) [16])(in_RDI + (long)(in_ESI * 0x1e + local_d7e4) * 2);
    auVar192 = vpunpcklwd_avx(*pauVar2,*pauVar4);
    auVar193 = vpunpcklwd_avx(*pauVar6,*pauVar8);
    auVar194 = vpunpcklwd_avx(*pauVar10,*pauVar12);
    auVar195 = vpunpcklwd_avx(*pauVar14,*pauVar16);
    auVar196 = vpunpcklwd_avx(*pauVar3,*pauVar7);
    auVar197 = vpunpcklwd_avx(*pauVar11,*pauVar15);
    auVar198 = vpunpcklwd_avx(*pauVar5,*pauVar13);
    auVar199 = vpunpcklwd_avx(*pauVar1,*pauVar9);
    auVar596 = vpunpckhwd_avx(*pauVar2,*pauVar4);
    auVar597 = vpunpckhwd_avx(*pauVar6,*pauVar8);
    auVar595 = vpunpckhwd_avx(*pauVar10,*pauVar12);
    auVar187 = vpunpckhwd_avx(*pauVar14,*pauVar16);
    auVar188 = vpunpckhwd_avx(*pauVar3,*pauVar7);
    auVar189 = vpunpckhwd_avx(*pauVar11,*pauVar15);
    auVar190 = vpunpckhwd_avx(*pauVar5,*pauVar13);
    auVar191 = vpunpckhwd_avx(*pauVar1,*pauVar9);
    local_d170 = auVar596._0_8_;
    uStack_d168 = auVar596._8_8_;
    local_d180 = auVar597._0_8_;
    uStack_d178 = auVar597._8_8_;
    local_d190 = auVar595._0_8_;
    uStack_d188 = auVar595._8_8_;
    local_d1a0 = auVar187._0_8_;
    uStack_d198 = auVar187._8_8_;
    local_d1b0 = auVar188._0_8_;
    uStack_d1a8 = auVar188._8_8_;
    local_d1c0 = auVar189._0_8_;
    uStack_d1b8 = auVar189._8_8_;
    local_d1d0 = auVar190._0_8_;
    uStack_d1c8 = auVar190._8_8_;
    local_d1e0 = auVar191._0_8_;
    uStack_d1d8 = auVar191._8_8_;
    auVar303._16_8_ = local_d170;
    auVar303._0_16_ = auVar192;
    auVar303._24_8_ = uStack_d168;
    auVar224._16_8_ = uStack_25f0;
    auVar224._0_16_ = auVar39;
    auVar224._24_8_ = uStack_25e8;
    auVar224 = vpmaddwd_avx2(auVar303,auVar224);
    auVar302._16_8_ = local_d180;
    auVar302._0_16_ = auVar193;
    auVar302._24_8_ = uStack_d178;
    auVar301._16_8_ = uStack_b70;
    auVar301._0_16_ = auVar145;
    auVar301._24_8_ = uStack_b68;
    auVar225 = vpmaddwd_avx2(auVar302,auVar301);
    auVar300._16_8_ = local_d190;
    auVar300._0_16_ = auVar194;
    auVar300._24_8_ = uStack_d188;
    auVar299._16_8_ = uStack_b30;
    auVar299._0_16_ = auVar146;
    auVar299._24_8_ = uStack_b28;
    auVar226 = vpmaddwd_avx2(auVar300,auVar299);
    auVar298._16_8_ = local_d1a0;
    auVar298._0_16_ = auVar195;
    auVar298._24_8_ = uStack_d198;
    auVar297._16_8_ = uStack_af0;
    auVar297._0_16_ = auVar147;
    auVar297._24_8_ = uStack_ae8;
    auVar227 = vpmaddwd_avx2(auVar298,auVar297);
    auVar224 = vpaddd_avx2(auVar224,auVar225);
    auVar225 = vpaddd_avx2(auVar226,auVar227);
    auVar224 = vpaddd_avx2(auVar224,auVar225);
    auVar296._16_8_ = local_d170;
    auVar296._0_16_ = auVar192;
    auVar296._24_8_ = uStack_d168;
    auVar225._16_8_ = uStack_ab0;
    auVar225._0_16_ = auVar148;
    auVar225._24_8_ = uStack_aa8;
    auVar225 = vpmaddwd_avx2(auVar296,auVar225);
    auVar295._16_8_ = local_d180;
    auVar295._0_16_ = auVar193;
    auVar295._24_8_ = uStack_d178;
    auVar294._16_8_ = uStack_a70;
    auVar294._0_16_ = auVar149;
    auVar294._24_8_ = uStack_a68;
    auVar226 = vpmaddwd_avx2(auVar295,auVar294);
    auVar293._16_8_ = local_d190;
    auVar293._0_16_ = auVar194;
    auVar293._24_8_ = uStack_d188;
    auVar292._16_8_ = uStack_a30;
    auVar292._0_16_ = auVar150;
    auVar292._24_8_ = uStack_a28;
    auVar227 = vpmaddwd_avx2(auVar293,auVar292);
    auVar291._16_8_ = local_d1a0;
    auVar291._0_16_ = auVar195;
    auVar291._24_8_ = uStack_d198;
    auVar290._16_8_ = uStack_9f0;
    auVar290._0_16_ = auVar151;
    auVar290._24_8_ = uStack_9e8;
    auVar228 = vpmaddwd_avx2(auVar291,auVar290);
    auVar225 = vpaddd_avx2(auVar225,auVar226);
    auVar226 = vpaddd_avx2(auVar227,auVar228);
    auVar225 = vpaddd_avx2(auVar225,auVar226);
    auVar289._16_8_ = local_d170;
    auVar289._0_16_ = auVar192;
    auVar289._24_8_ = uStack_d168;
    auVar226._16_8_ = uStack_9b0;
    auVar226._0_16_ = auVar152;
    auVar226._24_8_ = uStack_9a8;
    auVar226 = vpmaddwd_avx2(auVar289,auVar226);
    auVar288._16_8_ = local_d180;
    auVar288._0_16_ = auVar193;
    auVar288._24_8_ = uStack_d178;
    auVar287._16_8_ = uStack_970;
    auVar287._0_16_ = auVar153;
    auVar287._24_8_ = uStack_968;
    auVar227 = vpmaddwd_avx2(auVar288,auVar287);
    auVar286._16_8_ = local_d190;
    auVar286._0_16_ = auVar194;
    auVar286._24_8_ = uStack_d188;
    auVar285._16_8_ = uStack_930;
    auVar285._0_16_ = auVar154;
    auVar285._24_8_ = uStack_928;
    auVar228 = vpmaddwd_avx2(auVar286,auVar285);
    auVar284._16_8_ = local_d1a0;
    auVar284._0_16_ = auVar195;
    auVar284._24_8_ = uStack_d198;
    auVar283._16_8_ = uStack_8f0;
    auVar283._0_16_ = auVar155;
    auVar283._24_8_ = uStack_8e8;
    auVar229 = vpmaddwd_avx2(auVar284,auVar283);
    auVar226 = vpaddd_avx2(auVar226,auVar227);
    auVar227 = vpaddd_avx2(auVar228,auVar229);
    auVar226 = vpaddd_avx2(auVar226,auVar227);
    auVar282._16_8_ = local_d170;
    auVar282._0_16_ = auVar192;
    auVar282._24_8_ = uStack_d168;
    auVar227._16_8_ = uStack_8b0;
    auVar227._0_16_ = auVar156;
    auVar227._24_8_ = uStack_8a8;
    auVar227 = vpmaddwd_avx2(auVar282,auVar227);
    auVar281._16_8_ = local_d180;
    auVar281._0_16_ = auVar193;
    auVar281._24_8_ = uStack_d178;
    auVar280._16_8_ = uStack_870;
    auVar280._0_16_ = auVar157;
    auVar280._24_8_ = uStack_868;
    auVar228 = vpmaddwd_avx2(auVar281,auVar280);
    auVar279._16_8_ = local_d190;
    auVar279._0_16_ = auVar194;
    auVar279._24_8_ = uStack_d188;
    auVar278._16_8_ = uStack_830;
    auVar278._0_16_ = auVar158;
    auVar278._24_8_ = uStack_828;
    auVar229 = vpmaddwd_avx2(auVar279,auVar278);
    auVar277._16_8_ = local_d1a0;
    auVar277._0_16_ = auVar195;
    auVar277._24_8_ = uStack_d198;
    auVar276._16_8_ = uStack_7f0;
    auVar276._0_16_ = auVar159;
    auVar276._24_8_ = uStack_7e8;
    auVar230 = vpmaddwd_avx2(auVar277,auVar276);
    auVar227 = vpaddd_avx2(auVar227,auVar228);
    auVar228 = vpaddd_avx2(auVar229,auVar230);
    auVar227 = vpaddd_avx2(auVar227,auVar228);
    auVar275._16_8_ = local_d170;
    auVar275._0_16_ = auVar192;
    auVar275._24_8_ = uStack_d168;
    auVar228._16_8_ = uStack_7b0;
    auVar228._0_16_ = auVar160;
    auVar228._24_8_ = uStack_7a8;
    auVar228 = vpmaddwd_avx2(auVar275,auVar228);
    auVar274._16_8_ = local_d180;
    auVar274._0_16_ = auVar193;
    auVar274._24_8_ = uStack_d178;
    auVar273._16_8_ = uStack_770;
    auVar273._0_16_ = auVar161;
    auVar273._24_8_ = uStack_768;
    auVar229 = vpmaddwd_avx2(auVar274,auVar273);
    auVar272._16_8_ = local_d190;
    auVar272._0_16_ = auVar194;
    auVar272._24_8_ = uStack_d188;
    auVar271._16_8_ = uStack_730;
    auVar271._0_16_ = auVar162;
    auVar271._24_8_ = uStack_728;
    auVar230 = vpmaddwd_avx2(auVar272,auVar271);
    auVar270._16_8_ = local_d1a0;
    auVar270._0_16_ = auVar195;
    auVar270._24_8_ = uStack_d198;
    auVar269._16_8_ = uStack_6f0;
    auVar269._0_16_ = auVar163;
    auVar269._24_8_ = uStack_6e8;
    auVar231 = vpmaddwd_avx2(auVar270,auVar269);
    auVar228 = vpaddd_avx2(auVar228,auVar229);
    auVar229 = vpaddd_avx2(auVar230,auVar231);
    auVar228 = vpaddd_avx2(auVar228,auVar229);
    auVar268._16_8_ = local_d170;
    auVar268._0_16_ = auVar192;
    auVar268._24_8_ = uStack_d168;
    auVar229._16_8_ = uStack_6b0;
    auVar229._0_16_ = auVar164;
    auVar229._24_8_ = uStack_6a8;
    auVar229 = vpmaddwd_avx2(auVar268,auVar229);
    auVar267._16_8_ = local_d180;
    auVar267._0_16_ = auVar193;
    auVar267._24_8_ = uStack_d178;
    auVar266._16_8_ = uStack_670;
    auVar266._0_16_ = auVar165;
    auVar266._24_8_ = uStack_668;
    auVar230 = vpmaddwd_avx2(auVar267,auVar266);
    auVar265._16_8_ = local_d190;
    auVar265._0_16_ = auVar194;
    auVar265._24_8_ = uStack_d188;
    auVar264._16_8_ = uStack_630;
    auVar264._0_16_ = auVar166;
    auVar264._24_8_ = uStack_628;
    auVar231 = vpmaddwd_avx2(auVar265,auVar264);
    auVar263._16_8_ = local_d1a0;
    auVar263._0_16_ = auVar195;
    auVar263._24_8_ = uStack_d198;
    auVar262._16_8_ = uStack_5f0;
    auVar262._0_16_ = auVar167;
    auVar262._24_8_ = uStack_5e8;
    auVar232 = vpmaddwd_avx2(auVar263,auVar262);
    auVar229 = vpaddd_avx2(auVar229,auVar230);
    auVar230 = vpaddd_avx2(auVar231,auVar232);
    auVar229 = vpaddd_avx2(auVar229,auVar230);
    auVar261._16_8_ = local_d170;
    auVar261._0_16_ = auVar192;
    auVar261._24_8_ = uStack_d168;
    auVar230._16_8_ = uStack_5b0;
    auVar230._0_16_ = auVar168;
    auVar230._24_8_ = uStack_5a8;
    auVar230 = vpmaddwd_avx2(auVar261,auVar230);
    auVar260._16_8_ = local_d180;
    auVar260._0_16_ = auVar193;
    auVar260._24_8_ = uStack_d178;
    auVar259._16_8_ = uStack_570;
    auVar259._0_16_ = auVar169;
    auVar259._24_8_ = uStack_568;
    auVar231 = vpmaddwd_avx2(auVar260,auVar259);
    auVar258._16_8_ = local_d190;
    auVar258._0_16_ = auVar194;
    auVar258._24_8_ = uStack_d188;
    auVar257._16_8_ = uStack_530;
    auVar257._0_16_ = auVar170;
    auVar257._24_8_ = uStack_528;
    auVar232 = vpmaddwd_avx2(auVar258,auVar257);
    auVar256._16_8_ = local_d1a0;
    auVar256._0_16_ = auVar195;
    auVar256._24_8_ = uStack_d198;
    auVar255._16_8_ = uStack_4f0;
    auVar255._0_16_ = auVar171;
    auVar255._24_8_ = uStack_4e8;
    auVar233 = vpmaddwd_avx2(auVar256,auVar255);
    auVar230 = vpaddd_avx2(auVar230,auVar231);
    auVar231 = vpaddd_avx2(auVar232,auVar233);
    auVar230 = vpaddd_avx2(auVar230,auVar231);
    auVar254._16_8_ = local_d170;
    auVar254._0_16_ = auVar192;
    auVar254._24_8_ = uStack_d168;
    auVar231._16_8_ = uStack_4b0;
    auVar231._0_16_ = auVar172;
    auVar231._24_8_ = uStack_4a8;
    auVar231 = vpmaddwd_avx2(auVar254,auVar231);
    auVar253._16_8_ = local_d180;
    auVar253._0_16_ = auVar193;
    auVar253._24_8_ = uStack_d178;
    auVar252._16_8_ = uStack_470;
    auVar252._0_16_ = auVar173;
    auVar252._24_8_ = uStack_468;
    auVar232 = vpmaddwd_avx2(auVar253,auVar252);
    auVar251._16_8_ = local_d190;
    auVar251._0_16_ = auVar194;
    auVar251._24_8_ = uStack_d188;
    auVar250._16_8_ = uStack_430;
    auVar250._0_16_ = auVar174;
    auVar250._24_8_ = uStack_428;
    auVar233 = vpmaddwd_avx2(auVar251,auVar250);
    auVar249._16_8_ = local_d1a0;
    auVar249._0_16_ = auVar195;
    auVar249._24_8_ = uStack_d198;
    auVar248._16_8_ = uStack_1130;
    auVar248._0_16_ = auVar122;
    auVar248._24_8_ = uStack_1128;
    auVar234 = vpmaddwd_avx2(auVar249,auVar248);
    auVar231 = vpaddd_avx2(auVar231,auVar232);
    auVar232 = vpaddd_avx2(auVar233,auVar234);
    auVar231 = vpaddd_avx2(auVar231,auVar232);
    auVar207._16_8_ = local_d1b0;
    auVar207._0_16_ = auVar196;
    auVar207._24_8_ = uStack_d1a8;
    auVar232._16_8_ = uStack_3f0;
    auVar232._0_16_ = auVar175;
    auVar232._24_8_ = uStack_3e8;
    auVar232 = vpmaddwd_avx2(auVar207,auVar232);
    auVar206._16_8_ = local_d1c0;
    auVar206._0_16_ = auVar197;
    auVar206._24_8_ = uStack_d1b8;
    auVar205._16_8_ = uStack_3b0;
    auVar205._0_16_ = auVar176;
    auVar205._24_8_ = uStack_3a8;
    auVar233 = vpmaddwd_avx2(auVar206,auVar205);
    auVar232 = vpaddd_avx2(auVar232,auVar233);
    auVar204._16_8_ = local_d1b0;
    auVar204._0_16_ = auVar196;
    auVar204._24_8_ = uStack_d1a8;
    auVar233._16_8_ = uStack_370;
    auVar233._0_16_ = auVar177;
    auVar233._24_8_ = uStack_368;
    auVar233 = vpmaddwd_avx2(auVar204,auVar233);
    auVar203._16_8_ = local_d1c0;
    auVar203._0_16_ = auVar197;
    auVar203._24_8_ = uStack_d1b8;
    auVar202._16_8_ = uStack_330;
    auVar202._0_16_ = auVar178;
    auVar202._24_8_ = uStack_328;
    auVar234 = vpmaddwd_avx2(auVar203,auVar202);
    auVar233 = vpaddd_avx2(auVar233,auVar234);
    auVar201._16_8_ = local_d1b0;
    auVar201._0_16_ = auVar196;
    auVar201._24_8_ = uStack_d1a8;
    auVar234._16_8_ = uStack_2f0;
    auVar234._0_16_ = auVar179;
    auVar234._24_8_ = uStack_2e8;
    auVar234 = vpmaddwd_avx2(auVar201,auVar234);
    auVar247._16_8_ = local_d1c0;
    auVar247._0_16_ = auVar197;
    auVar247._24_8_ = uStack_d1b8;
    auVar246._16_8_ = uStack_2b0;
    auVar246._0_16_ = auVar180;
    auVar246._24_8_ = uStack_2a8;
    auVar235 = vpmaddwd_avx2(auVar247,auVar246);
    auVar234 = vpaddd_avx2(auVar234,auVar235);
    auVar245._16_8_ = local_d1b0;
    auVar245._0_16_ = auVar196;
    auVar245._24_8_ = uStack_d1a8;
    auVar235._16_8_ = uStack_270;
    auVar235._0_16_ = auVar181;
    auVar235._24_8_ = uStack_268;
    auVar235 = vpmaddwd_avx2(auVar245,auVar235);
    auVar244._16_8_ = local_d1c0;
    auVar244._0_16_ = auVar197;
    auVar244._24_8_ = uStack_d1b8;
    auVar243._16_8_ = uStack_230;
    auVar243._0_16_ = auVar182;
    auVar243._24_8_ = uStack_228;
    auVar236 = vpmaddwd_avx2(auVar244,auVar243);
    auVar235 = vpaddd_avx2(auVar235,auVar236);
    auVar242._16_8_ = local_d1d0;
    auVar242._0_16_ = auVar198;
    auVar242._24_8_ = uStack_d1c8;
    auVar237._16_8_ = uStack_1f0;
    auVar237._0_16_ = auVar183;
    auVar237._24_8_ = uStack_1e8;
    auVar237 = vpmaddwd_avx2(auVar242,auVar237);
    auVar241._16_8_ = local_d1d0;
    auVar241._0_16_ = auVar198;
    auVar241._24_8_ = uStack_d1c8;
    auVar238._16_8_ = uStack_1b0;
    auVar238._0_16_ = auVar184;
    auVar238._24_8_ = uStack_1a8;
    auVar238 = vpmaddwd_avx2(auVar241,auVar238);
    auVar240._16_8_ = local_d1e0;
    auVar240._0_16_ = auVar199;
    auVar240._24_8_ = uStack_d1d8;
    auVar239._16_8_ = uStack_170;
    auVar239._0_16_ = auVar185;
    auVar239._24_8_ = uStack_168;
    auVar239 = vpmaddwd_avx2(auVar240,auVar239);
    auVar200._16_8_ = local_d1e0;
    auVar200._0_16_ = auVar199;
    auVar200._24_8_ = uStack_d1d8;
    auVar236._16_8_ = uStack_130;
    auVar236._0_16_ = auVar186;
    auVar236._24_8_ = uStack_128;
    auVar240 = vpmaddwd_avx2(auVar200,auVar236);
    auVar236 = vpaddd_avx2(auVar239,auVar237);
    auVar200 = vpaddd_avx2(auVar240,auVar238);
    auVar241 = vpsubd_avx2(auVar239,auVar237);
    auVar242 = vpsubd_avx2(auVar240,auVar238);
    auVar237 = vpaddd_avx2(auVar236,auVar232);
    auVar238 = vpaddd_avx2(auVar200,auVar233);
    auVar239 = vpaddd_avx2(auVar242,auVar234);
    auVar240 = vpaddd_avx2(auVar241,auVar235);
    auVar243 = vpsubd_avx2(auVar236,auVar232);
    auVar244 = vpsubd_avx2(auVar200,auVar233);
    auVar245 = vpsubd_avx2(auVar242,auVar234);
    auVar246 = vpsubd_avx2(auVar241,auVar235);
    auVar232 = vpaddd_avx2(auVar237,auVar224);
    auVar233 = vpaddd_avx2(auVar238,auVar225);
    auVar234 = vpaddd_avx2(auVar239,auVar226);
    auVar235 = vpaddd_avx2(auVar240,auVar227);
    auVar236 = vpaddd_avx2(auVar246,auVar228);
    auVar200 = vpaddd_avx2(auVar245,auVar229);
    auVar241 = vpaddd_avx2(auVar244,auVar230);
    auVar242 = vpaddd_avx2(auVar243,auVar231);
    auVar247 = vpsubd_avx2(auVar237,auVar224);
    auVar237 = vpsubd_avx2(auVar238,auVar225);
    auVar238 = vpsubd_avx2(auVar239,auVar226);
    auVar239 = vpsubd_avx2(auVar240,auVar227);
    auVar240 = vpsubd_avx2(auVar246,auVar228);
    auVar245 = vpsubd_avx2(auVar245,auVar229);
    auVar244 = vpsubd_avx2(auVar244,auVar230);
    auVar243 = vpsubd_avx2(auVar243,auVar231);
    auVar559._16_8_ = uStack_f0;
    auVar559._0_16_ = auVar594;
    auVar559._24_8_ = uStack_e8;
    auVar224 = vpaddd_avx2(auVar232,auVar559);
    auVar558._16_8_ = uStack_f0;
    auVar558._0_16_ = auVar594;
    auVar558._24_8_ = uStack_e8;
    auVar225 = vpaddd_avx2(auVar233,auVar558);
    auVar557._16_8_ = uStack_f0;
    auVar557._0_16_ = auVar594;
    auVar557._24_8_ = uStack_e8;
    auVar226 = vpaddd_avx2(auVar234,auVar557);
    auVar556._16_8_ = uStack_f0;
    auVar556._0_16_ = auVar594;
    auVar556._24_8_ = uStack_e8;
    auVar227 = vpaddd_avx2(auVar235,auVar556);
    auVar555._16_8_ = uStack_f0;
    auVar555._0_16_ = auVar594;
    auVar555._24_8_ = uStack_e8;
    auVar228 = vpaddd_avx2(auVar236,auVar555);
    auVar554._16_8_ = uStack_f0;
    auVar554._0_16_ = auVar594;
    auVar554._24_8_ = uStack_e8;
    auVar229 = vpaddd_avx2(auVar200,auVar554);
    auVar553._16_8_ = uStack_f0;
    auVar553._0_16_ = auVar594;
    auVar553._24_8_ = uStack_e8;
    auVar230 = vpaddd_avx2(auVar241,auVar553);
    auVar552._16_8_ = uStack_f0;
    auVar552._0_16_ = auVar594;
    auVar552._24_8_ = uStack_e8;
    auVar231 = vpaddd_avx2(auVar242,auVar552);
    auVar551._16_8_ = uStack_f0;
    auVar551._0_16_ = auVar594;
    auVar551._24_8_ = uStack_e8;
    auVar232 = vpaddd_avx2(auVar243,auVar551);
    auVar550._16_8_ = uStack_f0;
    auVar550._0_16_ = auVar594;
    auVar550._24_8_ = uStack_e8;
    auVar233 = vpaddd_avx2(auVar244,auVar550);
    auVar549._16_8_ = uStack_f0;
    auVar549._0_16_ = auVar594;
    auVar549._24_8_ = uStack_e8;
    auVar234 = vpaddd_avx2(auVar245,auVar549);
    auVar548._16_8_ = uStack_f0;
    auVar548._0_16_ = auVar594;
    auVar548._24_8_ = uStack_e8;
    auVar235 = vpaddd_avx2(auVar240,auVar548);
    auVar547._16_8_ = uStack_f0;
    auVar547._0_16_ = auVar594;
    auVar547._24_8_ = uStack_e8;
    auVar236 = vpaddd_avx2(auVar239,auVar547);
    auVar546._16_8_ = uStack_f0;
    auVar546._0_16_ = auVar594;
    auVar546._24_8_ = uStack_e8;
    auVar200 = vpaddd_avx2(auVar238,auVar546);
    auVar545._16_8_ = uStack_f0;
    auVar545._0_16_ = auVar594;
    auVar545._24_8_ = uStack_e8;
    auVar237 = vpaddd_avx2(auVar237,auVar545);
    auVar544._16_8_ = uStack_f0;
    auVar544._0_16_ = auVar594;
    auVar544._24_8_ = uStack_e8;
    auVar238 = vpaddd_avx2(auVar247,auVar544);
    auVar239 = vpaddd_avx2(auVar224,auVar208);
    auVar240 = vpaddd_avx2(auVar225,auVar209);
    auVar241 = vpaddd_avx2(auVar226,auVar210);
    auVar242 = vpaddd_avx2(auVar227,auVar211);
    auVar243 = vpaddd_avx2(auVar228,auVar212);
    auVar244 = vpaddd_avx2(auVar229,auVar213);
    auVar245 = vpaddd_avx2(auVar230,auVar214);
    auVar246 = vpaddd_avx2(auVar231,auVar215);
    auVar247 = vpaddd_avx2(auVar232,auVar216);
    auVar201 = vpaddd_avx2(auVar233,auVar217);
    auVar202 = vpaddd_avx2(auVar234,auVar218);
    auVar203 = vpaddd_avx2(auVar235,auVar219);
    auVar204 = vpaddd_avx2(auVar236,auVar220);
    auVar205 = vpaddd_avx2(auVar200,auVar221);
    auVar206 = vpaddd_avx2(auVar237,auVar222);
    auVar207 = vpaddd_avx2(auVar238,auVar223);
    auVar248 = vpsubd_avx2(auVar224,auVar208);
    auVar249 = vpsubd_avx2(auVar225,auVar209);
    auVar250 = vpsubd_avx2(auVar226,auVar210);
    auVar251 = vpsubd_avx2(auVar227,auVar211);
    auVar252 = vpsubd_avx2(auVar228,auVar212);
    auVar253 = vpsubd_avx2(auVar229,auVar213);
    auVar254 = vpsubd_avx2(auVar230,auVar214);
    auVar255 = vpsubd_avx2(auVar231,auVar215);
    auVar231 = vpsubd_avx2(auVar232,auVar216);
    auVar230 = vpsubd_avx2(auVar233,auVar217);
    auVar229 = vpsubd_avx2(auVar234,auVar218);
    auVar228 = vpsubd_avx2(auVar235,auVar219);
    auVar227 = vpsubd_avx2(auVar236,auVar220);
    auVar226 = vpsubd_avx2(auVar200,auVar221);
    auVar225 = vpsubd_avx2(auVar237,auVar222);
    auVar224 = vpsubd_avx2(auVar238,auVar223);
    auVar208 = vpsrad_avx2(auVar239,ZEXT416(in_R8D));
    auVar209 = vpsrad_avx2(auVar240,ZEXT416(in_R8D));
    auVar210 = vpsrad_avx2(auVar241,ZEXT416(in_R8D));
    auVar211 = vpsrad_avx2(auVar242,ZEXT416(in_R8D));
    auVar212 = vpsrad_avx2(auVar243,ZEXT416(in_R8D));
    auVar213 = vpsrad_avx2(auVar244,ZEXT416(in_R8D));
    auVar214 = vpsrad_avx2(auVar245,ZEXT416(in_R8D));
    auVar215 = vpsrad_avx2(auVar246,ZEXT416(in_R8D));
    auVar216 = vpsrad_avx2(auVar247,ZEXT416(in_R8D));
    auVar217 = vpsrad_avx2(auVar201,ZEXT416(in_R8D));
    auVar218 = vpsrad_avx2(auVar202,ZEXT416(in_R8D));
    auVar219 = vpsrad_avx2(auVar203,ZEXT416(in_R8D));
    auVar220 = vpsrad_avx2(auVar204,ZEXT416(in_R8D));
    auVar221 = vpsrad_avx2(auVar205,ZEXT416(in_R8D));
    auVar222 = vpsrad_avx2(auVar206,ZEXT416(in_R8D));
    auVar223 = vpsrad_avx2(auVar207,ZEXT416(in_R8D));
    auVar224 = vpsrad_avx2(auVar224,ZEXT416(in_R8D));
    auVar225 = vpsrad_avx2(auVar225,ZEXT416(in_R8D));
    auVar226 = vpsrad_avx2(auVar226,ZEXT416(in_R8D));
    auVar227 = vpsrad_avx2(auVar227,ZEXT416(in_R8D));
    auVar228 = vpsrad_avx2(auVar228,ZEXT416(in_R8D));
    auVar229 = vpsrad_avx2(auVar229,ZEXT416(in_R8D));
    auVar230 = vpsrad_avx2(auVar230,ZEXT416(in_R8D));
    auVar231 = vpsrad_avx2(auVar231,ZEXT416(in_R8D));
    auVar232 = vpsrad_avx2(auVar255,ZEXT416(in_R8D));
    auVar233 = vpsrad_avx2(auVar254,ZEXT416(in_R8D));
    auVar234 = vpsrad_avx2(auVar253,ZEXT416(in_R8D));
    auVar235 = vpsrad_avx2(auVar252,ZEXT416(in_R8D));
    auVar236 = vpsrad_avx2(auVar251,ZEXT416(in_R8D));
    auVar200 = vpsrad_avx2(auVar250,ZEXT416(in_R8D));
    auVar237 = vpsrad_avx2(auVar249,ZEXT416(in_R8D));
    auVar238 = vpsrad_avx2(auVar248,ZEXT416(in_R8D));
    auVar208 = vpackssdw_avx2(auVar208,auVar212);
    auVar209 = vpackssdw_avx2(auVar209,auVar213);
    auVar210 = vpackssdw_avx2(auVar210,auVar214);
    auVar211 = vpackssdw_avx2(auVar211,auVar215);
    auVar212 = vpunpcklwd_avx2(auVar208,auVar210);
    auVar208 = vpunpckhwd_avx2(auVar208,auVar210);
    auVar210 = vpunpcklwd_avx2(auVar209,auVar211);
    auVar209 = vpunpckhwd_avx2(auVar209,auVar211);
    auVar211 = vpunpcklwd_avx2(auVar212,auVar210);
    auVar210 = vpunpckhwd_avx2(auVar212,auVar210);
    auVar212 = vpunpcklwd_avx2(auVar208,auVar209);
    auVar208 = vpunpckhwd_avx2(auVar208,auVar209);
    auVar215 = vpunpcklqdq_avx2(auVar211,auVar212);
    auVar212 = vpunpckhqdq_avx2(auVar211,auVar212);
    auVar239 = vpunpcklqdq_avx2(auVar210,auVar208);
    auVar213 = vpunpckhqdq_avx2(auVar210,auVar208);
    auVar208 = vpackssdw_avx2(auVar216,auVar220);
    auVar209 = vpackssdw_avx2(auVar217,auVar221);
    auVar210 = vpackssdw_avx2(auVar218,auVar222);
    auVar211 = vpackssdw_avx2(auVar219,auVar223);
    auVar214 = vpunpcklwd_avx2(auVar208,auVar210);
    auVar208 = vpunpckhwd_avx2(auVar208,auVar210);
    auVar210 = vpunpcklwd_avx2(auVar209,auVar211);
    auVar209 = vpunpckhwd_avx2(auVar209,auVar211);
    auVar211 = vpunpcklwd_avx2(auVar214,auVar210);
    auVar210 = vpunpckhwd_avx2(auVar214,auVar210);
    auVar214 = vpunpcklwd_avx2(auVar208,auVar209);
    auVar208 = vpunpckhwd_avx2(auVar208,auVar209);
    auVar216 = vpunpcklqdq_avx2(auVar211,auVar214);
    auVar209 = vpunpckhqdq_avx2(auVar211,auVar214);
    auVar211 = vpunpcklqdq_avx2(auVar210,auVar208);
    auVar208 = vpunpckhqdq_avx2(auVar210,auVar208);
    local_d200 = vperm2i128_avx2(auVar215,auVar216,0x20);
    local_d240 = vperm2i128_avx2(auVar212,auVar209,0x20);
    local_d280 = vperm2i128_avx2(auVar239,auVar211,0x20);
    local_d2c0 = vperm2i128_avx2(auVar213,auVar208,0x20);
    local_d300 = vperm2i128_avx2(auVar215,auVar216,0x31);
    local_d340 = vperm2i128_avx2(auVar212,auVar209,0x31);
    local_d380 = vperm2i128_avx2(auVar239,auVar211,0x31);
    local_d3c0 = vperm2i128_avx2(auVar213,auVar208,0x31);
    auVar208 = vpackssdw_avx2(auVar224,auVar228);
    auVar209 = vpackssdw_avx2(auVar225,auVar229);
    auVar210 = vpackssdw_avx2(auVar226,auVar230);
    auVar211 = vpackssdw_avx2(auVar227,auVar231);
    auVar212 = vpunpcklwd_avx2(auVar208,auVar210);
    auVar208 = vpunpckhwd_avx2(auVar208,auVar210);
    auVar210 = vpunpcklwd_avx2(auVar209,auVar211);
    auVar209 = vpunpckhwd_avx2(auVar209,auVar211);
    auVar211 = vpunpcklwd_avx2(auVar212,auVar210);
    auVar210 = vpunpckhwd_avx2(auVar212,auVar210);
    auVar212 = vpunpcklwd_avx2(auVar208,auVar209);
    auVar208 = vpunpckhwd_avx2(auVar208,auVar209);
    auVar215 = vpunpcklqdq_avx2(auVar211,auVar212);
    auVar212 = vpunpckhqdq_avx2(auVar211,auVar212);
    auVar216 = vpunpcklqdq_avx2(auVar210,auVar208);
    auVar213 = vpunpckhqdq_avx2(auVar210,auVar208);
    auVar208 = vpackssdw_avx2(auVar232,auVar236);
    auVar209 = vpackssdw_avx2(auVar233,auVar200);
    auVar210 = vpackssdw_avx2(auVar234,auVar237);
    auVar211 = vpackssdw_avx2(auVar235,auVar238);
    auVar214 = vpunpcklwd_avx2(auVar208,auVar210);
    auVar208 = vpunpckhwd_avx2(auVar208,auVar210);
    auVar210 = vpunpcklwd_avx2(auVar209,auVar211);
    auVar209 = vpunpckhwd_avx2(auVar209,auVar211);
    auVar211 = vpunpcklwd_avx2(auVar214,auVar210);
    auVar210 = vpunpckhwd_avx2(auVar214,auVar210);
    auVar214 = vpunpcklwd_avx2(auVar208,auVar209);
    auVar208 = vpunpckhwd_avx2(auVar208,auVar209);
    auVar217 = vpunpcklqdq_avx2(auVar211,auVar214);
    auVar209 = vpunpckhqdq_avx2(auVar211,auVar214);
    auVar211 = vpunpcklqdq_avx2(auVar210,auVar208);
    auVar208 = vpunpckhqdq_avx2(auVar210,auVar208);
    local_d220 = vperm2i128_avx2(auVar215,auVar217,0x20);
    local_d260 = vperm2i128_avx2(auVar212,auVar209,0x20);
    local_d2a0 = vperm2i128_avx2(auVar216,auVar211,0x20);
    local_d2e0 = vperm2i128_avx2(auVar213,auVar208,0x20);
    local_d320 = vperm2i128_avx2(auVar215,auVar217,0x31);
    local_d360 = vperm2i128_avx2(auVar212,auVar209,0x31);
    local_d3a0 = vperm2i128_avx2(auVar216,auVar211,0x31);
    local_d3e0 = vperm2i128_avx2(auVar213,auVar208,0x31);
    if (in_R9D != 0xf) {
      local_b974 = (byte)in_R9D;
      uVar593 = (short)(1 << (local_b974 & 0x1f)) - 1;
      auVar596 = vpinsrw_avx(ZEXT216(uVar593),(uint)uVar593,1);
      auVar596 = vpinsrw_avx(auVar596,(uint)uVar593,2);
      auVar596 = vpinsrw_avx(auVar596,(uint)uVar593,3);
      auVar596 = vpinsrw_avx(auVar596,(uint)uVar593,4);
      auVar596 = vpinsrw_avx(auVar596,(uint)uVar593,5);
      auVar596 = vpinsrw_avx(auVar596,(uint)uVar593,6);
      auVar596 = vpinsrw_avx(auVar596,(uint)uVar593,7);
      auVar597 = vpinsrw_avx(ZEXT216(uVar593),(uint)uVar593,1);
      auVar597 = vpinsrw_avx(auVar597,(uint)uVar593,2);
      auVar597 = vpinsrw_avx(auVar597,(uint)uVar593,3);
      auVar597 = vpinsrw_avx(auVar597,(uint)uVar593,4);
      auVar597 = vpinsrw_avx(auVar597,(uint)uVar593,5);
      auVar597 = vpinsrw_avx(auVar597,(uint)uVar593,6);
      auVar597 = vpinsrw_avx(auVar597,(uint)uVar593,7);
      uStack_b0 = auVar597._0_8_;
      uStack_a8 = auVar597._8_8_;
      uVar593 = -(short)(1 << (local_b974 & 0x1f));
      auVar597 = vpinsrw_avx(ZEXT216(uVar593),(uint)uVar593,1);
      auVar597 = vpinsrw_avx(auVar597,(uint)uVar593,2);
      auVar597 = vpinsrw_avx(auVar597,(uint)uVar593,3);
      auVar597 = vpinsrw_avx(auVar597,(uint)uVar593,4);
      auVar597 = vpinsrw_avx(auVar597,(uint)uVar593,5);
      auVar597 = vpinsrw_avx(auVar597,(uint)uVar593,6);
      auVar597 = vpinsrw_avx(auVar597,(uint)uVar593,7);
      auVar595 = vpinsrw_avx(ZEXT216(uVar593),(uint)uVar593,1);
      auVar595 = vpinsrw_avx(auVar595,(uint)uVar593,2);
      auVar595 = vpinsrw_avx(auVar595,(uint)uVar593,3);
      auVar595 = vpinsrw_avx(auVar595,(uint)uVar593,4);
      auVar595 = vpinsrw_avx(auVar595,(uint)uVar593,5);
      auVar595 = vpinsrw_avx(auVar595,(uint)uVar593,6);
      auVar595 = vpinsrw_avx(auVar595,(uint)uVar593,7);
      auVar595 = ZEXT116(0) * auVar597 + ZEXT116(1) * auVar595;
      auVar597 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar597;
      uStack_70 = auVar597._0_8_;
      uStack_68 = auVar597._8_8_;
      auVar575._16_8_ = uStack_b0;
      auVar575._0_16_ = auVar596;
      auVar575._24_8_ = uStack_a8;
      auVar208 = vpminsw_avx2(local_d200,auVar575);
      auVar574._16_8_ = uStack_b0;
      auVar574._0_16_ = auVar596;
      auVar574._24_8_ = uStack_a8;
      auVar209 = vpminsw_avx2(local_d220,auVar574);
      auVar573._16_8_ = uStack_b0;
      auVar573._0_16_ = auVar596;
      auVar573._24_8_ = uStack_a8;
      auVar210 = vpminsw_avx2(local_d240,auVar573);
      auVar572._16_8_ = uStack_b0;
      auVar572._0_16_ = auVar596;
      auVar572._24_8_ = uStack_a8;
      auVar211 = vpminsw_avx2(local_d260,auVar572);
      auVar591._16_8_ = uStack_70;
      auVar591._0_16_ = auVar595;
      auVar591._24_8_ = uStack_68;
      local_d200 = vpmaxsw_avx2(auVar208,auVar591);
      auVar590._16_8_ = uStack_70;
      auVar590._0_16_ = auVar595;
      auVar590._24_8_ = uStack_68;
      local_d220 = vpmaxsw_avx2(auVar209,auVar590);
      auVar589._16_8_ = uStack_70;
      auVar589._0_16_ = auVar595;
      auVar589._24_8_ = uStack_68;
      local_d240 = vpmaxsw_avx2(auVar210,auVar589);
      auVar588._16_8_ = uStack_70;
      auVar588._0_16_ = auVar595;
      auVar588._24_8_ = uStack_68;
      local_d260 = vpmaxsw_avx2(auVar211,auVar588);
      auVar571._16_8_ = uStack_b0;
      auVar571._0_16_ = auVar596;
      auVar571._24_8_ = uStack_a8;
      auVar208 = vpminsw_avx2(local_d280,auVar571);
      auVar570._16_8_ = uStack_b0;
      auVar570._0_16_ = auVar596;
      auVar570._24_8_ = uStack_a8;
      auVar209 = vpminsw_avx2(local_d2a0,auVar570);
      auVar569._16_8_ = uStack_b0;
      auVar569._0_16_ = auVar596;
      auVar569._24_8_ = uStack_a8;
      auVar210 = vpminsw_avx2(local_d2c0,auVar569);
      auVar568._16_8_ = uStack_b0;
      auVar568._0_16_ = auVar596;
      auVar568._24_8_ = uStack_a8;
      auVar211 = vpminsw_avx2(local_d2e0,auVar568);
      auVar587._16_8_ = uStack_70;
      auVar587._0_16_ = auVar595;
      auVar587._24_8_ = uStack_68;
      local_d280 = vpmaxsw_avx2(auVar208,auVar587);
      auVar586._16_8_ = uStack_70;
      auVar586._0_16_ = auVar595;
      auVar586._24_8_ = uStack_68;
      local_d2a0 = vpmaxsw_avx2(auVar209,auVar586);
      auVar585._16_8_ = uStack_70;
      auVar585._0_16_ = auVar595;
      auVar585._24_8_ = uStack_68;
      local_d2c0 = vpmaxsw_avx2(auVar210,auVar585);
      auVar584._16_8_ = uStack_70;
      auVar584._0_16_ = auVar595;
      auVar584._24_8_ = uStack_68;
      local_d2e0 = vpmaxsw_avx2(auVar211,auVar584);
      auVar567._16_8_ = uStack_b0;
      auVar567._0_16_ = auVar596;
      auVar567._24_8_ = uStack_a8;
      auVar208 = vpminsw_avx2(local_d300,auVar567);
      auVar566._16_8_ = uStack_b0;
      auVar566._0_16_ = auVar596;
      auVar566._24_8_ = uStack_a8;
      auVar209 = vpminsw_avx2(local_d320,auVar566);
      auVar565._16_8_ = uStack_b0;
      auVar565._0_16_ = auVar596;
      auVar565._24_8_ = uStack_a8;
      auVar210 = vpminsw_avx2(local_d340,auVar565);
      auVar564._16_8_ = uStack_b0;
      auVar564._0_16_ = auVar596;
      auVar564._24_8_ = uStack_a8;
      auVar211 = vpminsw_avx2(local_d360,auVar564);
      auVar583._16_8_ = uStack_70;
      auVar583._0_16_ = auVar595;
      auVar583._24_8_ = uStack_68;
      local_d300 = vpmaxsw_avx2(auVar208,auVar583);
      auVar582._16_8_ = uStack_70;
      auVar582._0_16_ = auVar595;
      auVar582._24_8_ = uStack_68;
      local_d320 = vpmaxsw_avx2(auVar209,auVar582);
      auVar581._16_8_ = uStack_70;
      auVar581._0_16_ = auVar595;
      auVar581._24_8_ = uStack_68;
      local_d340 = vpmaxsw_avx2(auVar210,auVar581);
      auVar580._16_8_ = uStack_70;
      auVar580._0_16_ = auVar595;
      auVar580._24_8_ = uStack_68;
      local_d360 = vpmaxsw_avx2(auVar211,auVar580);
      auVar563._16_8_ = uStack_b0;
      auVar563._0_16_ = auVar596;
      auVar563._24_8_ = uStack_a8;
      auVar208 = vpminsw_avx2(local_d380,auVar563);
      auVar562._16_8_ = uStack_b0;
      auVar562._0_16_ = auVar596;
      auVar562._24_8_ = uStack_a8;
      auVar209 = vpminsw_avx2(local_d3a0,auVar562);
      auVar561._16_8_ = uStack_b0;
      auVar561._0_16_ = auVar596;
      auVar561._24_8_ = uStack_a8;
      auVar210 = vpminsw_avx2(local_d3c0,auVar561);
      auVar560._16_8_ = uStack_b0;
      auVar560._0_16_ = auVar596;
      auVar560._24_8_ = uStack_a8;
      auVar211 = vpminsw_avx2(local_d3e0,auVar560);
      auVar579._16_8_ = uStack_70;
      auVar579._0_16_ = auVar595;
      auVar579._24_8_ = uStack_68;
      local_d380 = vpmaxsw_avx2(auVar208,auVar579);
      auVar578._16_8_ = uStack_70;
      auVar578._0_16_ = auVar595;
      auVar578._24_8_ = uStack_68;
      local_d3a0 = vpmaxsw_avx2(auVar209,auVar578);
      auVar577._16_8_ = uStack_70;
      auVar577._0_16_ = auVar595;
      auVar577._24_8_ = uStack_68;
      local_d3c0 = vpmaxsw_avx2(auVar210,auVar577);
      auVar576._16_8_ = uStack_70;
      auVar576._0_16_ = auVar595;
      auVar576._24_8_ = uStack_68;
      local_d3e0 = vpmaxsw_avx2(auVar211,auVar576);
    }
    *local_b968 = local_d200._0_8_;
    local_b968[1] = local_d200._8_8_;
    local_b968[2] = local_d200._16_8_;
    local_b968[3] = local_d200._24_8_;
    local_b968[4] = local_d220._0_8_;
    local_b968[5] = local_d220._8_8_;
    local_b968[6] = local_d220._16_8_;
    local_b968[7] = local_d220._24_8_;
    local_b968[8] = local_d240._0_8_;
    local_b968[9] = local_d240._8_8_;
    local_b968[10] = local_d240._16_8_;
    local_b968[0xb] = local_d240._24_8_;
    local_b968[0xc] = local_d260._0_8_;
    local_b968[0xd] = local_d260._8_8_;
    local_b968[0xe] = local_d260._16_8_;
    local_b968[0xf] = local_d260._24_8_;
    local_b968[0x10] = local_d280._0_8_;
    local_b968[0x11] = local_d280._8_8_;
    local_b968[0x12] = local_d280._16_8_;
    local_b968[0x13] = local_d280._24_8_;
    local_b968[0x14] = local_d2a0._0_8_;
    local_b968[0x15] = local_d2a0._8_8_;
    local_b968[0x16] = local_d2a0._16_8_;
    local_b968[0x17] = local_d2a0._24_8_;
    local_b968[0x18] = local_d2c0._0_8_;
    local_b968[0x19] = local_d2c0._8_8_;
    local_b968[0x1a] = local_d2c0._16_8_;
    local_b968[0x1b] = local_d2c0._24_8_;
    local_b968[0x1c] = local_d2e0._0_8_;
    local_b968[0x1d] = local_d2e0._8_8_;
    local_b968[0x1e] = local_d2e0._16_8_;
    local_b968[0x1f] = local_d2e0._24_8_;
    local_b968[0x20] = local_d300._0_8_;
    local_b968[0x21] = local_d300._8_8_;
    local_b968[0x22] = local_d300._16_8_;
    local_b968[0x23] = local_d300._24_8_;
    local_b968[0x24] = local_d320._0_8_;
    local_b968[0x25] = local_d320._8_8_;
    local_b968[0x26] = local_d320._16_8_;
    local_b968[0x27] = local_d320._24_8_;
    local_b968[0x28] = local_d340._0_8_;
    local_b968[0x29] = local_d340._8_8_;
    local_b968[0x2a] = local_d340._16_8_;
    local_b968[0x2b] = local_d340._24_8_;
    local_b968[0x2c] = local_d360._0_8_;
    local_b968[0x2d] = local_d360._8_8_;
    local_b968[0x2e] = local_d360._16_8_;
    local_b968[0x2f] = local_d360._24_8_;
    local_b968[0x30] = local_d380._0_8_;
    local_b968[0x31] = local_d380._8_8_;
    local_b968[0x32] = local_d380._16_8_;
    local_b968[0x33] = local_d380._24_8_;
    local_b968[0x34] = local_d3a0._0_8_;
    local_b968[0x35] = local_d3a0._8_8_;
    local_b968[0x36] = local_d3a0._16_8_;
    local_b968[0x37] = local_d3a0._24_8_;
    local_b968[0x38] = local_d3c0._0_8_;
    local_b968[0x39] = local_d3c0._8_8_;
    local_b968[0x3a] = local_d3c0._16_8_;
    local_b968[0x3b] = local_d3c0._24_8_;
    local_b968[0x3c] = local_d3e0._0_8_;
    local_b968[0x3d] = local_d3e0._8_8_;
    local_b968[0x3e] = local_d3e0._16_8_;
    local_b968[0x3f] = local_d3e0._24_8_;
    local_b968 = local_b968 + 0x40;
  }
  return;
}

Assistant:

void dct2_butterfly_h32_avx2(s16* src, int i_src, s16* dst, int line, int shift, int bit_depth)
{
    const __m256i c16_p45_p45 = _mm256_set1_epi32(0x002D002D);
    const __m256i c16_p43_p44 = _mm256_set1_epi32(0x002B002C);
    const __m256i c16_p39_p41 = _mm256_set1_epi32(0x00270029);
    const __m256i c16_p34_p36 = _mm256_set1_epi32(0x00220024);
    const __m256i c16_p27_p30 = _mm256_set1_epi32(0x001B001E);
    const __m256i c16_p19_p23 = _mm256_set1_epi32(0x00130017);
    const __m256i c16_p11_p15 = _mm256_set1_epi32(0x000B000F);
    const __m256i c16_p02_p07 = _mm256_set1_epi32(0x00020007);
    const __m256i c16_p41_p45 = _mm256_set1_epi32(0x0029002D);
    const __m256i c16_p23_p34 = _mm256_set1_epi32(0x00170022);
    const __m256i c16_n02_p11 = _mm256_set1_epi32(0xFFFE000B);
    const __m256i c16_n27_n15 = _mm256_set1_epi32(0xFFE5FFF1);
    const __m256i c16_n43_n36 = _mm256_set1_epi32(0xFFD5FFDC);
    const __m256i c16_n44_n45 = _mm256_set1_epi32(0xFFD4FFD3);
    const __m256i c16_n30_n39 = _mm256_set1_epi32(0xFFE2FFD9);
    const __m256i c16_n07_n19 = _mm256_set1_epi32(0xFFF9FFED);
    const __m256i c16_p34_p44 = _mm256_set1_epi32(0x0022002C);
    const __m256i c16_n07_p15 = _mm256_set1_epi32(0xFFF9000F);
    const __m256i c16_n41_n27 = _mm256_set1_epi32(0xFFD7FFE5);
    const __m256i c16_n39_n45 = _mm256_set1_epi32(0xFFD9FFD3);
    const __m256i c16_n02_n23 = _mm256_set1_epi32(0xFFFEFFE9);
    const __m256i c16_p36_p19 = _mm256_set1_epi32(0x00240013);
    const __m256i c16_p43_p45 = _mm256_set1_epi32(0x002B002D);
    const __m256i c16_p11_p30 = _mm256_set1_epi32(0x000B001E);
    const __m256i c16_p23_p43 = _mm256_set1_epi32(0x0017002B);
    const __m256i c16_n34_n07 = _mm256_set1_epi32(0xFFDEFFF9);
    const __m256i c16_n36_n45 = _mm256_set1_epi32(0xFFDCFFD3);
    const __m256i c16_p19_n11 = _mm256_set1_epi32(0x0013FFF5);
    const __m256i c16_p44_p41 = _mm256_set1_epi32(0x002C0029);
    const __m256i c16_n02_p27 = _mm256_set1_epi32(0xFFFE001B);
    const __m256i c16_n45_n30 = _mm256_set1_epi32(0xFFD3FFE2);
    const __m256i c16_n15_n39 = _mm256_set1_epi32(0xFFF1FFD9);
    const __m256i c16_p11_p41 = _mm256_set1_epi32(0x000B0029);
    const __m256i c16_n45_n27 = _mm256_set1_epi32(0xFFD3FFE5);
    const __m256i c16_p07_n30 = _mm256_set1_epi32(0x0007FFE2);
    const __m256i c16_p43_p39 = _mm256_set1_epi32(0x002B0027);
    const __m256i c16_n23_p15 = _mm256_set1_epi32(0xFFE9000F);
    const __m256i c16_n34_n45 = _mm256_set1_epi32(0xFFDEFFD3);
    const __m256i c16_p36_p02 = _mm256_set1_epi32(0x00240002);
    const __m256i c16_p19_p44 = _mm256_set1_epi32(0x0013002C);
    const __m256i c16_n02_p39 = _mm256_set1_epi32(0xFFFE0027);
    const __m256i c16_n36_n41 = _mm256_set1_epi32(0xFFDCFFD7);
    const __m256i c16_p43_p07 = _mm256_set1_epi32(0x002B0007);
    const __m256i c16_n11_p34 = _mm256_set1_epi32(0xFFF50022);
    const __m256i c16_n30_n44 = _mm256_set1_epi32(0xFFE2FFD4);
    const __m256i c16_p45_p15 = _mm256_set1_epi32(0x002D000F);
    const __m256i c16_n19_p27 = _mm256_set1_epi32(0xFFED001B);
    const __m256i c16_n23_n45 = _mm256_set1_epi32(0xFFE9FFD3);
    const __m256i c16_n15_p36 = _mm256_set1_epi32(0xFFF10024);
    const __m256i c16_n11_n45 = _mm256_set1_epi32(0xFFF5FFD3);
    const __m256i c16_p34_p39 = _mm256_set1_epi32(0x00220027);
    const __m256i c16_n45_n19 = _mm256_set1_epi32(0xFFD3FFED);
    const __m256i c16_p41_n07 = _mm256_set1_epi32(0x0029FFF9);
    const __m256i c16_n23_p30 = _mm256_set1_epi32(0xFFE9001E);
    const __m256i c16_n02_n44 = _mm256_set1_epi32(0xFFFEFFD4);
    const __m256i c16_p27_p43 = _mm256_set1_epi32(0x001B002B);
    const __m256i c16_n27_p34 = _mm256_set1_epi32(0xFFE50022);
    const __m256i c16_p19_n39 = _mm256_set1_epi32(0x0013FFD9);
    const __m256i c16_n11_p43 = _mm256_set1_epi32(0xFFF5002B);
    const __m256i c16_p02_n45 = _mm256_set1_epi32(0x0002FFD3);
    const __m256i c16_p07_p45 = _mm256_set1_epi32(0x0007002D);
    const __m256i c16_n15_n44 = _mm256_set1_epi32(0xFFF1FFD4);
    const __m256i c16_p23_p41 = _mm256_set1_epi32(0x00170029);
    const __m256i c16_n30_n36 = _mm256_set1_epi32(0xFFE2FFDC);
    const __m256i c16_n36_p30 = _mm256_set1_epi32(0xFFDC001E);
    const __m256i c16_p41_n23 = _mm256_set1_epi32(0x0029FFE9);
    const __m256i c16_n44_p15 = _mm256_set1_epi32(0xFFD4000F);
    const __m256i c16_p45_n07 = _mm256_set1_epi32(0x002DFFF9);
    const __m256i c16_n45_n02 = _mm256_set1_epi32(0xFFD3FFFE);
    const __m256i c16_p43_p11 = _mm256_set1_epi32(0x002B000B);
    const __m256i c16_n39_n19 = _mm256_set1_epi32(0xFFD9FFED);
    const __m256i c16_p34_p27 = _mm256_set1_epi32(0x0022001B);
    const __m256i c16_n43_p27 = _mm256_set1_epi32(0xFFD5001B);
    const __m256i c16_p44_n02 = _mm256_set1_epi32(0x002CFFFE);
    const __m256i c16_n30_n23 = _mm256_set1_epi32(0xFFE2FFE9);
    const __m256i c16_p07_p41 = _mm256_set1_epi32(0x00070029);
    const __m256i c16_p19_n45 = _mm256_set1_epi32(0x0013FFD3);
    const __m256i c16_n39_p34 = _mm256_set1_epi32(0xFFD90022);
    const __m256i c16_p45_n11 = _mm256_set1_epi32(0x002DFFF5);
    const __m256i c16_n36_n15 = _mm256_set1_epi32(0xFFDCFFF1);
    const __m256i c16_n45_p23 = _mm256_set1_epi32(0xFFD30017);
    const __m256i c16_p27_p19 = _mm256_set1_epi32(0x001B0013);
    const __m256i c16_p15_n45 = _mm256_set1_epi32(0x000FFFD3);
    const __m256i c16_n44_p30 = _mm256_set1_epi32(0xFFD4001E);
    const __m256i c16_p34_p11 = _mm256_set1_epi32(0x0022000B);
    const __m256i c16_p07_n43 = _mm256_set1_epi32(0x0007FFD5);
    const __m256i c16_n41_p36 = _mm256_set1_epi32(0xFFD70024);
    const __m256i c16_p39_p02 = _mm256_set1_epi32(0x00270002);
    const __m256i c16_n44_p19 = _mm256_set1_epi32(0xFFD40013);
    const __m256i c16_n02_p36 = _mm256_set1_epi32(0xFFFE0024);
    const __m256i c16_p45_n34 = _mm256_set1_epi32(0x002DFFDE);
    const __m256i c16_n15_n23 = _mm256_set1_epi32(0xFFF1FFE9);
    const __m256i c16_n39_p43 = _mm256_set1_epi32(0xFFD9002B);
    const __m256i c16_p30_p07 = _mm256_set1_epi32(0x001E0007);
    const __m256i c16_p27_n45 = _mm256_set1_epi32(0x001BFFD3);
    const __m256i c16_n41_p11 = _mm256_set1_epi32(0xFFD7000B);
    const __m256i c16_n39_p15 = _mm256_set1_epi32(0xFFD9000F);
    const __m256i c16_n30_p45 = _mm256_set1_epi32(0xFFE2002D);
    const __m256i c16_p27_p02 = _mm256_set1_epi32(0x001B0002);
    const __m256i c16_p41_n44 = _mm256_set1_epi32(0x0029FFD4);
    const __m256i c16_n11_n19 = _mm256_set1_epi32(0xFFF5FFED);
    const __m256i c16_n45_p36 = _mm256_set1_epi32(0xFFD30024);
    const __m256i c16_n07_p34 = _mm256_set1_epi32(0xFFF90022);
    const __m256i c16_p43_n23 = _mm256_set1_epi32(0x002BFFE9);
    const __m256i c16_n30_p11 = _mm256_set1_epi32(0xFFE2000B);
    const __m256i c16_n45_p43 = _mm256_set1_epi32(0xFFD3002B);
    const __m256i c16_n19_p36 = _mm256_set1_epi32(0xFFED0024);
    const __m256i c16_p23_n02 = _mm256_set1_epi32(0x0017FFFE);
    const __m256i c16_p45_n39 = _mm256_set1_epi32(0x002DFFD9);
    const __m256i c16_p27_n41 = _mm256_set1_epi32(0x001BFFD7);
    const __m256i c16_n15_n07 = _mm256_set1_epi32(0xFFF1FFF9);
    const __m256i c16_n44_p34 = _mm256_set1_epi32(0xFFD40022);
    const __m256i c16_n19_p07 = _mm256_set1_epi32(0xFFED0007);
    const __m256i c16_n39_p30 = _mm256_set1_epi32(0xFFD9001E);
    const __m256i c16_n45_p44 = _mm256_set1_epi32(0xFFD3002C);
    const __m256i c16_n36_p43 = _mm256_set1_epi32(0xFFDC002B);
    const __m256i c16_n15_p27 = _mm256_set1_epi32(0xFFF1001B);
    const __m256i c16_p11_p02 = _mm256_set1_epi32(0x000B0002);
    const __m256i c16_p34_n23 = _mm256_set1_epi32(0x0022FFE9);
    const __m256i c16_p45_n41 = _mm256_set1_epi32(0x002DFFD7);
    const __m256i c16_n07_p02 = _mm256_set1_epi32(0xFFF90002);
    const __m256i c16_n15_p11 = _mm256_set1_epi32(0xFFF1000B);
    const __m256i c16_n23_p19 = _mm256_set1_epi32(0xFFE90013);
    const __m256i c16_n30_p27 = _mm256_set1_epi32(0xFFE2001B);
    const __m256i c16_n36_p34 = _mm256_set1_epi32(0xFFDC0022);
    const __m256i c16_n41_p39 = _mm256_set1_epi32(0xFFD70027);
    const __m256i c16_n44_p43 = _mm256_set1_epi32(0xFFD4002B);
    const __m256i c16_n45_p45 = _mm256_set1_epi32(0xFFD3002D);

    const __m256i c16_p35_p40 = _mm256_set1_epi32(0x00230028);
    const __m256i c16_p21_p29 = _mm256_set1_epi32(0x0015001D);
    const __m256i c16_p04_p13 = _mm256_set1_epi32(0x0004000D);
    const __m256i c16_p29_p43 = _mm256_set1_epi32(0x001D002B);
    const __m256i c16_n21_p04 = _mm256_set1_epi32(0xFFEB0004);
    const __m256i c16_n45_n40 = _mm256_set1_epi32(0xFFD3FFD8);
    const __m256i c16_n13_n35 = _mm256_set1_epi32(0xFFF3FFDD);
    const __m256i c16_p04_p40 = _mm256_set1_epi32(0x00040028);
    const __m256i c16_n43_n35 = _mm256_set1_epi32(0xFFD5FFDD);
    const __m256i c16_p29_n13 = _mm256_set1_epi32(0x001DFFF3);
    const __m256i c16_p21_p45 = _mm256_set1_epi32(0x0015002D);
    const __m256i c16_n21_p35 = _mm256_set1_epi32(0xFFEB0023);
    const __m256i c16_p04_n43 = _mm256_set1_epi32(0x0004FFD5);
    const __m256i c16_p13_p45 = _mm256_set1_epi32(0x000D002D);
    const __m256i c16_n29_n40 = _mm256_set1_epi32(0xFFE3FFD8);
    const __m256i c16_n40_p29 = _mm256_set1_epi32(0xFFD8001D);
    const __m256i c16_p45_n13 = _mm256_set1_epi32(0x002DFFF3);
    const __m256i c16_n43_n04 = _mm256_set1_epi32(0xFFD5FFFC);
    const __m256i c16_p35_p21 = _mm256_set1_epi32(0x00230015);
    const __m256i c16_n45_p21 = _mm256_set1_epi32(0xFFD30015);
    const __m256i c16_p13_p29 = _mm256_set1_epi32(0x000D001D);
    const __m256i c16_p35_n43 = _mm256_set1_epi32(0x0023FFD5);
    const __m256i c16_n40_p04 = _mm256_set1_epi32(0xFFD80004);
    const __m256i c16_n35_p13 = _mm256_set1_epi32(0xFFDD000D);
    const __m256i c16_n40_p45 = _mm256_set1_epi32(0xFFD8002D);
    const __m256i c16_p04_p21 = _mm256_set1_epi32(0x00040015);
    const __m256i c16_p43_n29 = _mm256_set1_epi32(0x002BFFE3);
    const __m256i c16_n13_p04 = _mm256_set1_epi32(0xFFF30004);
    const __m256i c16_n29_p21 = _mm256_set1_epi32(0xFFE30015);
    const __m256i c16_n40_p35 = _mm256_set1_epi32(0xFFD80023);

    const __m256i c16_p38_p44 = _mm256_set1_epi32(0x0026002C);
    const __m256i c16_p09_p25 = _mm256_set1_epi32(0x00090019);
    const __m256i c16_n09_p38 = _mm256_set1_epi32(0xFFF70026);
    const __m256i c16_n25_n44 = _mm256_set1_epi32(0xFFE7FFD4);

    const __m256i c16_n44_p25 = _mm256_set1_epi32(0xFFD40019);
    const __m256i c16_p38_p09 = _mm256_set1_epi32(0x00260009);
    const __m256i c16_n25_p09 = _mm256_set1_epi32(0xFFE70009);
    const __m256i c16_n44_p38 = _mm256_set1_epi32(0xFFD40026);

    const __m256i c16_p17_p42 = _mm256_set1_epi32(0x0011002A);
    const __m256i c16_n42_p17 = _mm256_set1_epi32(0xFFD60011);

    const __m256i c16_p32_p32 = _mm256_set1_epi32(0x00200020);
    const __m256i c16_n32_p32 = _mm256_set1_epi32(0xFFE00020);

    __m256i c32_off = _mm256_set1_epi32(1 << (shift - 1));

    __m128i src00, src01, src02, src03, src04, src05, src06, src07, src08, src09, src10, src11, src12, src13, src14, src15;
    __m128i src16, src17, src18, src19, src20, src21, src22, src23, src24, src25, src26, src27, src28, src29, src30, src31;
    __m128i ss00, ss01, ss02, ss03, ss04, ss05, ss06, ss07, ss08, ss09, ss10, ss11, ss12, ss13, ss14, ss15;
    __m256i res00, res01, res02, res03, res04, res05, res06, res07, res08, res09, res10, res11, res12, res13, res14, res15;
    __m256i t0, t1, t2, t3, t4, t5, t6, t7;
    __m256i O00, O01, O02, O03, O04, O05, O06, O07, O08, O09, O10, O11, O12, O13, O14, O15;
    __m256i EO0, EO1, EO2, EO3, EO4, EO5, EO6, EO7;
    int i;

    for (i = 0; i < line; i += 8)
    {
        src01 = _mm_load_si128((const __m128i*)&src[1 * i_src + i]);
        src03 = _mm_load_si128((const __m128i*)&src[3 * i_src + i]);
        src05 = _mm_load_si128((const __m128i*)&src[5 * i_src + i]);
        src07 = _mm_load_si128((const __m128i*)&src[7 * i_src + i]);
        src09 = _mm_load_si128((const __m128i*)&src[9 * i_src + i]);
        src11 = _mm_load_si128((const __m128i*)&src[11 * i_src + i]);
        src13 = _mm_load_si128((const __m128i*)&src[13 * i_src + i]);
        src15 = _mm_load_si128((const __m128i*)&src[15 * i_src + i]);
        src17 = _mm_load_si128((const __m128i*)&src[17 * i_src + i]);
        src19 = _mm_load_si128((const __m128i*)&src[19 * i_src + i]);
        src21 = _mm_load_si128((const __m128i*)&src[21 * i_src + i]);
        src23 = _mm_load_si128((const __m128i*)&src[23 * i_src + i]);
        src25 = _mm_load_si128((const __m128i*)&src[25 * i_src + i]);
        src27 = _mm_load_si128((const __m128i*)&src[27 * i_src + i]);
        src29 = _mm_load_si128((const __m128i*)&src[29 * i_src + i]);
        src31 = _mm_load_si128((const __m128i*)&src[31 * i_src + i]);

        ss00 = _mm_unpacklo_epi16(src01, src03);
        ss01 = _mm_unpacklo_epi16(src05, src07);
        ss02 = _mm_unpacklo_epi16(src09, src11);
        ss03 = _mm_unpacklo_epi16(src13, src15);
        ss04 = _mm_unpacklo_epi16(src17, src19);
        ss05 = _mm_unpacklo_epi16(src21, src23);
        ss06 = _mm_unpacklo_epi16(src25, src27);
        ss07 = _mm_unpacklo_epi16(src29, src31);

        ss08 = _mm_unpackhi_epi16(src01, src03);
        ss09 = _mm_unpackhi_epi16(src05, src07);
        ss10 = _mm_unpackhi_epi16(src09, src11);
        ss11 = _mm_unpackhi_epi16(src13, src15);
        ss12 = _mm_unpackhi_epi16(src17, src19);
        ss13 = _mm_unpackhi_epi16(src21, src23);
        ss14 = _mm_unpackhi_epi16(src25, src27);
        ss15 = _mm_unpackhi_epi16(src29, src31);

        {
            const __m256i T_00_00 = _mm256_set_m128i(ss08, ss00);       // [33 13 32 12 31 11 30 10]
            const __m256i T_00_01 = _mm256_set_m128i(ss09, ss01);       // [ ]
            const __m256i T_00_02 = _mm256_set_m128i(ss10, ss02);       // [ ]
            const __m256i T_00_03 = _mm256_set_m128i(ss11, ss03);       // [ ]
            const __m256i T_00_04 = _mm256_set_m128i(ss12, ss04);       // [ ]
            const __m256i T_00_05 = _mm256_set_m128i(ss13, ss05);       // [ ]
            const __m256i T_00_06 = _mm256_set_m128i(ss14, ss06);       // [ ]
            const __m256i T_00_07 = _mm256_set_m128i(ss15, ss07);       //

#define COMPUTE_ROW(r0103, r0507, r0911, r1315, r1719, r2123, r2527, r2931, c0103, c0507, c0911, c1315, c1719, c2123, c2527, c2931, row) \
            t0 = _mm256_madd_epi16(r0103, c0103); \
            t1 = _mm256_madd_epi16(r0507, c0507); \
            t2 = _mm256_madd_epi16(r0911, c0911); \
            t3 = _mm256_madd_epi16(r1315, c1315); \
            t4 = _mm256_madd_epi16(r1719, c1719); \
            t5 = _mm256_madd_epi16(r2123, c2123); \
            t6 = _mm256_madd_epi16(r2527, c2527); \
            t7 = _mm256_madd_epi16(r2931, c2931); \
	        t0 = _mm256_add_epi32(t0, t1); \
	        t2 = _mm256_add_epi32(t2, t3); \
	        t4 = _mm256_add_epi32(t4, t5); \
	        t6 = _mm256_add_epi32(t6, t7); \
	        row = _mm256_add_epi32(_mm256_add_epi32(t0, t2), _mm256_add_epi32(t4, t6));

            COMPUTE_ROW(T_00_00, T_00_01, T_00_02, T_00_03, T_00_04, T_00_05, T_00_06, T_00_07, \
                c16_p45_p45, c16_p43_p44, c16_p39_p41, c16_p34_p36, c16_p27_p30, c16_p19_p23, c16_p11_p15, c16_p02_p07, O00)
            COMPUTE_ROW(T_00_00, T_00_01, T_00_02, T_00_03, T_00_04, T_00_05, T_00_06, T_00_07, \
                c16_p41_p45, c16_p23_p34, c16_n02_p11, c16_n27_n15, c16_n43_n36, c16_n44_n45, c16_n30_n39, c16_n07_n19, O01)
            COMPUTE_ROW(T_00_00, T_00_01, T_00_02, T_00_03, T_00_04, T_00_05, T_00_06, T_00_07, \
                c16_p34_p44, c16_n07_p15, c16_n41_n27, c16_n39_n45, c16_n02_n23, c16_p36_p19, c16_p43_p45, c16_p11_p30, O02)
            COMPUTE_ROW(T_00_00, T_00_01, T_00_02, T_00_03, T_00_04, T_00_05, T_00_06, T_00_07, \
                c16_p23_p43, c16_n34_n07, c16_n36_n45, c16_p19_n11, c16_p44_p41, c16_n02_p27, c16_n45_n30, c16_n15_n39, O03)
            COMPUTE_ROW(T_00_00, T_00_01, T_00_02, T_00_03, T_00_04, T_00_05, T_00_06, T_00_07, \
                c16_p11_p41, c16_n45_n27, c16_p07_n30, c16_p43_p39, c16_n23_p15, c16_n34_n45, c16_p36_p02, c16_p19_p44, O04)
            COMPUTE_ROW(T_00_00, T_00_01, T_00_02, T_00_03, T_00_04, T_00_05, T_00_06, T_00_07, \
                c16_n02_p39, c16_n36_n41, c16_p43_p07, c16_n11_p34, c16_n30_n44, c16_p45_p15, c16_n19_p27, c16_n23_n45, O05)
            COMPUTE_ROW(T_00_00, T_00_01, T_00_02, T_00_03, T_00_04, T_00_05, T_00_06, T_00_07, \
                c16_n15_p36, c16_n11_n45, c16_p34_p39, c16_n45_n19, c16_p41_n07, c16_n23_p30, c16_n02_n44, c16_p27_p43, O06)
            COMPUTE_ROW(T_00_00, T_00_01, T_00_02, T_00_03, T_00_04, T_00_05, T_00_06, T_00_07, \
                c16_n27_p34, c16_p19_n39, c16_n11_p43, c16_p02_n45, c16_p07_p45, c16_n15_n44, c16_p23_p41, c16_n30_n36, O07)
            COMPUTE_ROW(T_00_00, T_00_01, T_00_02, T_00_03, T_00_04, T_00_05, T_00_06, T_00_07, \
                c16_n36_p30, c16_p41_n23, c16_n44_p15, c16_p45_n07, c16_n45_n02, c16_p43_p11, c16_n39_n19, c16_p34_p27, O08)
            COMPUTE_ROW(T_00_00, T_00_01, T_00_02, T_00_03, T_00_04, T_00_05, T_00_06, T_00_07, \
                c16_n43_p27, c16_p44_n02, c16_n30_n23, c16_p07_p41, c16_p19_n45, c16_n39_p34, c16_p45_n11, c16_n36_n15, O09)
            COMPUTE_ROW(T_00_00, T_00_01, T_00_02, T_00_03, T_00_04, T_00_05, T_00_06, T_00_07, \
                c16_n45_p23, c16_p27_p19, c16_p15_n45, c16_n44_p30, c16_p34_p11, c16_p07_n43, c16_n41_p36, c16_p39_p02, O10)
            COMPUTE_ROW(T_00_00, T_00_01, T_00_02, T_00_03, T_00_04, T_00_05, T_00_06, T_00_07, \
                c16_n44_p19, c16_n02_p36, c16_p45_n34, c16_n15_n23, c16_n39_p43, c16_p30_p07, c16_p27_n45, c16_n41_p11, O11)
            COMPUTE_ROW(T_00_00, T_00_01, T_00_02, T_00_03, T_00_04, T_00_05, T_00_06, T_00_07, \
                c16_n39_p15, c16_n30_p45, c16_p27_p02, c16_p41_n44, c16_n11_n19, c16_n45_p36, c16_n07_p34, c16_p43_n23, O12)
            COMPUTE_ROW(T_00_00, T_00_01, T_00_02, T_00_03, T_00_04, T_00_05, T_00_06, T_00_07, \
                c16_n30_p11, c16_n45_p43, c16_n19_p36, c16_p23_n02, c16_p45_n39, c16_p27_n41, c16_n15_n07, c16_n44_p34, O13)
            COMPUTE_ROW(T_00_00, T_00_01, T_00_02, T_00_03, T_00_04, T_00_05, T_00_06, T_00_07, \
                c16_n19_p07, c16_n39_p30, c16_n45_p44, c16_n36_p43, c16_n15_p27, c16_p11_p02, c16_p34_n23, c16_p45_n41, O14)
            COMPUTE_ROW(T_00_00, T_00_01, T_00_02, T_00_03, T_00_04, T_00_05, T_00_06, T_00_07, \
                c16_n07_p02, c16_n15_p11, c16_n23_p19, c16_n30_p27, c16_n36_p34, c16_n41_p39, c16_n44_p43, c16_n45_p45, O15)

#undef COMPUTE_ROW
        }

        src00 = _mm_load_si128((const __m128i*)&src[0 * i_src + i]);
        src02 = _mm_load_si128((const __m128i*)&src[2 * i_src + i]);
        src04 = _mm_load_si128((const __m128i*)&src[4 * i_src + i]);
        src06 = _mm_load_si128((const __m128i*)&src[6 * i_src + i]);
        src08 = _mm_load_si128((const __m128i*)&src[8 * i_src + i]);
        src10 = _mm_load_si128((const __m128i*)&src[10 * i_src + i]);
        src12 = _mm_load_si128((const __m128i*)&src[12 * i_src + i]);
        src14 = _mm_load_si128((const __m128i*)&src[14 * i_src + i]);
        src16 = _mm_load_si128((const __m128i*)&src[16 * i_src + i]);
        src18 = _mm_load_si128((const __m128i*)&src[18 * i_src + i]);
        src20 = _mm_load_si128((const __m128i*)&src[20 * i_src + i]);
        src22 = _mm_load_si128((const __m128i*)&src[22 * i_src + i]);
        src24 = _mm_load_si128((const __m128i*)&src[24 * i_src + i]);
        src26 = _mm_load_si128((const __m128i*)&src[26 * i_src + i]);
        src28 = _mm_load_si128((const __m128i*)&src[28 * i_src + i]);
        src30 = _mm_load_si128((const __m128i*)&src[30 * i_src + i]);

        ss00 = _mm_unpacklo_epi16(src02, src06);
        ss01 = _mm_unpacklo_epi16(src10, src14);
        ss02 = _mm_unpacklo_epi16(src18, src22);
        ss03 = _mm_unpacklo_epi16(src26, src30);
        ss04 = _mm_unpacklo_epi16(src04, src12);
        ss05 = _mm_unpacklo_epi16(src20, src28);
        ss06 = _mm_unpacklo_epi16(src08, src24);
        ss07 = _mm_unpacklo_epi16(src00, src16);

        ss08 = _mm_unpackhi_epi16(src02, src06);
        ss09 = _mm_unpackhi_epi16(src10, src14);
        ss10 = _mm_unpackhi_epi16(src18, src22);
        ss11 = _mm_unpackhi_epi16(src26, src30);
        ss12 = _mm_unpackhi_epi16(src04, src12);
        ss13 = _mm_unpackhi_epi16(src20, src28);
        ss14 = _mm_unpackhi_epi16(src08, src24);
        ss15 = _mm_unpackhi_epi16(src00, src16);

        {
            const __m256i T_00_08 = _mm256_set_m128i(ss08, ss00);
            const __m256i T_00_09 = _mm256_set_m128i(ss09, ss01);
            const __m256i T_00_10 = _mm256_set_m128i(ss10, ss02);
            const __m256i T_00_11 = _mm256_set_m128i(ss11, ss03);
            const __m256i T_00_12 = _mm256_set_m128i(ss12, ss04);
            const __m256i T_00_13 = _mm256_set_m128i(ss13, ss05);
            const __m256i T_00_14 = _mm256_set_m128i(ss14, ss06);
            const __m256i T_00_15 = _mm256_set_m128i(ss15, ss07);

#define COMPUTE_ROW(row0206, row1014, row1822, row2630, c0206, c1014, c1822, c2630, row) \
            t0 = _mm256_madd_epi16(row0206, c0206); \
            t1 = _mm256_madd_epi16(row1014, c1014); \
            t2 = _mm256_madd_epi16(row1822, c1822); \
            t3 = _mm256_madd_epi16(row2630, c2630); \
	        t0 = _mm256_add_epi32(t0, t1); \
	        t2 = _mm256_add_epi32(t2, t3); \
	        row = _mm256_add_epi32(t0, t2);

            COMPUTE_ROW(T_00_08, T_00_09, T_00_10, T_00_11, c16_p43_p45, c16_p35_p40, c16_p21_p29, c16_p04_p13, EO0)
            COMPUTE_ROW(T_00_08, T_00_09, T_00_10, T_00_11, c16_p29_p43, c16_n21_p04, c16_n45_n40, c16_n13_n35, EO1)
            COMPUTE_ROW(T_00_08, T_00_09, T_00_10, T_00_11, c16_p04_p40, c16_n43_n35, c16_p29_n13, c16_p21_p45, EO2)
            COMPUTE_ROW(T_00_08, T_00_09, T_00_10, T_00_11, c16_n21_p35, c16_p04_n43, c16_p13_p45, c16_n29_n40, EO3)
            COMPUTE_ROW(T_00_08, T_00_09, T_00_10, T_00_11, c16_n40_p29, c16_p45_n13, c16_n43_n04, c16_p35_p21, EO4)
            COMPUTE_ROW(T_00_08, T_00_09, T_00_10, T_00_11, c16_n45_p21, c16_p13_p29, c16_p35_n43, c16_n40_p04, EO5)
            COMPUTE_ROW(T_00_08, T_00_09, T_00_10, T_00_11, c16_n35_p13, c16_n40_p45, c16_p04_p21, c16_p43_n29, EO6)
            COMPUTE_ROW(T_00_08, T_00_09, T_00_10, T_00_11, c16_n13_p04, c16_n29_p21, c16_n40_p35, c16_n45_p43, EO7)

#undef COMPUTE_ROW

            {
                const __m256i EEO0 = _mm256_add_epi32(_mm256_madd_epi16(T_00_12, c16_p38_p44), _mm256_madd_epi16(T_00_13, c16_p09_p25));
                const __m256i EEO1 = _mm256_add_epi32(_mm256_madd_epi16(T_00_12, c16_n09_p38), _mm256_madd_epi16(T_00_13, c16_n25_n44));
                const __m256i EEO2 = _mm256_add_epi32(_mm256_madd_epi16(T_00_12, c16_n44_p25), _mm256_madd_epi16(T_00_13, c16_p38_p09));
                const __m256i EEO3 = _mm256_add_epi32(_mm256_madd_epi16(T_00_12, c16_n25_p09), _mm256_madd_epi16(T_00_13, c16_n44_p38));

                const __m256i EEEO0 = _mm256_madd_epi16(T_00_14, c16_p17_p42);
                const __m256i EEEO1 = _mm256_madd_epi16(T_00_14, c16_n42_p17);

                const __m256i EEEE0 = _mm256_madd_epi16(T_00_15, c16_p32_p32);
                const __m256i EEEE1 = _mm256_madd_epi16(T_00_15, c16_n32_p32);

                const __m256i EEE0 = _mm256_add_epi32(EEEE0, EEEO0);          // EEE0 = EEEE0 + EEEO0
                const __m256i EEE1 = _mm256_add_epi32(EEEE1, EEEO1);          // EEE1 = EEEE1 + EEEO1
                const __m256i EEE3 = _mm256_sub_epi32(EEEE0, EEEO0);          // EEE2 = EEEE0 - EEEO0
                const __m256i EEE2 = _mm256_sub_epi32(EEEE1, EEEO1);          // EEE3 = EEEE1 - EEEO1

                const __m256i EE0 = _mm256_add_epi32(EEE0, EEO0);          // EE0 = EEE0 + EEO0
                const __m256i EE1 = _mm256_add_epi32(EEE1, EEO1);          // EE1 = EEE1 + EEO1
                const __m256i EE2 = _mm256_add_epi32(EEE2, EEO2);          // EE2 = EEE0 + EEO0
                const __m256i EE3 = _mm256_add_epi32(EEE3, EEO3);          // EE3 = EEE1 + EEO1
                const __m256i EE7 = _mm256_sub_epi32(EEE0, EEO0);          // EE7 = EEE0 - EEO0
                const __m256i EE6 = _mm256_sub_epi32(EEE1, EEO1);          // EE6 = EEE1 - EEO1
                const __m256i EE5 = _mm256_sub_epi32(EEE2, EEO2);          // EE5 = EEE0 - EEO0
                const __m256i EE4 = _mm256_sub_epi32(EEE3, EEO3);          // EE4 = EEE1 - EEO1

                const __m256i E0 = _mm256_add_epi32(EE0, EO0);          // E0 = EE0 + EO0
                const __m256i E1 = _mm256_add_epi32(EE1, EO1);          // E1 = EE1 + EO1
                const __m256i E2 = _mm256_add_epi32(EE2, EO2);          // E2 = EE2 + EO2
                const __m256i E3 = _mm256_add_epi32(EE3, EO3);          // E3 = EE3 + EO3
                const __m256i E4 = _mm256_add_epi32(EE4, EO4);          // E4 =
                const __m256i E5 = _mm256_add_epi32(EE5, EO5);          // E5 =
                const __m256i E6 = _mm256_add_epi32(EE6, EO6);          // E6 =
                const __m256i E7 = _mm256_add_epi32(EE7, EO7);          // E7 =
                const __m256i EF = _mm256_sub_epi32(EE0, EO0);          // EF = EE0 - EO0
                const __m256i EE = _mm256_sub_epi32(EE1, EO1);          // EE = EE1 - EO1
                const __m256i ED = _mm256_sub_epi32(EE2, EO2);          // ED = EE2 - EO2
                const __m256i EC = _mm256_sub_epi32(EE3, EO3);          // EC = EE3 - EO3
                const __m256i EB = _mm256_sub_epi32(EE4, EO4);          // EB =
                const __m256i EA = _mm256_sub_epi32(EE5, EO5);          // EA =
                const __m256i E9 = _mm256_sub_epi32(EE6, EO6);          // E9 =
                const __m256i E8 = _mm256_sub_epi32(EE7, EO7);          // E8 =

                const __m256i T10 = _mm256_add_epi32(E0, c32_off);         // E0 + off
                const __m256i T11 = _mm256_add_epi32(E1, c32_off);         // E1 + off
                const __m256i T12 = _mm256_add_epi32(E2, c32_off);         // E2 + off
                const __m256i T13 = _mm256_add_epi32(E3, c32_off);         // E3 + off
                const __m256i T14 = _mm256_add_epi32(E4, c32_off);         // E4 + off
                const __m256i T15 = _mm256_add_epi32(E5, c32_off);         // E5 + off
                const __m256i T16 = _mm256_add_epi32(E6, c32_off);         // E6 + off
                const __m256i T17 = _mm256_add_epi32(E7, c32_off);         // E7 + off
                const __m256i T18 = _mm256_add_epi32(E8, c32_off);         // E8 + off
                const __m256i T19 = _mm256_add_epi32(E9, c32_off);         // E9 + off
                const __m256i T1A = _mm256_add_epi32(EA, c32_off);         // E10 + off
                const __m256i T1B = _mm256_add_epi32(EB, c32_off);         // E11 + off
                const __m256i T1C = _mm256_add_epi32(EC, c32_off);         // E12 + off
                const __m256i T1D = _mm256_add_epi32(ED, c32_off);         // E13 + off
                const __m256i T1E = _mm256_add_epi32(EE, c32_off);         // E14 + off
                const __m256i T1F = _mm256_add_epi32(EF, c32_off);         // E15 + off

                __m256i T2_00 = _mm256_add_epi32(T10, O00);          // E0 + O0 + off
                __m256i T2_01 = _mm256_add_epi32(T11, O01);          // E1 + O1 + off
                __m256i T2_02 = _mm256_add_epi32(T12, O02);          // E2 + O2 + off
                __m256i T2_03 = _mm256_add_epi32(T13, O03);          // E3 + O3 + off
                __m256i T2_04 = _mm256_add_epi32(T14, O04);          // E4
                __m256i T2_05 = _mm256_add_epi32(T15, O05);          // E5
                __m256i T2_06 = _mm256_add_epi32(T16, O06);          // E6
                __m256i T2_07 = _mm256_add_epi32(T17, O07);          // E7
                __m256i T2_08 = _mm256_add_epi32(T18, O08);          // E8
                __m256i T2_09 = _mm256_add_epi32(T19, O09);          // E9
                __m256i T2_10 = _mm256_add_epi32(T1A, O10);          // E10
                __m256i T2_11 = _mm256_add_epi32(T1B, O11);          // E11
                __m256i T2_12 = _mm256_add_epi32(T1C, O12);          // E12
                __m256i T2_13 = _mm256_add_epi32(T1D, O13);          // E13
                __m256i T2_14 = _mm256_add_epi32(T1E, O14);          // E14
                __m256i T2_15 = _mm256_add_epi32(T1F, O15);          // E15
                __m256i T2_31 = _mm256_sub_epi32(T10, O00);          // E0 - O0 + off
                __m256i T2_30 = _mm256_sub_epi32(T11, O01);          // E1 - O1 + off
                __m256i T2_29 = _mm256_sub_epi32(T12, O02);          // E2 - O2 + off
                __m256i T2_28 = _mm256_sub_epi32(T13, O03);          // E3 - O3 + off
                __m256i T2_27 = _mm256_sub_epi32(T14, O04);          // E4
                __m256i T2_26 = _mm256_sub_epi32(T15, O05);          // E5
                __m256i T2_25 = _mm256_sub_epi32(T16, O06);          // E6
                __m256i T2_24 = _mm256_sub_epi32(T17, O07);          // E7
                __m256i T2_23 = _mm256_sub_epi32(T18, O08);          //
                __m256i T2_22 = _mm256_sub_epi32(T19, O09);          //
                __m256i T2_21 = _mm256_sub_epi32(T1A, O10);          //
                __m256i T2_20 = _mm256_sub_epi32(T1B, O11);          //
                __m256i T2_19 = _mm256_sub_epi32(T1C, O12);          //
                __m256i T2_18 = _mm256_sub_epi32(T1D, O13);          //
                __m256i T2_17 = _mm256_sub_epi32(T1E, O14);          //
                __m256i T2_16 = _mm256_sub_epi32(T1F, O15);          //

                T2_00 = _mm256_srai_epi32(T2_00, shift);             // [30 20 10 00]
                T2_01 = _mm256_srai_epi32(T2_01, shift);             // [31 21 11 01]
                T2_02 = _mm256_srai_epi32(T2_02, shift);             // [32 22 12 02]
                T2_03 = _mm256_srai_epi32(T2_03, shift);             // [33 23 13 03]
                T2_04 = _mm256_srai_epi32(T2_04, shift);             // [33 24 14 04]
                T2_05 = _mm256_srai_epi32(T2_05, shift);             // [35 25 15 05]
                T2_06 = _mm256_srai_epi32(T2_06, shift);             // [36 26 16 06]
                T2_07 = _mm256_srai_epi32(T2_07, shift);             // [37 27 17 07]
                T2_08 = _mm256_srai_epi32(T2_08, shift);             // [30 20 10 00] x8
                T2_09 = _mm256_srai_epi32(T2_09, shift);             // [31 21 11 01] x9
                T2_10 = _mm256_srai_epi32(T2_10, shift);             // [32 22 12 02] xA
                T2_11 = _mm256_srai_epi32(T2_11, shift);             // [33 23 13 03] xB
                T2_12 = _mm256_srai_epi32(T2_12, shift);             // [33 24 14 04] xC
                T2_13 = _mm256_srai_epi32(T2_13, shift);             // [35 25 15 05] xD
                T2_14 = _mm256_srai_epi32(T2_14, shift);             // [36 26 16 06] xE
                T2_15 = _mm256_srai_epi32(T2_15, shift);             // [37 27 17 07] xF
                T2_16 = _mm256_srai_epi32(T2_16, shift);             // [30 20 10 00]
                T2_17 = _mm256_srai_epi32(T2_17, shift);             // [31 21 11 01]
                T2_18 = _mm256_srai_epi32(T2_18, shift);             // [32 22 12 02]
                T2_19 = _mm256_srai_epi32(T2_19, shift);             // [33 23 13 03]
                T2_20 = _mm256_srai_epi32(T2_20, shift);             // [33 24 14 04]
                T2_21 = _mm256_srai_epi32(T2_21, shift);             // [35 25 15 05]
                T2_22 = _mm256_srai_epi32(T2_22, shift);             // [36 26 16 06]
                T2_23 = _mm256_srai_epi32(T2_23, shift);             // [37 27 17 07]
                T2_24 = _mm256_srai_epi32(T2_24, shift);             // [30 20 10 00] x8
                T2_25 = _mm256_srai_epi32(T2_25, shift);             // [31 21 11 01] x9
                T2_26 = _mm256_srai_epi32(T2_26, shift);             // [32 22 12 02] xA
                T2_27 = _mm256_srai_epi32(T2_27, shift);             // [33 23 13 03] xB
                T2_28 = _mm256_srai_epi32(T2_28, shift);             // [33 24 14 04] xC
                T2_29 = _mm256_srai_epi32(T2_29, shift);             // [35 25 15 05] xD
                T2_30 = _mm256_srai_epi32(T2_30, shift);             // [36 26 16 06] xE
                T2_31 = _mm256_srai_epi32(T2_31, shift);             // [37 27 17 07] xF

                //transpose 32x8 -> 8x32.
                TRANSPOSE_16x8_32BIT_16BIT(T2_00, T2_01, T2_02, T2_03, T2_04, T2_05, T2_06, T2_07,
                    T2_08, T2_09, T2_10, T2_11, T2_12, T2_13, T2_14, T2_15, res00, res02, res04, res06, res08, res10, res12, res14);
                TRANSPOSE_16x8_32BIT_16BIT(T2_16, T2_17, T2_18, T2_19, T2_20, T2_21, T2_22, T2_23,
                    T2_24, T2_25, T2_26, T2_27, T2_28, T2_29, T2_30, T2_31, res01, res03, res05, res07, res09, res11, res13, res15);
                
            }
            if (bit_depth != MAX_TX_DYNAMIC_RANGE) {
                __m256i max_val = _mm256_set1_epi16((1 << bit_depth) - 1);
                __m256i min_val = _mm256_set1_epi16(-(1 << bit_depth));

                res00 = _mm256_min_epi16(res00, max_val);
                res01 = _mm256_min_epi16(res01, max_val);
                res02 = _mm256_min_epi16(res02, max_val);
                res03 = _mm256_min_epi16(res03, max_val);
                res00 = _mm256_max_epi16(res00, min_val);
                res01 = _mm256_max_epi16(res01, min_val);
                res02 = _mm256_max_epi16(res02, min_val);
                res03 = _mm256_max_epi16(res03, min_val);
                res04 = _mm256_min_epi16(res04, max_val);
                res05 = _mm256_min_epi16(res05, max_val);
                res06 = _mm256_min_epi16(res06, max_val);
                res07 = _mm256_min_epi16(res07, max_val);
                res04 = _mm256_max_epi16(res04, min_val);
                res05 = _mm256_max_epi16(res05, min_val);
                res06 = _mm256_max_epi16(res06, min_val);
                res07 = _mm256_max_epi16(res07, min_val);

                res08 = _mm256_min_epi16(res08, max_val);
                res09 = _mm256_min_epi16(res09, max_val);
                res10 = _mm256_min_epi16(res10, max_val);
                res11 = _mm256_min_epi16(res11, max_val);
                res08 = _mm256_max_epi16(res08, min_val);
                res09 = _mm256_max_epi16(res09, min_val);
                res10 = _mm256_max_epi16(res10, min_val);
                res11 = _mm256_max_epi16(res11, min_val);
                res12 = _mm256_min_epi16(res12, max_val);
                res13 = _mm256_min_epi16(res13, max_val);
                res14 = _mm256_min_epi16(res14, max_val);
                res15 = _mm256_min_epi16(res15, max_val);
                res12 = _mm256_max_epi16(res12, min_val);
                res13 = _mm256_max_epi16(res13, min_val);
                res14 = _mm256_max_epi16(res14, min_val);
                res15 = _mm256_max_epi16(res15, min_val);

            }
        }
        _mm256_store_si256((__m256i*)&dst[0  * 16], res00);
        _mm256_store_si256((__m256i*)&dst[1  * 16], res01);
        _mm256_store_si256((__m256i*)&dst[2  * 16], res02);
        _mm256_store_si256((__m256i*)&dst[3  * 16], res03);
        _mm256_store_si256((__m256i*)&dst[4  * 16], res04);
        _mm256_store_si256((__m256i*)&dst[5  * 16], res05);
        _mm256_store_si256((__m256i*)&dst[6  * 16], res06);
        _mm256_store_si256((__m256i*)&dst[7  * 16], res07);
        _mm256_store_si256((__m256i*)&dst[8  * 16], res08);
        _mm256_store_si256((__m256i*)&dst[9  * 16], res09);
        _mm256_store_si256((__m256i*)&dst[10 * 16], res10);
        _mm256_store_si256((__m256i*)&dst[11 * 16], res11);
        _mm256_store_si256((__m256i*)&dst[12 * 16], res12);
        _mm256_store_si256((__m256i*)&dst[13 * 16], res13);
        _mm256_store_si256((__m256i*)&dst[14 * 16], res14);
        _mm256_store_si256((__m256i*)&dst[15 * 16], res15);

        dst += 8 * 32;  // 8rows
    }
}